

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [28];
  undefined1 (*pauVar5) [28];
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined4 uVar22;
  Geometry *pGVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [24];
  uint uVar131;
  uint uVar132;
  uint uVar133;
  ulong uVar134;
  long lVar135;
  uint uVar136;
  ulong uVar137;
  long lVar138;
  long lVar139;
  LinearSpace3fa *pLVar140;
  float fVar141;
  undefined1 auVar143 [16];
  float fVar161;
  float fVar163;
  float fVar168;
  float fVar170;
  float fVar172;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar165;
  float fVar166;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar144 [16];
  float fVar142;
  float fVar162;
  float fVar164;
  float fVar167;
  float fVar169;
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar176;
  float fVar194;
  float fVar195;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar180 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar196;
  float fVar197;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar198;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar215;
  undefined1 auVar212 [32];
  float fVar216;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar217;
  float fVar235;
  undefined1 auVar219 [16];
  float fVar218;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar231;
  float fVar233;
  float fVar238;
  float fVar240;
  float fVar241;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar220 [16];
  float fVar232;
  float fVar234;
  float fVar236;
  undefined1 auVar226 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  float fVar242;
  float fVar243;
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar250 [64];
  float fVar259;
  float fVar267;
  float fVar268;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar262 [32];
  float fVar269;
  undefined1 auVar263 [32];
  float fVar273;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar275 [16];
  float fVar274;
  float fVar283;
  float fVar284;
  float fVar286;
  float fVar287;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar288;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar285;
  float fVar289;
  float fVar290;
  undefined1 auVar282 [32];
  float fVar291;
  float fVar292;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar304;
  float fVar306;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar308;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar305;
  float fVar307;
  float fVar309;
  undefined1 auVar303 [64];
  float fVar316;
  float fVar318;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar317;
  undefined1 auVar315 [32];
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar334;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [64];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float in_register_0000151c;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar344;
  float fVar345;
  undefined1 auVar346 [16];
  float fVar350;
  float fVar352;
  undefined1 auVar347 [32];
  float fVar351;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  float fVar356;
  float fVar357;
  float fVar361;
  float fVar363;
  float fVar364;
  float in_register_0000159c;
  undefined1 auVar359 [32];
  float fVar362;
  undefined1 auVar360 [32];
  float fVar365;
  float fVar368;
  float fVar369;
  float fVar370;
  float in_register_000015dc;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_840 [16];
  LinearSpace3fa *local_828;
  Precalculations *local_820;
  Primitive *local_818;
  undefined1 local_810 [8];
  undefined8 uStack_808;
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  undefined1 local_7f0 [8];
  undefined8 uStack_7e8;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 (*local_728) [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_670 [16];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [2] [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  RTCHitN local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar358 [16];
  
  PVar18 = prim[1];
  uVar134 = (ulong)(byte)PVar18;
  lVar139 = uVar134 * 5;
  auVar222 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar222 = vinsertps_avx(auVar222,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar217 = *(float *)(prim + uVar134 * 0x19 + 0x12);
  auVar222 = vsubps_avx(auVar222,*(undefined1 (*) [16])(prim + uVar134 * 0x19 + 6));
  auVar177._0_4_ = fVar217 * auVar222._0_4_;
  auVar177._4_4_ = fVar217 * auVar222._4_4_;
  auVar177._8_4_ = fVar217 * auVar222._8_4_;
  auVar177._12_4_ = fVar217 * auVar222._12_4_;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 4 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 4 + 10)));
  auVar260._0_4_ = fVar217 * auVar204._0_4_;
  auVar260._4_4_ = fVar217 * auVar204._4_4_;
  auVar260._8_4_ = fVar217 * auVar204._8_4_;
  auVar260._12_4_ = fVar217 * auVar204._12_4_;
  auVar145._16_16_ = auVar221;
  auVar145._0_16_ = auVar222;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar139 + 6)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar139 + 10)));
  auVar209._16_16_ = auVar204;
  auVar209._0_16_ = auVar222;
  auVar158 = vcvtdq2ps_avx(auVar209);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 6 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 6 + 10)));
  auVar223._16_16_ = auVar204;
  auVar223._0_16_ = auVar222;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xb + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xb + 10)));
  auVar26 = vcvtdq2ps_avx(auVar223);
  auVar224._16_16_ = auVar204;
  auVar224._0_16_ = auVar222;
  auVar313 = vcvtdq2ps_avx(auVar224);
  uVar137 = (ulong)((uint)(byte)PVar18 * 0xc);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar276._16_16_ = auVar204;
  auVar276._0_16_ = auVar222;
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar134 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar276);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar134 + 10)));
  auVar295._16_16_ = auVar204;
  auVar295._0_16_ = auVar222;
  lVar135 = uVar134 * 9;
  uVar137 = (ulong)(uint)((int)lVar135 * 2);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar295);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar296._16_16_ = auVar204;
  auVar296._0_16_ = auVar222;
  auVar28 = vcvtdq2ps_avx(auVar296);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar134 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + uVar134 + 10)));
  auVar319._16_16_ = auVar204;
  auVar319._0_16_ = auVar222;
  uVar137 = (ulong)(uint)((int)lVar139 << 2);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 + 10)));
  auVar29 = vcvtdq2ps_avx(auVar319);
  auVar328._16_16_ = auVar204;
  auVar328._0_16_ = auVar222;
  auVar30 = vcvtdq2ps_avx(auVar328);
  auVar222 = vshufps_avx(auVar260,auVar260,0);
  auVar204 = vshufps_avx(auVar260,auVar260,0x55);
  auVar221 = vshufps_avx(auVar260,auVar260,0xaa);
  fVar217 = auVar221._0_4_;
  fVar231 = auVar221._4_4_;
  fVar233 = auVar221._8_4_;
  fVar235 = auVar221._12_4_;
  fVar238 = auVar204._0_4_;
  fVar240 = auVar204._4_4_;
  fVar241 = auVar204._8_4_;
  fVar242 = auVar204._12_4_;
  fVar251 = auVar222._0_4_;
  fVar253 = auVar222._4_4_;
  fVar255 = auVar222._8_4_;
  fVar256 = auVar222._12_4_;
  auVar339._0_4_ = fVar251 * auVar145._0_4_ + fVar238 * auVar158._0_4_ + fVar217 * auVar26._0_4_;
  auVar339._4_4_ = fVar253 * auVar145._4_4_ + fVar240 * auVar158._4_4_ + fVar231 * auVar26._4_4_;
  auVar339._8_4_ = fVar255 * auVar145._8_4_ + fVar241 * auVar158._8_4_ + fVar233 * auVar26._8_4_;
  auVar339._12_4_ = fVar256 * auVar145._12_4_ + fVar242 * auVar158._12_4_ + fVar235 * auVar26._12_4_
  ;
  auVar339._16_4_ = fVar251 * auVar145._16_4_ + fVar238 * auVar158._16_4_ + fVar217 * auVar26._16_4_
  ;
  auVar339._20_4_ = fVar253 * auVar145._20_4_ + fVar240 * auVar158._20_4_ + fVar231 * auVar26._20_4_
  ;
  auVar339._24_4_ = fVar255 * auVar145._24_4_ + fVar241 * auVar158._24_4_ + fVar233 * auVar26._24_4_
  ;
  auVar339._28_4_ = fVar242 + in_register_000015dc + in_register_0000151c;
  auVar335._0_4_ = fVar251 * auVar313._0_4_ + fVar238 * auVar152._0_4_ + auVar27._0_4_ * fVar217;
  auVar335._4_4_ = fVar253 * auVar313._4_4_ + fVar240 * auVar152._4_4_ + auVar27._4_4_ * fVar231;
  auVar335._8_4_ = fVar255 * auVar313._8_4_ + fVar241 * auVar152._8_4_ + auVar27._8_4_ * fVar233;
  auVar335._12_4_ = fVar256 * auVar313._12_4_ + fVar242 * auVar152._12_4_ + auVar27._12_4_ * fVar235
  ;
  auVar335._16_4_ = fVar251 * auVar313._16_4_ + fVar238 * auVar152._16_4_ + auVar27._16_4_ * fVar217
  ;
  auVar335._20_4_ = fVar253 * auVar313._20_4_ + fVar240 * auVar152._20_4_ + auVar27._20_4_ * fVar231
  ;
  auVar335._24_4_ = fVar255 * auVar313._24_4_ + fVar241 * auVar152._24_4_ + auVar27._24_4_ * fVar233
  ;
  auVar335._28_4_ = fVar242 + in_register_000015dc + in_register_0000159c;
  auVar262._0_4_ = fVar251 * auVar28._0_4_ + fVar238 * auVar29._0_4_ + auVar30._0_4_ * fVar217;
  auVar262._4_4_ = fVar253 * auVar28._4_4_ + fVar240 * auVar29._4_4_ + auVar30._4_4_ * fVar231;
  auVar262._8_4_ = fVar255 * auVar28._8_4_ + fVar241 * auVar29._8_4_ + auVar30._8_4_ * fVar233;
  auVar262._12_4_ = fVar256 * auVar28._12_4_ + fVar242 * auVar29._12_4_ + auVar30._12_4_ * fVar235;
  auVar262._16_4_ = fVar251 * auVar28._16_4_ + fVar238 * auVar29._16_4_ + auVar30._16_4_ * fVar217;
  auVar262._20_4_ = fVar253 * auVar28._20_4_ + fVar240 * auVar29._20_4_ + auVar30._20_4_ * fVar231;
  auVar262._24_4_ = fVar255 * auVar28._24_4_ + fVar241 * auVar29._24_4_ + auVar30._24_4_ * fVar233;
  auVar262._28_4_ = fVar256 + fVar242 + fVar235;
  auVar222 = vshufps_avx(auVar177,auVar177,0);
  auVar204 = vshufps_avx(auVar177,auVar177,0x55);
  auVar221 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar231 = auVar221._0_4_;
  fVar233 = auVar221._4_4_;
  fVar235 = auVar221._8_4_;
  fVar238 = auVar221._12_4_;
  fVar253 = auVar204._0_4_;
  fVar255 = auVar204._4_4_;
  fVar256 = auVar204._8_4_;
  fVar257 = auVar204._12_4_;
  fVar240 = auVar222._0_4_;
  fVar241 = auVar222._4_4_;
  fVar242 = auVar222._8_4_;
  fVar251 = auVar222._12_4_;
  fVar217 = auVar145._28_4_;
  auVar277._0_4_ = fVar240 * auVar145._0_4_ + fVar253 * auVar158._0_4_ + fVar231 * auVar26._0_4_;
  auVar277._4_4_ = fVar241 * auVar145._4_4_ + fVar255 * auVar158._4_4_ + fVar233 * auVar26._4_4_;
  auVar277._8_4_ = fVar242 * auVar145._8_4_ + fVar256 * auVar158._8_4_ + fVar235 * auVar26._8_4_;
  auVar277._12_4_ = fVar251 * auVar145._12_4_ + fVar257 * auVar158._12_4_ + fVar238 * auVar26._12_4_
  ;
  auVar277._16_4_ = fVar240 * auVar145._16_4_ + fVar253 * auVar158._16_4_ + fVar231 * auVar26._16_4_
  ;
  auVar277._20_4_ = fVar241 * auVar145._20_4_ + fVar255 * auVar158._20_4_ + fVar233 * auVar26._20_4_
  ;
  auVar277._24_4_ = fVar242 * auVar145._24_4_ + fVar256 * auVar158._24_4_ + fVar235 * auVar26._24_4_
  ;
  auVar277._28_4_ = fVar217 + auVar158._28_4_ + auVar26._28_4_;
  auVar183._0_4_ = fVar240 * auVar313._0_4_ + auVar27._0_4_ * fVar231 + fVar253 * auVar152._0_4_;
  auVar183._4_4_ = fVar241 * auVar313._4_4_ + auVar27._4_4_ * fVar233 + fVar255 * auVar152._4_4_;
  auVar183._8_4_ = fVar242 * auVar313._8_4_ + auVar27._8_4_ * fVar235 + fVar256 * auVar152._8_4_;
  auVar183._12_4_ = fVar251 * auVar313._12_4_ + auVar27._12_4_ * fVar238 + fVar257 * auVar152._12_4_
  ;
  auVar183._16_4_ = fVar240 * auVar313._16_4_ + auVar27._16_4_ * fVar231 + fVar253 * auVar152._16_4_
  ;
  auVar183._20_4_ = fVar241 * auVar313._20_4_ + auVar27._20_4_ * fVar233 + fVar255 * auVar152._20_4_
  ;
  auVar183._24_4_ = fVar242 * auVar313._24_4_ + auVar27._24_4_ * fVar235 + fVar256 * auVar152._24_4_
  ;
  auVar183._28_4_ = fVar217 + auVar27._28_4_ + auVar26._28_4_;
  auVar297._8_4_ = 0x7fffffff;
  auVar297._0_8_ = 0x7fffffff7fffffff;
  auVar297._12_4_ = 0x7fffffff;
  auVar297._16_4_ = 0x7fffffff;
  auVar297._20_4_ = 0x7fffffff;
  auVar297._24_4_ = 0x7fffffff;
  auVar297._28_4_ = 0x7fffffff;
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  auVar210._16_4_ = 0x219392ef;
  auVar210._20_4_ = 0x219392ef;
  auVar210._24_4_ = 0x219392ef;
  auVar210._28_4_ = 0x219392ef;
  auVar145 = vandps_avx(auVar339,auVar297);
  auVar145 = vcmpps_avx(auVar145,auVar210,1);
  auVar158 = vblendvps_avx(auVar339,auVar210,auVar145);
  auVar145 = vandps_avx(auVar335,auVar297);
  auVar145 = vcmpps_avx(auVar145,auVar210,1);
  auVar26 = vblendvps_avx(auVar335,auVar210,auVar145);
  auVar145 = vandps_avx(auVar262,auVar297);
  auVar145 = vcmpps_avx(auVar145,auVar210,1);
  auVar145 = vblendvps_avx(auVar262,auVar210,auVar145);
  auVar211._0_4_ = fVar253 * auVar29._0_4_ + auVar30._0_4_ * fVar231 + fVar240 * auVar28._0_4_;
  auVar211._4_4_ = fVar255 * auVar29._4_4_ + auVar30._4_4_ * fVar233 + fVar241 * auVar28._4_4_;
  auVar211._8_4_ = fVar256 * auVar29._8_4_ + auVar30._8_4_ * fVar235 + fVar242 * auVar28._8_4_;
  auVar211._12_4_ = fVar257 * auVar29._12_4_ + auVar30._12_4_ * fVar238 + fVar251 * auVar28._12_4_;
  auVar211._16_4_ = fVar253 * auVar29._16_4_ + auVar30._16_4_ * fVar231 + fVar240 * auVar28._16_4_;
  auVar211._20_4_ = fVar255 * auVar29._20_4_ + auVar30._20_4_ * fVar233 + fVar241 * auVar28._20_4_;
  auVar211._24_4_ = fVar256 * auVar29._24_4_ + auVar30._24_4_ * fVar235 + fVar242 * auVar28._24_4_;
  auVar211._28_4_ = auVar152._28_4_ + fVar238 + fVar217;
  auVar313 = vrcpps_avx(auVar158);
  fVar217 = auVar313._0_4_;
  fVar231 = auVar313._4_4_;
  auVar152._4_4_ = auVar158._4_4_ * fVar231;
  auVar152._0_4_ = auVar158._0_4_ * fVar217;
  fVar233 = auVar313._8_4_;
  auVar152._8_4_ = auVar158._8_4_ * fVar233;
  fVar235 = auVar313._12_4_;
  auVar152._12_4_ = auVar158._12_4_ * fVar235;
  fVar238 = auVar313._16_4_;
  auVar152._16_4_ = auVar158._16_4_ * fVar238;
  fVar240 = auVar313._20_4_;
  auVar152._20_4_ = auVar158._20_4_ * fVar240;
  fVar241 = auVar313._24_4_;
  auVar152._24_4_ = auVar158._24_4_ * fVar241;
  auVar152._28_4_ = auVar158._28_4_;
  auVar310._8_4_ = 0x3f800000;
  auVar310._0_8_ = 0x3f8000003f800000;
  auVar310._12_4_ = 0x3f800000;
  auVar310._16_4_ = 0x3f800000;
  auVar310._20_4_ = 0x3f800000;
  auVar310._24_4_ = 0x3f800000;
  auVar310._28_4_ = 0x3f800000;
  auVar152 = vsubps_avx(auVar310,auVar152);
  auVar158 = vrcpps_avx(auVar26);
  fVar217 = fVar217 + fVar217 * auVar152._0_4_;
  fVar231 = fVar231 + fVar231 * auVar152._4_4_;
  fVar233 = fVar233 + fVar233 * auVar152._8_4_;
  fVar235 = fVar235 + fVar235 * auVar152._12_4_;
  fVar238 = fVar238 + fVar238 * auVar152._16_4_;
  fVar240 = fVar240 + fVar240 * auVar152._20_4_;
  fVar241 = fVar241 + fVar241 * auVar152._24_4_;
  fVar259 = auVar158._0_4_;
  fVar267 = auVar158._4_4_;
  auVar27._4_4_ = fVar267 * auVar26._4_4_;
  auVar27._0_4_ = fVar259 * auVar26._0_4_;
  fVar268 = auVar158._8_4_;
  auVar27._8_4_ = fVar268 * auVar26._8_4_;
  fVar269 = auVar158._12_4_;
  auVar27._12_4_ = fVar269 * auVar26._12_4_;
  fVar270 = auVar158._16_4_;
  auVar27._16_4_ = fVar270 * auVar26._16_4_;
  fVar271 = auVar158._20_4_;
  auVar27._20_4_ = fVar271 * auVar26._20_4_;
  fVar272 = auVar158._24_4_;
  auVar27._24_4_ = fVar272 * auVar26._24_4_;
  auVar27._28_4_ = auVar313._28_4_;
  auVar158 = vsubps_avx(auVar310,auVar27);
  fVar259 = fVar259 + fVar259 * auVar158._0_4_;
  fVar267 = fVar267 + fVar267 * auVar158._4_4_;
  fVar268 = fVar268 + fVar268 * auVar158._8_4_;
  fVar269 = fVar269 + fVar269 * auVar158._12_4_;
  fVar270 = fVar270 + fVar270 * auVar158._16_4_;
  fVar271 = fVar271 + fVar271 * auVar158._20_4_;
  fVar272 = fVar272 + fVar272 * auVar158._24_4_;
  auVar158 = vrcpps_avx(auVar145);
  fVar242 = auVar158._0_4_;
  fVar251 = auVar158._4_4_;
  auVar28._4_4_ = fVar251 * auVar145._4_4_;
  auVar28._0_4_ = fVar242 * auVar145._0_4_;
  fVar253 = auVar158._8_4_;
  auVar28._8_4_ = fVar253 * auVar145._8_4_;
  fVar255 = auVar158._12_4_;
  auVar28._12_4_ = fVar255 * auVar145._12_4_;
  fVar256 = auVar158._16_4_;
  auVar28._16_4_ = fVar256 * auVar145._16_4_;
  fVar257 = auVar158._20_4_;
  auVar28._20_4_ = fVar257 * auVar145._20_4_;
  fVar258 = auVar158._24_4_;
  auVar28._24_4_ = fVar258 * auVar145._24_4_;
  auVar28._28_4_ = auVar26._28_4_;
  auVar145 = vsubps_avx(auVar310,auVar28);
  fVar242 = fVar242 + fVar242 * auVar145._0_4_;
  fVar251 = fVar251 + fVar251 * auVar145._4_4_;
  fVar253 = fVar253 + fVar253 * auVar145._8_4_;
  fVar255 = fVar255 + fVar255 * auVar145._12_4_;
  fVar256 = fVar256 + fVar256 * auVar145._16_4_;
  fVar257 = fVar257 + fVar257 * auVar145._20_4_;
  fVar258 = fVar258 + fVar258 * auVar145._24_4_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar134 * 7 + 6);
  auVar222 = vpmovsxwd_avx(auVar222);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar134 * 7 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar204);
  auVar146._16_16_ = auVar204;
  auVar146._0_16_ = auVar222;
  auVar145 = vcvtdq2ps_avx(auVar146);
  auVar145 = vsubps_avx(auVar145,auVar277);
  auVar143._0_4_ = fVar217 * auVar145._0_4_;
  auVar143._4_4_ = fVar231 * auVar145._4_4_;
  auVar143._8_4_ = fVar233 * auVar145._8_4_;
  auVar143._12_4_ = fVar235 * auVar145._12_4_;
  auVar26._16_4_ = fVar238 * auVar145._16_4_;
  auVar26._0_16_ = auVar143;
  auVar26._20_4_ = fVar240 * auVar145._20_4_;
  auVar26._24_4_ = fVar241 * auVar145._24_4_;
  auVar26._28_4_ = auVar145._28_4_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + lVar135 + 6);
  auVar222 = vpmovsxwd_avx(auVar221);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + lVar135 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar207);
  auVar298._16_16_ = auVar204;
  auVar298._0_16_ = auVar222;
  auVar145 = vcvtdq2ps_avx(auVar298);
  auVar145 = vsubps_avx(auVar145,auVar277);
  auVar219._0_4_ = fVar217 * auVar145._0_4_;
  auVar219._4_4_ = fVar231 * auVar145._4_4_;
  auVar219._8_4_ = fVar233 * auVar145._8_4_;
  auVar219._12_4_ = fVar235 * auVar145._12_4_;
  auVar29._16_4_ = fVar238 * auVar145._16_4_;
  auVar29._0_16_ = auVar219;
  auVar29._20_4_ = fVar240 * auVar145._20_4_;
  auVar29._24_4_ = fVar241 * auVar145._24_4_;
  auVar29._28_4_ = auVar313._28_4_ + auVar152._28_4_;
  lVar139 = (ulong)(byte)PVar18 * 0x10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar139 + 6);
  auVar222 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar139 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar11);
  lVar139 = lVar139 + uVar134 * -2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar139 + 6);
  auVar221 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar139 + 0xe);
  auVar207 = vpmovsxwd_avx(auVar13);
  auVar278._16_16_ = auVar207;
  auVar278._0_16_ = auVar221;
  auVar145 = vcvtdq2ps_avx(auVar278);
  auVar145 = vsubps_avx(auVar145,auVar183);
  auVar275._0_4_ = fVar259 * auVar145._0_4_;
  auVar275._4_4_ = fVar267 * auVar145._4_4_;
  auVar275._8_4_ = fVar268 * auVar145._8_4_;
  auVar275._12_4_ = fVar269 * auVar145._12_4_;
  auVar313._16_4_ = fVar270 * auVar145._16_4_;
  auVar313._0_16_ = auVar275;
  auVar313._20_4_ = fVar271 * auVar145._20_4_;
  auVar313._24_4_ = fVar272 * auVar145._24_4_;
  auVar313._28_4_ = auVar145._28_4_;
  auVar299._16_16_ = auVar204;
  auVar299._0_16_ = auVar222;
  auVar145 = vcvtdq2ps_avx(auVar299);
  auVar145 = vsubps_avx(auVar145,auVar183);
  auVar178._0_4_ = fVar259 * auVar145._0_4_;
  auVar178._4_4_ = fVar267 * auVar145._4_4_;
  auVar178._8_4_ = fVar268 * auVar145._8_4_;
  auVar178._12_4_ = fVar269 * auVar145._12_4_;
  auVar30._16_4_ = fVar270 * auVar145._16_4_;
  auVar30._0_16_ = auVar178;
  auVar30._20_4_ = fVar271 * auVar145._20_4_;
  auVar30._24_4_ = fVar272 * auVar145._24_4_;
  auVar30._28_4_ = auVar145._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar137 + uVar134 + 6);
  auVar222 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar137 + uVar134 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar15);
  auVar263._16_16_ = auVar204;
  auVar263._0_16_ = auVar222;
  auVar145 = vcvtdq2ps_avx(auVar263);
  auVar145 = vsubps_avx(auVar145,auVar211);
  auVar261._0_4_ = fVar242 * auVar145._0_4_;
  auVar261._4_4_ = fVar251 * auVar145._4_4_;
  auVar261._8_4_ = fVar253 * auVar145._8_4_;
  auVar261._12_4_ = fVar255 * auVar145._12_4_;
  auVar31._16_4_ = fVar256 * auVar145._16_4_;
  auVar31._0_16_ = auVar261;
  auVar31._20_4_ = fVar257 * auVar145._20_4_;
  auVar31._24_4_ = fVar258 * auVar145._24_4_;
  auVar31._28_4_ = auVar145._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar134 * 0x17 + 6);
  auVar222 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar134 * 0x17 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar17);
  auVar300._16_16_ = auVar204;
  auVar300._0_16_ = auVar222;
  auVar145 = vcvtdq2ps_avx(auVar300);
  auVar145 = vsubps_avx(auVar145,auVar211);
  auVar199._0_4_ = fVar242 * auVar145._0_4_;
  auVar199._4_4_ = fVar251 * auVar145._4_4_;
  auVar199._8_4_ = fVar253 * auVar145._8_4_;
  auVar199._12_4_ = fVar255 * auVar145._12_4_;
  auVar25._16_4_ = fVar256 * auVar145._16_4_;
  auVar25._0_16_ = auVar199;
  auVar25._20_4_ = fVar257 * auVar145._20_4_;
  auVar25._24_4_ = fVar258 * auVar145._24_4_;
  auVar25._28_4_ = auVar145._28_4_;
  auVar222 = vpminsd_avx(auVar26._16_16_,auVar29._16_16_);
  auVar204 = vpminsd_avx(auVar143,auVar219);
  auVar311._16_16_ = auVar222;
  auVar311._0_16_ = auVar204;
  auVar222 = vpminsd_avx(auVar313._16_16_,auVar30._16_16_);
  auVar204 = vpminsd_avx(auVar275,auVar178);
  auVar336._16_16_ = auVar222;
  auVar336._0_16_ = auVar204;
  auVar145 = vmaxps_avx(auVar311,auVar336);
  auVar222 = vpminsd_avx(auVar31._16_16_,auVar25._16_16_);
  auVar204 = vpminsd_avx(auVar261,auVar199);
  auVar347._16_16_ = auVar222;
  auVar347._0_16_ = auVar204;
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar359._4_4_ = uVar9;
  auVar359._0_4_ = uVar9;
  auVar359._8_4_ = uVar9;
  auVar359._12_4_ = uVar9;
  auVar359._16_4_ = uVar9;
  auVar359._20_4_ = uVar9;
  auVar359._24_4_ = uVar9;
  auVar359._28_4_ = uVar9;
  auVar158 = vmaxps_avx(auVar347,auVar359);
  auVar145 = vmaxps_avx(auVar145,auVar158);
  local_80._4_4_ = auVar145._4_4_ * 0.99999964;
  local_80._0_4_ = auVar145._0_4_ * 0.99999964;
  local_80._8_4_ = auVar145._8_4_ * 0.99999964;
  local_80._12_4_ = auVar145._12_4_ * 0.99999964;
  local_80._16_4_ = auVar145._16_4_ * 0.99999964;
  local_80._20_4_ = auVar145._20_4_ * 0.99999964;
  local_80._24_4_ = auVar145._24_4_ * 0.99999964;
  local_80._28_4_ = auVar145._28_4_;
  auVar222 = vpmaxsd_avx(auVar26._16_16_,auVar29._16_16_);
  auVar204 = vpmaxsd_avx(auVar143,auVar219);
  auVar147._16_16_ = auVar222;
  auVar147._0_16_ = auVar204;
  auVar222 = vpmaxsd_avx(auVar313._16_16_,auVar30._16_16_);
  auVar204 = vpmaxsd_avx(auVar275,auVar178);
  auVar184._16_16_ = auVar222;
  auVar184._0_16_ = auVar204;
  auVar145 = vminps_avx(auVar147,auVar184);
  auVar222 = vpmaxsd_avx(auVar31._16_16_,auVar25._16_16_);
  auVar204 = vpmaxsd_avx(auVar261,auVar199);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar225._4_4_ = uVar9;
  auVar225._0_4_ = uVar9;
  auVar225._8_4_ = uVar9;
  auVar225._12_4_ = uVar9;
  auVar225._16_4_ = uVar9;
  auVar225._20_4_ = uVar9;
  auVar225._24_4_ = uVar9;
  auVar225._28_4_ = uVar9;
  auVar185._16_16_ = auVar222;
  auVar185._0_16_ = auVar204;
  auVar158 = vminps_avx(auVar185,auVar225);
  auVar145 = vminps_avx(auVar145,auVar158);
  auVar158._4_4_ = auVar145._4_4_ * 1.0000004;
  auVar158._0_4_ = auVar145._0_4_ * 1.0000004;
  auVar158._8_4_ = auVar145._8_4_ * 1.0000004;
  auVar158._12_4_ = auVar145._12_4_ * 1.0000004;
  auVar158._16_4_ = auVar145._16_4_ * 1.0000004;
  auVar158._20_4_ = auVar145._20_4_ * 1.0000004;
  auVar158._24_4_ = auVar145._24_4_ * 1.0000004;
  auVar158._28_4_ = auVar145._28_4_;
  auVar145 = vcmpps_avx(local_80,auVar158,2);
  auVar222 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar186._16_16_ = auVar222;
  auVar186._0_16_ = auVar222;
  auVar158 = vcvtdq2ps_avx(auVar186);
  auVar158 = vcmpps_avx(_DAT_01faff40,auVar158,1);
  auVar145 = vandps_avx(auVar145,auVar158);
  uVar131 = vmovmskps_avx(auVar145);
  if (uVar131 != 0) {
    uVar131 = uVar131 & 0xff;
    local_5c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_5c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_5c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_5c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    pLVar140 = pre->ray_space + k;
    local_728 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_828 = pLVar140;
    local_820 = pre;
    local_818 = prim;
    do {
      lVar139 = 0;
      if (uVar131 != 0) {
        for (; (uVar131 >> lVar139 & 1) == 0; lVar139 = lVar139 + 1) {
        }
      }
      uVar19 = *(uint *)(prim + 2);
      uVar20 = *(uint *)(prim + lVar139 * 4 + 6);
      pGVar23 = (context->scene->geometries).items[uVar19].ptr;
      uVar134 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                                (ulong)uVar20 *
                                pGVar23[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      lVar138 = (long)pGVar23[1].intersectionFilterN * uVar134;
      pfVar1 = (float *)(pGVar23[2].intersectionFilterN + uVar134 * (long)pGVar23[2].pointQueryFunc)
      ;
      pfVar2 = (float *)(pGVar23[2].intersectionFilterN +
                        (long)pGVar23[2].pointQueryFunc * (uVar134 + 1));
      auVar179._0_4_ = *pfVar2 * 0.33333334;
      auVar179._4_4_ = pfVar2[1] * 0.33333334;
      auVar179._8_4_ = pfVar2[2] * 0.33333334;
      auVar179._12_4_ = pfVar2[3] * 0.33333334;
      lVar135 = (long)pGVar23[1].intersectionFilterN * (uVar134 + 1);
      lVar139 = *(long *)&pGVar23[1].time_range.upper;
      _local_7e0 = *(undefined1 (*) [16])(lVar139 + lVar138);
      _local_7f0 = *(undefined1 (*) [16])(lVar139 + lVar135);
      fVar217 = *(float *)(lVar139 + 0xc + lVar138);
      auVar293._4_4_ = fVar217;
      auVar293._0_4_ = fVar217;
      auVar293._8_4_ = fVar217;
      auVar293._12_4_ = fVar217;
      fStack_f0 = fVar217;
      _local_100 = auVar293;
      fStack_ec = fVar217;
      fStack_e8 = fVar217;
      register0x000013dc = fVar217;
      uVar21 = (uint)pGVar23[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar231 = *(float *)(lVar139 + 0xc + lVar135);
      auVar346._4_4_ = fVar231;
      auVar346._0_4_ = fVar231;
      auVar346._8_4_ = fVar231;
      auVar346._12_4_ = fVar231;
      fStack_110 = fVar231;
      _local_120 = auVar346;
      fStack_10c = fVar231;
      fStack_108 = fVar231;
      fStack_104 = fVar231;
      lVar139 = (long)(int)uVar21 * 0x44;
      auVar222 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar222 = vinsertps_avx(auVar222,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar356 = local_7e0._0_4_ + *pfVar1 * 0.33333334;
      fVar361 = local_7e0._4_4_ + pfVar1[1] * 0.33333334;
      auVar358._0_8_ = CONCAT44(fVar361,fVar356);
      auVar358._8_4_ = local_7e0._8_4_ + pfVar1[2] * 0.33333334;
      auVar358._12_4_ = local_7e0._12_4_ + pfVar1[3] * 0.33333334;
      _local_810 = vsubps_avx(_local_7f0,auVar179);
      auVar207 = vsubps_avx(_local_7e0,auVar222);
      auVar204 = vshufps_avx(auVar207,auVar207,0);
      auVar221 = vshufps_avx(auVar207,auVar207,0x55);
      auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
      fVar233 = (pLVar140->vx).field_0.m128[0];
      fVar235 = (pLVar140->vx).field_0.m128[1];
      fVar238 = (pLVar140->vx).field_0.m128[2];
      fVar240 = (pLVar140->vx).field_0.m128[3];
      fVar241 = (pLVar140->vy).field_0.m128[0];
      fVar242 = (pLVar140->vy).field_0.m128[1];
      fVar251 = (pLVar140->vy).field_0.m128[2];
      fVar253 = (pLVar140->vy).field_0.m128[3];
      fVar255 = (pLVar140->vz).field_0.m128[0];
      fVar256 = (pLVar140->vz).field_0.m128[1];
      fVar257 = (pLVar140->vz).field_0.m128[2];
      fVar258 = (pLVar140->vz).field_0.m128[3];
      auVar180._0_8_ =
           CONCAT44(auVar204._4_4_ * fVar235 + auVar221._4_4_ * fVar242 + fVar256 * auVar207._4_4_,
                    auVar204._0_4_ * fVar233 + auVar221._0_4_ * fVar241 + fVar255 * auVar207._0_4_);
      auVar180._8_4_ =
           auVar204._8_4_ * fVar238 + auVar221._8_4_ * fVar251 + fVar257 * auVar207._8_4_;
      auVar180._12_4_ =
           auVar204._12_4_ * fVar240 + auVar221._12_4_ * fVar253 + fVar258 * auVar207._12_4_;
      auVar207 = vinsertps_avx(auVar180,auVar293,0x30);
      auVar10 = vsubps_avx(auVar358,auVar222);
      auVar204 = vshufps_avx(auVar10,auVar10,0);
      auVar221 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar294._0_4_ = auVar204._0_4_ * fVar233 + auVar221._0_4_ * fVar241 + fVar255 * auVar10._0_4_
      ;
      auVar294._4_4_ = auVar204._4_4_ * fVar235 + auVar221._4_4_ * fVar242 + fVar256 * auVar10._4_4_
      ;
      auVar294._8_4_ = auVar204._8_4_ * fVar238 + auVar221._8_4_ * fVar251 + fVar257 * auVar10._8_4_
      ;
      auVar294._12_4_ =
           auVar204._12_4_ * fVar240 + auVar221._12_4_ * fVar253 + fVar258 * auVar10._12_4_;
      auVar11 = vsubps_avx(_local_810,auVar222);
      auVar221 = vshufps_avx(auVar11,auVar11,0x55);
      auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar204 = vblendps_avx(auVar294,auVar358,8);
      auVar11 = vshufps_avx(auVar11,auVar11,0);
      auVar244._0_4_ = auVar221._0_4_ * fVar241 + auVar10._0_4_ * fVar255 + auVar11._0_4_ * fVar233;
      auVar244._4_4_ = auVar221._4_4_ * fVar242 + auVar10._4_4_ * fVar256 + auVar11._4_4_ * fVar235;
      auVar244._8_4_ = auVar221._8_4_ * fVar251 + auVar10._8_4_ * fVar257 + auVar11._8_4_ * fVar238;
      auVar244._12_4_ =
           auVar221._12_4_ * fVar253 + auVar10._12_4_ * fVar258 + auVar11._12_4_ * fVar240;
      auVar11 = vsubps_avx(_local_7f0,auVar222);
      auVar222 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar221 = vblendps_avx(auVar244,_local_810,8);
      auVar11 = vshufps_avx(auVar11,auVar11,0);
      auVar200._0_4_ = auVar11._0_4_ * fVar233 + auVar10._0_4_ * fVar241 + fVar255 * auVar222._0_4_;
      auVar200._4_4_ = auVar11._4_4_ * fVar235 + auVar10._4_4_ * fVar242 + fVar256 * auVar222._4_4_;
      auVar200._8_4_ = auVar11._8_4_ * fVar238 + auVar10._8_4_ * fVar251 + fVar257 * auVar222._8_4_;
      auVar200._12_4_ =
           auVar11._12_4_ * fVar240 + auVar10._12_4_ * fVar253 + fVar258 * auVar222._12_4_;
      auVar10 = vinsertps_avx(auVar200,auVar346,0x30);
      auVar220._8_4_ = 0x7fffffff;
      auVar220._0_8_ = 0x7fffffff7fffffff;
      auVar220._12_4_ = 0x7fffffff;
      auVar222 = vandps_avx(auVar207,auVar220);
      auVar204 = vandps_avx(auVar204,auVar220);
      auVar207 = vmaxps_avx(auVar222,auVar204);
      auVar222 = vandps_avx(auVar221,auVar220);
      auVar204 = vandps_avx(auVar10,auVar220);
      auVar222 = vmaxps_avx(auVar222,auVar204);
      auVar222 = vmaxps_avx(auVar207,auVar222);
      auVar204 = vmovshdup_avx(auVar222);
      auVar204 = vmaxss_avx(auVar204,auVar222);
      auVar222 = vshufpd_avx(auVar222,auVar222,1);
      auVar222 = vmaxss_avx(auVar222,auVar204);
      fVar270 = *(float *)(bezier_basis0 + lVar139 + 0x908);
      fVar271 = *(float *)(bezier_basis0 + lVar139 + 0x90c);
      fVar272 = *(float *)(bezier_basis0 + lVar139 + 0x910);
      fVar317 = *(float *)(bezier_basis0 + lVar139 + 0x914);
      fVar239 = *(float *)(bezier_basis0 + lVar139 + 0x918);
      fVar334 = *(float *)(bezier_basis0 + lVar139 + 0x91c);
      fVar318 = *(float *)(bezier_basis0 + lVar139 + 0x920);
      auVar204 = vshufps_avx(auVar244,auVar244,0);
      register0x00001250 = auVar204;
      _local_760 = auVar204;
      fVar238 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0xd8c);
      fVar240 = *(float *)(bezier_basis0 + lVar139 + 0xd90);
      fVar242 = *(float *)(bezier_basis0 + lVar139 + 0xd94);
      fVar251 = *(float *)(bezier_basis0 + lVar139 + 0xd98);
      fVar255 = *(float *)(bezier_basis0 + lVar139 + 0xd9c);
      fVar256 = *(float *)(bezier_basis0 + lVar139 + 0xda0);
      fVar257 = *(float *)(bezier_basis0 + lVar139 + 0xda4);
      auVar123 = *(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0xd8c);
      auVar221 = vshufps_avx(auVar200,auVar200,0);
      register0x00001550 = auVar221;
      _local_4e0 = auVar221;
      fVar344 = auVar221._0_4_;
      fVar350 = auVar221._4_4_;
      fVar352 = auVar221._8_4_;
      fVar354 = auVar221._12_4_;
      fVar176 = auVar204._0_4_;
      fVar194 = auVar204._4_4_;
      fVar195 = auVar204._8_4_;
      fVar196 = auVar204._12_4_;
      auVar204 = vshufps_avx(auVar244,auVar244,0x55);
      register0x000014d0 = auVar204;
      _local_6a0 = auVar204;
      auVar221 = vshufps_avx(auVar200,auVar200,0x55);
      register0x00001390 = auVar221;
      _local_5e0 = auVar221;
      fVar233 = auVar221._0_4_;
      fVar235 = auVar221._4_4_;
      fVar241 = auVar221._8_4_;
      fVar253 = auVar221._12_4_;
      fVar292 = auVar204._0_4_;
      fVar305 = auVar204._4_4_;
      fVar307 = auVar204._8_4_;
      fVar309 = auVar204._12_4_;
      auVar204 = vshufps_avx(_local_810,_local_810,0xff);
      register0x00001310 = auVar204;
      _local_180 = auVar204;
      fVar243 = auVar204._0_4_;
      fVar252 = auVar204._4_4_;
      fVar254 = auVar204._8_4_;
      auVar221 = vshufps_avx(auVar294,auVar294,0);
      register0x000012d0 = auVar221;
      _local_340 = auVar221;
      fVar162 = *(float *)(bezier_basis0 + lVar139 + 0x484);
      fVar164 = *(float *)(bezier_basis0 + lVar139 + 0x488);
      fVar167 = *(float *)(bezier_basis0 + lVar139 + 0x48c);
      fVar169 = *(float *)(bezier_basis0 + lVar139 + 0x490);
      fStack_530 = *(float *)(bezier_basis0 + lVar139 + 0x494);
      fStack_52c = *(float *)(bezier_basis0 + lVar139 + 0x498);
      fStack_528 = *(float *)(bezier_basis0 + lVar139 + 0x49c);
      fStack_524 = *(float *)(bezier_basis0 + lVar139 + 0x4a0);
      fVar218 = auVar221._0_4_;
      fVar232 = auVar221._4_4_;
      fVar234 = auVar221._8_4_;
      fVar236 = auVar221._12_4_;
      auVar221 = vshufps_avx(auVar294,auVar294,0x55);
      register0x000015d0 = auVar221;
      _local_140 = auVar221;
      fVar365 = auVar221._0_4_;
      fVar368 = auVar221._4_4_;
      fVar369 = auVar221._8_4_;
      fVar370 = auVar221._12_4_;
      auVar221 = vshufps_avx(auVar358,auVar358,0xff);
      register0x00001590 = auVar221;
      _local_1a0 = auVar221;
      fVar316 = auVar221._0_4_;
      fVar345 = auVar221._4_4_;
      fVar351 = auVar221._8_4_;
      fVar353 = auVar221._12_4_;
      fVar215 = *(float *)(bezier_basis0 + lVar139 + 0x924) + 0.0 + 0.0;
      auVar116._8_4_ = auVar180._8_4_;
      auVar116._0_8_ = auVar180._0_8_;
      auVar116._12_4_ = auVar180._12_4_;
      auVar221 = vshufps_avx(auVar116,auVar116,0);
      register0x000013d0 = auVar221;
      _local_4c0 = auVar221;
      pauVar3 = (undefined1 (*) [32])(bezier_basis0 + lVar139);
      fVar258 = *(float *)*pauVar3;
      fVar259 = *(float *)(bezier_basis0 + lVar139 + 4);
      fVar267 = *(float *)(bezier_basis0 + lVar139 + 8);
      fVar268 = *(float *)(bezier_basis0 + lVar139 + 0xc);
      fVar269 = *(float *)(bezier_basis0 + lVar139 + 0x10);
      fVar171 = *(float *)(bezier_basis0 + lVar139 + 0x14);
      fVar173 = *(float *)(bezier_basis0 + lVar139 + 0x18);
      auVar124 = *(undefined1 (*) [28])*pauVar3;
      fVar291 = auVar221._0_4_;
      fVar304 = auVar221._4_4_;
      fVar306 = auVar221._8_4_;
      fVar308 = auVar221._12_4_;
      auVar329._0_4_ = fVar291 * fVar258 + fVar218 * fVar162 + fVar176 * fVar270 + fVar344 * fVar238
      ;
      auVar329._4_4_ = fVar304 * fVar259 + fVar232 * fVar164 + fVar194 * fVar271 + fVar350 * fVar240
      ;
      auVar329._8_4_ = fVar306 * fVar267 + fVar234 * fVar167 + fVar195 * fVar272 + fVar352 * fVar242
      ;
      auVar329._12_4_ =
           fVar308 * fVar268 + fVar236 * fVar169 + fVar196 * fVar317 + fVar354 * fVar251;
      auVar329._16_4_ =
           fVar291 * fVar269 + fVar218 * fStack_530 + fVar176 * fVar239 + fVar344 * fVar255;
      auVar329._20_4_ =
           fVar304 * fVar171 + fVar232 * fStack_52c + fVar194 * fVar334 + fVar350 * fVar256;
      auVar329._24_4_ =
           fVar306 * fVar173 + fVar234 * fStack_528 + fVar195 * fVar318 + fVar352 * fVar257;
      auVar329._28_4_ = fStack_524 + fVar236 + fVar196 + 0.0;
      auVar221 = vshufps_avx(auVar116,auVar116,0x55);
      register0x00001210 = auVar221;
      _local_160 = auVar221;
      fVar141 = auVar221._0_4_;
      fVar161 = auVar221._4_4_;
      fVar163 = auVar221._8_4_;
      fVar165 = auVar221._12_4_;
      auVar320._0_4_ = fVar365 * fVar162 + fVar292 * fVar270 + fVar238 * fVar233 + fVar141 * fVar258
      ;
      auVar320._4_4_ = fVar368 * fVar164 + fVar305 * fVar271 + fVar240 * fVar235 + fVar161 * fVar259
      ;
      auVar320._8_4_ = fVar369 * fVar167 + fVar307 * fVar272 + fVar242 * fVar241 + fVar163 * fVar267
      ;
      auVar320._12_4_ =
           fVar370 * fVar169 + fVar309 * fVar317 + fVar251 * fVar253 + fVar165 * fVar268;
      auVar320._16_4_ =
           fVar365 * fStack_530 + fVar292 * fVar239 + fVar255 * fVar233 + fVar141 * fVar269;
      auVar320._20_4_ =
           fVar368 * fStack_52c + fVar305 * fVar334 + fVar256 * fVar235 + fVar161 * fVar171;
      auVar320._24_4_ =
           fVar369 * fStack_528 + fVar307 * fVar318 + fVar257 * fVar241 + fVar163 * fVar173;
      auVar320._28_4_ = 0;
      _local_380 = *pauVar3;
      auVar27 = _local_380;
      local_880._0_4_ =
           fVar217 * fVar258 + fVar316 * fVar162 + fVar243 * fVar270 + fVar238 * fVar231;
      local_880._4_4_ =
           fVar217 * fVar259 + fVar345 * fVar164 + fVar252 * fVar271 + fVar240 * fVar231;
      fStack_878 = fVar217 * fVar267 + fVar351 * fVar167 + fVar254 * fVar272 + fVar242 * fVar231;
      fStack_874 = fVar217 * fVar268 +
                   fVar353 * fVar169 + auVar204._12_4_ * fVar317 + fVar251 * fVar231;
      fStack_870 = fVar217 * fVar269 + fVar316 * fStack_530 + fVar243 * fVar239 + fVar255 * fVar231;
      fStack_86c = fVar217 * fVar171 + fVar345 * fStack_52c + fVar252 * fVar334 + fVar256 * fVar231;
      fStack_868 = fVar217 * fVar173 + fVar351 * fStack_528 + fVar254 * fVar318 + fVar257 * fVar231;
      fStack_864 = *(float *)(bezier_basis0 + lVar139 + 0x1c) + fVar215;
      fVar171 = *(float *)(bezier_basis1 + lVar139 + 0x908);
      fVar173 = *(float *)(bezier_basis1 + lVar139 + 0x90c);
      fVar142 = *(float *)(bezier_basis1 + lVar139 + 0x910);
      fVar174 = *(float *)(bezier_basis1 + lVar139 + 0x914);
      fVar216 = *(float *)(bezier_basis1 + lVar139 + 0x918);
      fVar289 = *(float *)(bezier_basis1 + lVar139 + 0x91c);
      fVar166 = *(float *)(bezier_basis1 + lVar139 + 0x920);
      fVar168 = *(float *)(bezier_basis1 + lVar139 + 0xd8c);
      fVar170 = *(float *)(bezier_basis1 + lVar139 + 0xd90);
      fVar172 = *(float *)(bezier_basis1 + lVar139 + 0xd94);
      fVar197 = *(float *)(bezier_basis1 + lVar139 + 0xd98);
      fVar273 = *(float *)(bezier_basis1 + lVar139 + 0xd9c);
      fVar288 = *(float *)(bezier_basis1 + lVar139 + 0xda0);
      fVar237 = *(float *)(bezier_basis1 + lVar139 + 0xda4);
      fVar175 = *(float *)(bezier_basis1 + lVar139 + 0x484);
      fVar198 = *(float *)(bezier_basis1 + lVar139 + 0x488);
      fVar274 = *(float *)(bezier_basis1 + lVar139 + 0x48c);
      fVar283 = *(float *)(bezier_basis1 + lVar139 + 0x490);
      fVar284 = *(float *)(bezier_basis1 + lVar139 + 0x494);
      fVar285 = *(float *)(bezier_basis1 + lVar139 + 0x498);
      fVar286 = *(float *)(bezier_basis1 + lVar139 + 0x49c);
      fVar240 = fVar354 + fVar215 + 0.0;
      fVar215 = *(float *)(bezier_basis1 + lVar139);
      fVar287 = *(float *)(bezier_basis1 + lVar139 + 4);
      fVar290 = *(float *)(bezier_basis1 + lVar139 + 8);
      fVar324 = *(float *)(bezier_basis1 + lVar139 + 0xc);
      fVar325 = *(float *)(bezier_basis1 + lVar139 + 0x10);
      fVar326 = *(float *)(bezier_basis1 + lVar139 + 0x14);
      fVar327 = *(float *)(bezier_basis1 + lVar139 + 0x18);
      local_600._0_4_ =
           fVar291 * fVar215 + fVar218 * fVar175 + fVar171 * fVar176 + fVar344 * fVar168;
      local_600._4_4_ =
           fVar304 * fVar287 + fVar232 * fVar198 + fVar173 * fVar194 + fVar350 * fVar170;
      fStack_5f8 = fVar306 * fVar290 + fVar234 * fVar274 + fVar142 * fVar195 + fVar352 * fVar172;
      fStack_5f4 = fVar308 * fVar324 + fVar236 * fVar283 + fVar174 * fVar196 + fVar354 * fVar197;
      fStack_5f0 = fVar291 * fVar325 + fVar218 * fVar284 + fVar216 * fVar176 + fVar344 * fVar273;
      fStack_5ec = fVar304 * fVar326 + fVar232 * fVar285 + fVar289 * fVar194 + fVar350 * fVar288;
      fStack_5e8 = fVar306 * fVar327 + fVar234 * fVar286 + fVar166 * fVar195 + fVar352 * fVar237;
      fStack_5e4 = fVar353 + fVar240;
      local_520._0_4_ =
           fVar141 * fVar215 + fVar365 * fVar175 + fVar292 * fVar171 + fVar168 * fVar233;
      local_520._4_4_ =
           fVar161 * fVar287 + fVar368 * fVar198 + fVar305 * fVar173 + fVar170 * fVar235;
      fStack_518 = fVar163 * fVar290 + fVar369 * fVar274 + fVar307 * fVar142 + fVar172 * fVar241;
      fStack_514 = fVar165 * fVar324 + fVar370 * fVar283 + fVar309 * fVar174 + fVar197 * fVar253;
      fStack_510 = fVar141 * fVar325 + fVar365 * fVar284 + fVar292 * fVar216 + fVar273 * fVar233;
      fStack_50c = fVar161 * fVar326 + fVar368 * fVar285 + fVar305 * fVar289 + fVar288 * fVar235;
      fStack_508 = fVar163 * fVar327 + fVar369 * fVar286 + fVar307 * fVar166 + fVar237 * fVar241;
      fStack_504 = fVar240 + fVar354 + fStack_524 + 0.0;
      auVar312._0_4_ = fVar316 * fVar175 + fVar243 * fVar171 + fVar168 * fVar231 + fVar217 * fVar215
      ;
      auVar312._4_4_ = fVar345 * fVar198 + fVar252 * fVar173 + fVar170 * fVar231 + fVar217 * fVar287
      ;
      auVar312._8_4_ = fVar351 * fVar274 + fVar254 * fVar142 + fVar172 * fVar231 + fVar217 * fVar290
      ;
      auVar312._12_4_ =
           fVar353 * fVar283 + auVar204._12_4_ * fVar174 + fVar197 * fVar231 + fVar217 * fVar324;
      auVar312._16_4_ =
           fVar316 * fVar284 + fVar243 * fVar216 + fVar273 * fVar231 + fVar217 * fVar325;
      auVar312._20_4_ =
           fVar345 * fVar285 + fVar252 * fVar289 + fVar288 * fVar231 + fVar217 * fVar326;
      auVar312._24_4_ =
           fVar351 * fVar286 + fVar254 * fVar166 + fVar237 * fVar231 + fVar217 * fVar327;
      auVar312._28_4_ = fVar354 + fVar253 + fStack_524 + fVar240;
      auVar26 = vsubps_avx(_local_600,auVar329);
      auVar313 = vsubps_avx(_local_520,auVar320);
      fVar217 = auVar26._0_4_;
      fVar238 = auVar26._4_4_;
      auVar32._4_4_ = auVar320._4_4_ * fVar238;
      auVar32._0_4_ = auVar320._0_4_ * fVar217;
      fVar242 = auVar26._8_4_;
      auVar32._8_4_ = auVar320._8_4_ * fVar242;
      fVar255 = auVar26._12_4_;
      auVar32._12_4_ = auVar320._12_4_ * fVar255;
      fVar257 = auVar26._16_4_;
      auVar32._16_4_ = auVar320._16_4_ * fVar257;
      fVar259 = auVar26._20_4_;
      auVar32._20_4_ = auVar320._20_4_ * fVar259;
      fVar268 = auVar26._24_4_;
      auVar32._24_4_ = auVar320._24_4_ * fVar268;
      auVar32._28_4_ = fVar240;
      fVar231 = auVar313._0_4_;
      fVar240 = auVar313._4_4_;
      auVar33._4_4_ = auVar329._4_4_ * fVar240;
      auVar33._0_4_ = auVar329._0_4_ * fVar231;
      fVar251 = auVar313._8_4_;
      auVar33._8_4_ = auVar329._8_4_ * fVar251;
      fVar256 = auVar313._12_4_;
      auVar33._12_4_ = auVar329._12_4_ * fVar256;
      fVar258 = auVar313._16_4_;
      auVar33._16_4_ = auVar329._16_4_ * fVar258;
      fVar267 = auVar313._20_4_;
      auVar33._20_4_ = auVar329._20_4_ * fVar267;
      fVar269 = auVar313._24_4_;
      auVar33._24_4_ = auVar329._24_4_ * fVar269;
      auVar33._28_4_ = fStack_504;
      auVar158 = vsubps_avx(auVar32,auVar33);
      auVar145 = vmaxps_avx(_local_880,auVar312);
      auVar34._4_4_ = auVar145._4_4_ * auVar145._4_4_ * (fVar238 * fVar238 + fVar240 * fVar240);
      auVar34._0_4_ = auVar145._0_4_ * auVar145._0_4_ * (fVar217 * fVar217 + fVar231 * fVar231);
      auVar34._8_4_ = auVar145._8_4_ * auVar145._8_4_ * (fVar242 * fVar242 + fVar251 * fVar251);
      auVar34._12_4_ = auVar145._12_4_ * auVar145._12_4_ * (fVar255 * fVar255 + fVar256 * fVar256);
      auVar34._16_4_ = auVar145._16_4_ * auVar145._16_4_ * (fVar257 * fVar257 + fVar258 * fVar258);
      auVar34._20_4_ = auVar145._20_4_ * auVar145._20_4_ * (fVar259 * fVar259 + fVar267 * fVar267);
      auVar34._24_4_ = auVar145._24_4_ * auVar145._24_4_ * (fVar268 * fVar268 + fVar269 * fVar269);
      auVar34._28_4_ = auVar313._28_4_ + fStack_504;
      auVar35._4_4_ = auVar158._4_4_ * auVar158._4_4_;
      auVar35._0_4_ = auVar158._0_4_ * auVar158._0_4_;
      auVar35._8_4_ = auVar158._8_4_ * auVar158._8_4_;
      auVar35._12_4_ = auVar158._12_4_ * auVar158._12_4_;
      auVar35._16_4_ = auVar158._16_4_ * auVar158._16_4_;
      auVar35._20_4_ = auVar158._20_4_ * auVar158._20_4_;
      auVar35._24_4_ = auVar158._24_4_ * auVar158._24_4_;
      auVar35._28_4_ = auVar158._28_4_;
      auVar145 = vcmpps_avx(auVar35,auVar34,2);
      local_670 = ZEXT416((uint)(float)(int)uVar21);
      auVar204 = vshufps_avx(local_670,local_670,0);
      auVar226._16_16_ = auVar204;
      auVar226._0_16_ = auVar204;
      auVar158 = vcmpps_avx(_DAT_01faff40,auVar226,1);
      auVar230 = ZEXT3264(auVar158);
      auVar117._8_4_ = auVar180._8_4_;
      auVar117._0_8_ = auVar180._0_8_;
      auVar117._12_4_ = auVar180._12_4_;
      auVar204 = vpermilps_avx(auVar117,0xaa);
      register0x00001550 = auVar204;
      _local_1c0 = auVar204;
      auVar221 = vpermilps_avx(auVar294,0xaa);
      register0x00001590 = auVar221;
      _local_360 = auVar221;
      auVar207 = vpermilps_avx(auVar244,0xaa);
      register0x00001410 = auVar207;
      _local_a0 = auVar207;
      auVar10 = vpermilps_avx(auVar200,0xaa);
      register0x00001310 = auVar10;
      _local_780 = auVar10;
      auVar250 = ZEXT3264(_local_780);
      auVar152 = auVar158 & auVar145;
      uVar136 = *(uint *)(ray + k * 4 + 0x30);
      auVar222 = ZEXT416((uint)(auVar222._0_4_ * 4.7683716e-07));
      local_6c0._0_16_ = auVar222;
      fVar217 = fVar292;
      fVar231 = fVar305;
      fVar238 = fVar307;
      _local_800 = auVar358;
      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar152 >> 0x7f,0) == '\0') &&
            (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar152 >> 0xbf,0) == '\0') &&
          (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar152[0x1f]) {
        auVar333 = ZEXT3264(_local_760);
        auVar313 = local_580;
      }
      else {
        auVar145 = vandps_avx(auVar145,auVar158);
        fVar345 = auVar204._0_4_;
        fVar351 = auVar204._4_4_;
        fVar353 = auVar204._8_4_;
        fVar355 = auVar204._12_4_;
        fVar357 = auVar221._0_4_;
        fVar362 = auVar221._4_4_;
        fVar363 = auVar221._8_4_;
        fVar364 = auVar221._12_4_;
        fVar243 = auVar207._0_4_;
        fVar252 = auVar207._4_4_;
        fVar254 = auVar207._8_4_;
        fVar316 = auVar207._12_4_;
        fVar240 = auVar10._0_4_;
        fVar242 = auVar10._4_4_;
        fVar251 = auVar10._8_4_;
        fVar255 = auVar10._12_4_;
        local_3a0._0_4_ =
             fVar345 * fVar215 + fVar357 * fVar175 + fVar243 * fVar171 + fVar168 * fVar240;
        local_3a0._4_4_ =
             fVar351 * fVar287 + fVar362 * fVar198 + fVar252 * fVar173 + fVar170 * fVar242;
        fStack_398 = fVar353 * fVar290 + fVar363 * fVar274 + fVar254 * fVar142 + fVar172 * fVar251;
        fStack_394 = fVar355 * fVar324 + fVar364 * fVar283 + fVar316 * fVar174 + fVar197 * fVar255;
        fStack_390 = fVar345 * fVar325 + fVar357 * fVar284 + fVar243 * fVar216 + fVar273 * fVar240;
        fStack_38c = fVar351 * fVar326 + fVar362 * fVar285 + fVar252 * fVar289 + fVar288 * fVar242;
        fStack_388 = fVar353 * fVar327 + fVar363 * fVar286 + fVar254 * fVar166 + fVar237 * fVar251;
        fStack_384 = auVar145._28_4_ +
                     auVar158._28_4_ +
                     *(float *)(bezier_basis1 + lVar139 + 0x924) +
                     *(float *)(bezier_basis1 + lVar139 + 0x4a0);
        local_380._0_4_ = auVar124._0_4_;
        local_380._4_4_ = auVar124._4_4_;
        fStack_378 = auVar124._8_4_;
        fStack_374 = auVar124._12_4_;
        fStack_370 = auVar124._16_4_;
        fStack_36c = auVar124._20_4_;
        fStack_368 = auVar124._24_4_;
        local_720._0_4_ = auVar123._0_4_;
        local_720._4_4_ = auVar123._4_4_;
        fStack_718 = auVar123._8_4_;
        fStack_714 = auVar123._12_4_;
        fStack_710 = auVar123._16_4_;
        fStack_70c = auVar123._20_4_;
        fStack_708 = auVar123._24_4_;
        local_620 = fVar345 * (float)local_380._0_4_ +
                    fVar357 * fVar162 + fVar243 * fVar270 + fVar240 * (float)local_720._0_4_;
        fStack_61c = fVar351 * (float)local_380._4_4_ +
                     fVar362 * fVar164 + fVar252 * fVar271 + fVar242 * (float)local_720._4_4_;
        fStack_618 = fVar353 * fStack_378 +
                     fVar363 * fVar167 + fVar254 * fVar272 + fVar251 * fStack_718;
        fStack_614 = fVar355 * fStack_374 +
                     fVar364 * fVar169 + fVar316 * fVar317 + fVar255 * fStack_714;
        fStack_610 = fVar345 * fStack_370 +
                     fVar357 * fStack_530 + fVar243 * fVar239 + fVar240 * fStack_710;
        fStack_60c = fVar351 * fStack_36c +
                     fVar362 * fStack_52c + fVar252 * fVar334 + fVar242 * fStack_70c;
        fStack_608 = fVar353 * fStack_368 +
                     fVar363 * fStack_528 + fVar254 * fVar318 + fVar251 * fStack_708;
        fStack_604 = fVar165 + fStack_384 + auVar145._28_4_ + auVar158._28_4_;
        fVar256 = *(float *)(bezier_basis0 + lVar139 + 0x1210);
        fVar257 = *(float *)(bezier_basis0 + lVar139 + 0x1214);
        fVar258 = *(float *)(bezier_basis0 + lVar139 + 0x1218);
        fVar259 = *(float *)(bezier_basis0 + lVar139 + 0x121c);
        fVar267 = *(float *)(bezier_basis0 + lVar139 + 0x1220);
        fVar268 = *(float *)(bezier_basis0 + lVar139 + 0x1224);
        fVar269 = *(float *)(bezier_basis0 + lVar139 + 0x1228);
        fVar270 = *(float *)(bezier_basis0 + lVar139 + 0x1694);
        fVar271 = *(float *)(bezier_basis0 + lVar139 + 0x1698);
        fVar272 = *(float *)(bezier_basis0 + lVar139 + 0x169c);
        fVar317 = *(float *)(bezier_basis0 + lVar139 + 0x16a0);
        fVar239 = *(float *)(bezier_basis0 + lVar139 + 0x16a4);
        fVar334 = *(float *)(bezier_basis0 + lVar139 + 0x16a8);
        fVar318 = *(float *)(bezier_basis0 + lVar139 + 0x16ac);
        fVar162 = *(float *)(bezier_basis0 + lVar139 + 0x1b18);
        fVar164 = *(float *)(bezier_basis0 + lVar139 + 0x1b1c);
        fVar167 = *(float *)(bezier_basis0 + lVar139 + 0x1b20);
        fVar169 = *(float *)(bezier_basis0 + lVar139 + 0x1b24);
        fVar171 = *(float *)(bezier_basis0 + lVar139 + 0x1b28);
        fVar173 = *(float *)(bezier_basis0 + lVar139 + 0x1b2c);
        fVar142 = *(float *)(bezier_basis0 + lVar139 + 0x1b30);
        fVar174 = *(float *)(bezier_basis0 + lVar139 + 0x1f9c);
        fVar216 = *(float *)(bezier_basis0 + lVar139 + 0x1fa0);
        fVar289 = *(float *)(bezier_basis0 + lVar139 + 0x1fa4);
        fVar166 = *(float *)(bezier_basis0 + lVar139 + 0x1fa8);
        fVar168 = *(float *)(bezier_basis0 + lVar139 + 0x1fac);
        fVar170 = *(float *)(bezier_basis0 + lVar139 + 0x1fb0);
        fVar172 = *(float *)(bezier_basis0 + lVar139 + 0x1fb4);
        fVar273 = *(float *)(bezier_basis1 + lVar139 + 0x4a0) + 0.0;
        fVar197 = *(float *)(bezier_basis0 + lVar139 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar139 + 0x1fb8);
        fVar288 = *(float *)(bezier_basis0 + lVar139 + 0x16b0) + fVar197;
        local_540 = fVar291 * fVar256 + fVar218 * fVar270 + fVar176 * fVar162 + fVar344 * fVar174;
        fStack_53c = fVar304 * fVar257 + fVar232 * fVar271 + fVar194 * fVar164 + fVar350 * fVar216;
        fStack_538 = fVar306 * fVar258 + fVar234 * fVar272 + fVar195 * fVar167 + fVar352 * fVar289;
        fStack_534 = fVar308 * fVar259 + fVar236 * fVar317 + fVar196 * fVar169 + fVar354 * fVar166;
        fStack_530 = fVar291 * fVar267 + fVar218 * fVar239 + fVar176 * fVar171 + fVar344 * fVar168;
        fStack_52c = fVar304 * fVar268 + fVar232 * fVar334 + fVar194 * fVar173 + fVar350 * fVar170;
        fStack_528 = fVar306 * fVar269 + fVar234 * fVar318 + fVar195 * fVar142 + fVar352 * fVar172;
        fStack_524 = *(float *)(bezier_basis0 + lVar139 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar139 + 0x1fb8) + fVar273;
        auVar187._0_4_ =
             fVar141 * fVar256 + fVar365 * fVar270 + fVar292 * fVar162 + fVar233 * fVar174;
        auVar187._4_4_ =
             fVar161 * fVar257 + fVar368 * fVar271 + fVar305 * fVar164 + fVar235 * fVar216;
        auVar187._8_4_ =
             fVar163 * fVar258 + fVar369 * fVar272 + fVar307 * fVar167 + fVar241 * fVar289;
        auVar187._12_4_ =
             fVar165 * fVar259 + fVar370 * fVar317 + fVar309 * fVar169 + fVar253 * fVar166;
        auVar187._16_4_ =
             fVar141 * fVar267 + fVar365 * fVar239 + fVar292 * fVar171 + fVar233 * fVar168;
        auVar187._20_4_ =
             fVar161 * fVar268 + fVar368 * fVar334 + fVar305 * fVar173 + fVar235 * fVar170;
        auVar187._24_4_ =
             fVar163 * fVar269 + fVar369 * fVar318 + fVar307 * fVar142 + fVar241 * fVar172;
        auVar187._28_4_ = fVar197 + fVar273 + *(float *)(bezier_basis1 + lVar139 + 0x1c) + 0.0;
        auVar264._0_4_ =
             fVar345 * fVar256 + fVar357 * fVar270 + fVar243 * fVar162 + fVar240 * fVar174;
        auVar264._4_4_ =
             fVar351 * fVar257 + fVar362 * fVar271 + fVar252 * fVar164 + fVar242 * fVar216;
        auVar264._8_4_ =
             fVar353 * fVar258 + fVar363 * fVar272 + fVar254 * fVar167 + fVar251 * fVar289;
        auVar264._12_4_ =
             fVar355 * fVar259 + fVar364 * fVar317 + fVar316 * fVar169 + fVar255 * fVar166;
        auVar264._16_4_ =
             fVar345 * fVar267 + fVar357 * fVar239 + fVar243 * fVar171 + fVar240 * fVar168;
        auVar264._20_4_ =
             fVar351 * fVar268 + fVar362 * fVar334 + fVar252 * fVar173 + fVar242 * fVar170;
        auVar264._24_4_ =
             fVar353 * fVar269 + fVar363 * fVar318 + fVar254 * fVar142 + fVar251 * fVar172;
        auVar264._28_4_ = *(float *)(bezier_basis0 + lVar139 + 0x122c) + fVar288;
        fVar256 = *(float *)(bezier_basis1 + lVar139 + 0x1b18);
        fVar257 = *(float *)(bezier_basis1 + lVar139 + 0x1b1c);
        fVar258 = *(float *)(bezier_basis1 + lVar139 + 0x1b20);
        fVar259 = *(float *)(bezier_basis1 + lVar139 + 0x1b24);
        fVar267 = *(float *)(bezier_basis1 + lVar139 + 0x1b28);
        fVar268 = *(float *)(bezier_basis1 + lVar139 + 0x1b2c);
        fVar269 = *(float *)(bezier_basis1 + lVar139 + 0x1b30);
        fVar270 = *(float *)(bezier_basis1 + lVar139 + 0x1f9c);
        fVar271 = *(float *)(bezier_basis1 + lVar139 + 0x1fa0);
        fVar272 = *(float *)(bezier_basis1 + lVar139 + 0x1fa4);
        fVar317 = *(float *)(bezier_basis1 + lVar139 + 0x1fa8);
        fVar239 = *(float *)(bezier_basis1 + lVar139 + 0x1fac);
        fVar334 = *(float *)(bezier_basis1 + lVar139 + 0x1fb0);
        fVar318 = *(float *)(bezier_basis1 + lVar139 + 0x1fb4);
        fVar162 = *(float *)(bezier_basis1 + lVar139 + 0x1694);
        fVar164 = *(float *)(bezier_basis1 + lVar139 + 0x1698);
        fVar167 = *(float *)(bezier_basis1 + lVar139 + 0x169c);
        fVar169 = *(float *)(bezier_basis1 + lVar139 + 0x16a0);
        fVar171 = *(float *)(bezier_basis1 + lVar139 + 0x16a4);
        fVar173 = *(float *)(bezier_basis1 + lVar139 + 0x16a8);
        fVar142 = *(float *)(bezier_basis1 + lVar139 + 0x16ac);
        fVar174 = *(float *)(bezier_basis1 + lVar139 + 0x1210);
        fVar216 = *(float *)(bezier_basis1 + lVar139 + 0x1214);
        fVar289 = *(float *)(bezier_basis1 + lVar139 + 0x1218);
        fVar166 = *(float *)(bezier_basis1 + lVar139 + 0x121c);
        fVar168 = *(float *)(bezier_basis1 + lVar139 + 0x1220);
        fVar170 = *(float *)(bezier_basis1 + lVar139 + 0x1224);
        fVar172 = *(float *)(bezier_basis1 + lVar139 + 0x1228);
        auVar279._0_4_ =
             fVar174 * fVar291 + fVar218 * fVar162 + fVar176 * fVar256 + fVar344 * fVar270;
        auVar279._4_4_ =
             fVar216 * fVar304 + fVar232 * fVar164 + fVar194 * fVar257 + fVar350 * fVar271;
        auVar279._8_4_ =
             fVar289 * fVar306 + fVar234 * fVar167 + fVar195 * fVar258 + fVar352 * fVar272;
        auVar279._12_4_ =
             fVar166 * fVar308 + fVar236 * fVar169 + fVar196 * fVar259 + fVar354 * fVar317;
        auVar279._16_4_ =
             fVar168 * fVar291 + fVar218 * fVar171 + fVar176 * fVar267 + fVar344 * fVar239;
        auVar279._20_4_ =
             fVar170 * fVar304 + fVar232 * fVar173 + fVar194 * fVar268 + fVar350 * fVar334;
        auVar279._24_4_ =
             fVar172 * fVar306 + fVar234 * fVar142 + fVar195 * fVar269 + fVar352 * fVar318;
        auVar279._28_4_ = fVar354 + fVar354 + fVar308 + fVar288;
        auVar321._0_4_ =
             fVar141 * fVar174 + fVar365 * fVar162 + fVar292 * fVar256 + fVar233 * fVar270;
        auVar321._4_4_ =
             fVar161 * fVar216 + fVar368 * fVar164 + fVar305 * fVar257 + fVar235 * fVar271;
        auVar321._8_4_ =
             fVar163 * fVar289 + fVar369 * fVar167 + fVar307 * fVar258 + fVar241 * fVar272;
        auVar321._12_4_ =
             fVar165 * fVar166 + fVar370 * fVar169 + fVar309 * fVar259 + fVar253 * fVar317;
        auVar321._16_4_ =
             fVar141 * fVar168 + fVar365 * fVar171 + fVar292 * fVar267 + fVar233 * fVar239;
        auVar321._20_4_ =
             fVar161 * fVar170 + fVar368 * fVar173 + fVar305 * fVar268 + fVar235 * fVar334;
        auVar321._24_4_ =
             fVar163 * fVar172 + fVar369 * fVar142 + fVar307 * fVar269 + fVar241 * fVar318;
        auVar321._28_4_ = fVar354 + fVar354 + fVar354 + fVar308;
        auVar212._0_4_ =
             fVar345 * fVar174 + fVar357 * fVar162 + fVar243 * fVar256 + fVar270 * fVar240;
        auVar212._4_4_ =
             fVar351 * fVar216 + fVar362 * fVar164 + fVar252 * fVar257 + fVar271 * fVar242;
        auVar212._8_4_ =
             fVar353 * fVar289 + fVar363 * fVar167 + fVar254 * fVar258 + fVar272 * fVar251;
        auVar212._12_4_ =
             fVar355 * fVar166 + fVar364 * fVar169 + fVar316 * fVar259 + fVar317 * fVar255;
        auVar212._16_4_ =
             fVar345 * fVar168 + fVar357 * fVar171 + fVar243 * fVar267 + fVar239 * fVar240;
        auVar212._20_4_ =
             fVar351 * fVar170 + fVar362 * fVar173 + fVar252 * fVar268 + fVar334 * fVar242;
        auVar212._24_4_ =
             fVar353 * fVar172 + fVar363 * fVar142 + fVar254 * fVar269 + fVar318 * fVar251;
        auVar212._28_4_ =
             *(float *)(bezier_basis1 + lVar139 + 0x122c) +
             *(float *)(bezier_basis1 + lVar139 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar139 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar139 + 0x1fb8);
        auVar246._8_4_ = 0x7fffffff;
        auVar246._0_8_ = 0x7fffffff7fffffff;
        auVar246._12_4_ = 0x7fffffff;
        auVar246._16_4_ = 0x7fffffff;
        auVar246._20_4_ = 0x7fffffff;
        auVar246._24_4_ = 0x7fffffff;
        auVar246._28_4_ = 0x7fffffff;
        auVar122._4_4_ = fStack_53c;
        auVar122._0_4_ = local_540;
        auVar122._8_4_ = fStack_538;
        auVar122._12_4_ = fStack_534;
        auVar122._16_4_ = fStack_530;
        auVar122._20_4_ = fStack_52c;
        auVar122._24_4_ = fStack_528;
        auVar122._28_4_ = fStack_524;
        auVar158 = vandps_avx(auVar122,auVar246);
        auVar152 = vandps_avx(auVar187,auVar246);
        auVar152 = vmaxps_avx(auVar158,auVar152);
        auVar158 = vandps_avx(auVar264,auVar246);
        auVar158 = vmaxps_avx(auVar152,auVar158);
        auVar222 = vpermilps_avx(auVar222,0);
        auVar265._16_16_ = auVar222;
        auVar265._0_16_ = auVar222;
        auVar158 = vcmpps_avx(auVar158,auVar265,1);
        auVar28 = vblendvps_avx(auVar122,auVar26,auVar158);
        auVar29 = vblendvps_avx(auVar187,auVar313,auVar158);
        auVar158 = vandps_avx(auVar279,auVar246);
        auVar152 = vandps_avx(auVar321,auVar246);
        auVar30 = vmaxps_avx(auVar158,auVar152);
        auVar158 = vandps_avx(auVar212,auVar246);
        auVar158 = vmaxps_avx(auVar30,auVar158);
        auVar30 = vcmpps_avx(auVar158,auVar265,1);
        auVar158 = vblendvps_avx(auVar279,auVar26,auVar30);
        auVar26 = vblendvps_avx(auVar321,auVar313,auVar30);
        fVar174 = auVar28._0_4_;
        fVar216 = auVar28._4_4_;
        fVar289 = auVar28._8_4_;
        fVar166 = auVar28._12_4_;
        fVar168 = auVar28._16_4_;
        fVar170 = auVar28._20_4_;
        fVar172 = auVar28._24_4_;
        fVar283 = -auVar28._28_4_;
        fVar197 = auVar158._0_4_;
        fVar273 = auVar158._4_4_;
        fVar288 = auVar158._8_4_;
        fVar237 = auVar158._12_4_;
        fVar175 = auVar158._16_4_;
        fVar198 = auVar158._20_4_;
        fVar274 = auVar158._24_4_;
        fVar233 = auVar29._0_4_;
        fVar242 = auVar29._4_4_;
        fVar256 = auVar29._8_4_;
        fVar267 = auVar29._12_4_;
        fVar271 = auVar29._16_4_;
        fVar334 = auVar29._20_4_;
        fVar167 = auVar29._24_4_;
        auVar148._0_4_ = fVar233 * fVar233 + fVar174 * fVar174;
        auVar148._4_4_ = fVar242 * fVar242 + fVar216 * fVar216;
        auVar148._8_4_ = fVar256 * fVar256 + fVar289 * fVar289;
        auVar148._12_4_ = fVar267 * fVar267 + fVar166 * fVar166;
        auVar148._16_4_ = fVar271 * fVar271 + fVar168 * fVar168;
        auVar148._20_4_ = fVar334 * fVar334 + fVar170 * fVar170;
        auVar148._24_4_ = fVar167 * fVar167 + fVar172 * fVar172;
        auVar148._28_4_ = auVar321._28_4_ + auVar28._28_4_;
        auVar313 = vrsqrtps_avx(auVar148);
        fVar235 = auVar313._0_4_;
        fVar240 = auVar313._4_4_;
        auVar36._4_4_ = fVar240 * 1.5;
        auVar36._0_4_ = fVar235 * 1.5;
        fVar241 = auVar313._8_4_;
        auVar36._8_4_ = fVar241 * 1.5;
        fVar251 = auVar313._12_4_;
        auVar36._12_4_ = fVar251 * 1.5;
        fVar253 = auVar313._16_4_;
        auVar36._16_4_ = fVar253 * 1.5;
        fVar255 = auVar313._20_4_;
        auVar36._20_4_ = fVar255 * 1.5;
        fVar257 = auVar313._24_4_;
        fVar142 = auVar152._28_4_;
        auVar36._24_4_ = fVar257 * 1.5;
        auVar36._28_4_ = fVar142;
        auVar37._4_4_ = fVar240 * fVar240 * fVar240 * auVar148._4_4_ * 0.5;
        auVar37._0_4_ = fVar235 * fVar235 * fVar235 * auVar148._0_4_ * 0.5;
        auVar37._8_4_ = fVar241 * fVar241 * fVar241 * auVar148._8_4_ * 0.5;
        auVar37._12_4_ = fVar251 * fVar251 * fVar251 * auVar148._12_4_ * 0.5;
        auVar37._16_4_ = fVar253 * fVar253 * fVar253 * auVar148._16_4_ * 0.5;
        auVar37._20_4_ = fVar255 * fVar255 * fVar255 * auVar148._20_4_ * 0.5;
        auVar37._24_4_ = fVar257 * fVar257 * fVar257 * auVar148._24_4_ * 0.5;
        auVar37._28_4_ = auVar148._28_4_;
        auVar313 = vsubps_avx(auVar36,auVar37);
        fVar235 = auVar313._0_4_;
        fVar251 = auVar313._4_4_;
        fVar257 = auVar313._8_4_;
        fVar268 = auVar313._12_4_;
        fVar272 = auVar313._16_4_;
        fVar318 = auVar313._20_4_;
        fVar169 = auVar313._24_4_;
        fVar240 = auVar26._0_4_;
        fVar253 = auVar26._4_4_;
        fVar258 = auVar26._8_4_;
        fVar269 = auVar26._12_4_;
        fVar317 = auVar26._16_4_;
        fVar162 = auVar26._20_4_;
        fVar171 = auVar26._24_4_;
        auVar149._0_4_ = fVar240 * fVar240 + fVar197 * fVar197;
        auVar149._4_4_ = fVar253 * fVar253 + fVar273 * fVar273;
        auVar149._8_4_ = fVar258 * fVar258 + fVar288 * fVar288;
        auVar149._12_4_ = fVar269 * fVar269 + fVar237 * fVar237;
        auVar149._16_4_ = fVar317 * fVar317 + fVar175 * fVar175;
        auVar149._20_4_ = fVar162 * fVar162 + fVar198 * fVar198;
        auVar149._24_4_ = fVar171 * fVar171 + fVar274 * fVar274;
        auVar149._28_4_ = auVar158._28_4_ + auVar313._28_4_;
        auVar158 = vrsqrtps_avx(auVar149);
        fVar241 = auVar158._0_4_;
        fVar255 = auVar158._4_4_;
        auVar38._4_4_ = fVar255 * 1.5;
        auVar38._0_4_ = fVar241 * 1.5;
        fVar259 = auVar158._8_4_;
        auVar38._8_4_ = fVar259 * 1.5;
        fVar270 = auVar158._12_4_;
        auVar38._12_4_ = fVar270 * 1.5;
        fVar239 = auVar158._16_4_;
        auVar38._16_4_ = fVar239 * 1.5;
        fVar164 = auVar158._20_4_;
        auVar38._20_4_ = fVar164 * 1.5;
        fVar173 = auVar158._24_4_;
        auVar38._24_4_ = fVar173 * 1.5;
        auVar38._28_4_ = fVar142;
        auVar39._4_4_ = fVar255 * fVar255 * fVar255 * auVar149._4_4_ * 0.5;
        auVar39._0_4_ = fVar241 * fVar241 * fVar241 * auVar149._0_4_ * 0.5;
        auVar39._8_4_ = fVar259 * fVar259 * fVar259 * auVar149._8_4_ * 0.5;
        auVar39._12_4_ = fVar270 * fVar270 * fVar270 * auVar149._12_4_ * 0.5;
        auVar39._16_4_ = fVar239 * fVar239 * fVar239 * auVar149._16_4_ * 0.5;
        auVar39._20_4_ = fVar164 * fVar164 * fVar164 * auVar149._20_4_ * 0.5;
        auVar39._24_4_ = fVar173 * fVar173 * fVar173 * auVar149._24_4_ * 0.5;
        auVar39._28_4_ = auVar149._28_4_;
        auVar158 = vsubps_avx(auVar38,auVar39);
        fVar241 = auVar158._0_4_;
        fVar255 = auVar158._4_4_;
        fVar259 = auVar158._8_4_;
        fVar270 = auVar158._12_4_;
        fVar239 = auVar158._16_4_;
        fVar164 = auVar158._20_4_;
        fVar173 = auVar158._24_4_;
        fVar233 = (float)local_880._0_4_ * fVar233 * fVar235;
        fVar242 = (float)local_880._4_4_ * fVar242 * fVar251;
        auVar40._4_4_ = fVar242;
        auVar40._0_4_ = fVar233;
        fVar256 = fStack_878 * fVar256 * fVar257;
        auVar40._8_4_ = fVar256;
        fVar267 = fStack_874 * fVar267 * fVar268;
        auVar40._12_4_ = fVar267;
        fVar271 = fStack_870 * fVar271 * fVar272;
        auVar40._16_4_ = fVar271;
        fVar334 = fStack_86c * fVar334 * fVar318;
        auVar40._20_4_ = fVar334;
        fVar167 = fStack_868 * fVar167 * fVar169;
        auVar40._24_4_ = fVar167;
        auVar40._28_4_ = fVar142;
        local_720._4_4_ = fVar242 + auVar329._4_4_;
        local_720._0_4_ = fVar233 + auVar329._0_4_;
        fStack_718 = fVar256 + auVar329._8_4_;
        fStack_714 = fVar267 + auVar329._12_4_;
        fStack_710 = fVar271 + auVar329._16_4_;
        fStack_70c = fVar334 + auVar329._20_4_;
        fStack_708 = fVar167 + auVar329._24_4_;
        fStack_704 = fVar142 + auVar329._28_4_;
        fVar233 = (float)local_880._0_4_ * fVar235 * -fVar174;
        fVar242 = (float)local_880._4_4_ * fVar251 * -fVar216;
        auVar41._4_4_ = fVar242;
        auVar41._0_4_ = fVar233;
        fVar256 = fStack_878 * fVar257 * -fVar289;
        auVar41._8_4_ = fVar256;
        fVar267 = fStack_874 * fVar268 * -fVar166;
        auVar41._12_4_ = fVar267;
        fVar271 = fStack_870 * fVar272 * -fVar168;
        auVar41._16_4_ = fVar271;
        fVar334 = fStack_86c * fVar318 * -fVar170;
        auVar41._20_4_ = fVar334;
        fVar167 = fStack_868 * fVar169 * -fVar172;
        auVar41._24_4_ = fVar167;
        auVar41._28_4_ = fVar283;
        local_660._4_4_ = auVar320._4_4_ + fVar242;
        local_660._0_4_ = auVar320._0_4_ + fVar233;
        fStack_658 = auVar320._8_4_ + fVar256;
        fStack_654 = auVar320._12_4_ + fVar267;
        fStack_650 = auVar320._16_4_ + fVar271;
        fStack_64c = auVar320._20_4_ + fVar334;
        fStack_648 = auVar320._24_4_ + fVar167;
        fStack_644 = fVar283 + 0.0;
        fVar233 = fVar235 * 0.0 * (float)local_880._0_4_;
        fVar235 = fVar251 * 0.0 * (float)local_880._4_4_;
        auVar42._4_4_ = fVar235;
        auVar42._0_4_ = fVar233;
        fVar242 = fVar257 * 0.0 * fStack_878;
        auVar42._8_4_ = fVar242;
        fVar251 = fVar268 * 0.0 * fStack_874;
        auVar42._12_4_ = fVar251;
        fVar256 = fVar272 * 0.0 * fStack_870;
        auVar42._16_4_ = fVar256;
        fVar257 = fVar318 * 0.0 * fStack_86c;
        auVar42._20_4_ = fVar257;
        fVar267 = fVar169 * 0.0 * fStack_868;
        auVar42._24_4_ = fVar267;
        auVar42._28_4_ = fVar355;
        auVar119._4_4_ = fStack_61c;
        auVar119._0_4_ = local_620;
        auVar119._8_4_ = fStack_618;
        auVar119._12_4_ = fStack_614;
        auVar119._16_4_ = fStack_610;
        auVar119._20_4_ = fStack_60c;
        auVar119._24_4_ = fStack_608;
        auVar119._28_4_ = fStack_604;
        auVar280._0_4_ = local_620 + fVar233;
        auVar280._4_4_ = fStack_61c + fVar235;
        auVar280._8_4_ = fStack_618 + fVar242;
        auVar280._12_4_ = fStack_614 + fVar251;
        auVar280._16_4_ = fStack_610 + fVar256;
        auVar280._20_4_ = fStack_60c + fVar257;
        auVar280._24_4_ = fStack_608 + fVar267;
        auVar280._28_4_ = fStack_604 + fVar355;
        fVar233 = auVar312._0_4_ * fVar240 * fVar241;
        fVar235 = auVar312._4_4_ * fVar253 * fVar255;
        auVar43._4_4_ = fVar235;
        auVar43._0_4_ = fVar233;
        fVar240 = auVar312._8_4_ * fVar258 * fVar259;
        auVar43._8_4_ = fVar240;
        fVar242 = auVar312._12_4_ * fVar269 * fVar270;
        auVar43._12_4_ = fVar242;
        fVar251 = auVar312._16_4_ * fVar317 * fVar239;
        auVar43._16_4_ = fVar251;
        fVar253 = auVar312._20_4_ * fVar162 * fVar164;
        auVar43._20_4_ = fVar253;
        fVar256 = auVar312._24_4_ * fVar171 * fVar173;
        auVar43._24_4_ = fVar256;
        auVar43._28_4_ = auVar26._28_4_;
        auVar30 = vsubps_avx(auVar329,auVar40);
        auVar330._0_4_ = (float)local_600._0_4_ + fVar233;
        auVar330._4_4_ = (float)local_600._4_4_ + fVar235;
        auVar330._8_4_ = fStack_5f8 + fVar240;
        auVar330._12_4_ = fStack_5f4 + fVar242;
        auVar330._16_4_ = fStack_5f0 + fVar251;
        auVar330._20_4_ = fStack_5ec + fVar253;
        auVar330._24_4_ = fStack_5e8 + fVar256;
        auVar330._28_4_ = fStack_5e4 + auVar26._28_4_;
        fVar233 = auVar312._0_4_ * fVar241 * -fVar197;
        fVar235 = auVar312._4_4_ * fVar255 * -fVar273;
        auVar44._4_4_ = fVar235;
        auVar44._0_4_ = fVar233;
        fVar240 = auVar312._8_4_ * fVar259 * -fVar288;
        auVar44._8_4_ = fVar240;
        fVar242 = auVar312._12_4_ * fVar270 * -fVar237;
        auVar44._12_4_ = fVar242;
        fVar251 = auVar312._16_4_ * fVar239 * -fVar175;
        auVar44._16_4_ = fVar251;
        fVar253 = auVar312._20_4_ * fVar164 * -fVar198;
        auVar44._20_4_ = fVar253;
        fVar256 = auVar312._24_4_ * fVar173 * -fVar274;
        auVar44._24_4_ = fVar256;
        auVar44._28_4_ = fVar364;
        auVar31 = vsubps_avx(auVar320,auVar41);
        auVar337._0_4_ = fVar233 + (float)local_520._0_4_;
        auVar337._4_4_ = fVar235 + (float)local_520._4_4_;
        auVar337._8_4_ = fVar240 + fStack_518;
        auVar337._12_4_ = fVar242 + fStack_514;
        auVar337._16_4_ = fVar251 + fStack_510;
        auVar337._20_4_ = fVar253 + fStack_50c;
        auVar337._24_4_ = fVar256 + fStack_508;
        auVar337._28_4_ = fVar364 + fStack_504;
        fVar233 = fVar241 * 0.0 * auVar312._0_4_;
        fVar235 = fVar255 * 0.0 * auVar312._4_4_;
        auVar45._4_4_ = fVar235;
        auVar45._0_4_ = fVar233;
        fVar240 = fVar259 * 0.0 * auVar312._8_4_;
        auVar45._8_4_ = fVar240;
        fVar241 = fVar270 * 0.0 * auVar312._12_4_;
        auVar45._12_4_ = fVar241;
        fVar242 = fVar239 * 0.0 * auVar312._16_4_;
        auVar45._16_4_ = fVar242;
        fVar251 = fVar164 * 0.0 * auVar312._20_4_;
        auVar45._20_4_ = fVar251;
        fVar253 = fVar173 * 0.0 * auVar312._24_4_;
        auVar45._24_4_ = fVar253;
        auVar45._28_4_ = fVar283;
        auVar25 = vsubps_avx(auVar119,auVar42);
        auVar366._0_4_ = (float)local_3a0._0_4_ + fVar233;
        auVar366._4_4_ = (float)local_3a0._4_4_ + fVar235;
        auVar366._8_4_ = fStack_398 + fVar240;
        auVar366._12_4_ = fStack_394 + fVar241;
        auVar366._16_4_ = fStack_390 + fVar242;
        auVar366._20_4_ = fStack_38c + fVar251;
        auVar366._24_4_ = fStack_388 + fVar253;
        auVar366._28_4_ = fStack_384 + fVar283;
        auVar158 = vsubps_avx(_local_600,auVar43);
        auVar26 = vsubps_avx(_local_520,auVar44);
        auVar313 = vsubps_avx(_local_3a0,auVar45);
        auVar152 = vsubps_avx(auVar337,auVar31);
        auVar28 = vsubps_avx(auVar366,auVar25);
        auVar46._4_4_ = auVar25._4_4_ * auVar152._4_4_;
        auVar46._0_4_ = auVar25._0_4_ * auVar152._0_4_;
        auVar46._8_4_ = auVar25._8_4_ * auVar152._8_4_;
        auVar46._12_4_ = auVar25._12_4_ * auVar152._12_4_;
        auVar46._16_4_ = auVar25._16_4_ * auVar152._16_4_;
        auVar46._20_4_ = auVar25._20_4_ * auVar152._20_4_;
        auVar46._24_4_ = auVar25._24_4_ * auVar152._24_4_;
        auVar46._28_4_ = fVar364;
        auVar47._4_4_ = auVar31._4_4_ * auVar28._4_4_;
        auVar47._0_4_ = auVar31._0_4_ * auVar28._0_4_;
        auVar47._8_4_ = auVar31._8_4_ * auVar28._8_4_;
        auVar47._12_4_ = auVar31._12_4_ * auVar28._12_4_;
        auVar47._16_4_ = auVar31._16_4_ * auVar28._16_4_;
        auVar47._20_4_ = auVar31._20_4_ * auVar28._20_4_;
        auVar47._24_4_ = auVar31._24_4_ * auVar28._24_4_;
        auVar47._28_4_ = fStack_504;
        auVar29 = vsubps_avx(auVar47,auVar46);
        auVar48._4_4_ = auVar30._4_4_ * auVar28._4_4_;
        auVar48._0_4_ = auVar30._0_4_ * auVar28._0_4_;
        auVar48._8_4_ = auVar30._8_4_ * auVar28._8_4_;
        auVar48._12_4_ = auVar30._12_4_ * auVar28._12_4_;
        auVar48._16_4_ = auVar30._16_4_ * auVar28._16_4_;
        auVar48._20_4_ = auVar30._20_4_ * auVar28._20_4_;
        auVar48._24_4_ = auVar30._24_4_ * auVar28._24_4_;
        auVar48._28_4_ = auVar28._28_4_;
        auVar146 = vsubps_avx(auVar330,auVar30);
        auVar49._4_4_ = auVar25._4_4_ * auVar146._4_4_;
        auVar49._0_4_ = auVar25._0_4_ * auVar146._0_4_;
        auVar49._8_4_ = auVar25._8_4_ * auVar146._8_4_;
        auVar49._12_4_ = auVar25._12_4_ * auVar146._12_4_;
        auVar49._16_4_ = auVar25._16_4_ * auVar146._16_4_;
        auVar49._20_4_ = auVar25._20_4_ * auVar146._20_4_;
        auVar49._24_4_ = auVar25._24_4_ * auVar146._24_4_;
        auVar49._28_4_ = fStack_5e4;
        auVar147 = vsubps_avx(auVar49,auVar48);
        auVar50._4_4_ = auVar146._4_4_ * auVar31._4_4_;
        auVar50._0_4_ = auVar146._0_4_ * auVar31._0_4_;
        auVar50._8_4_ = auVar146._8_4_ * auVar31._8_4_;
        auVar50._12_4_ = auVar146._12_4_ * auVar31._12_4_;
        auVar50._16_4_ = auVar146._16_4_ * auVar31._16_4_;
        auVar50._20_4_ = auVar146._20_4_ * auVar31._20_4_;
        auVar50._24_4_ = auVar146._24_4_ * auVar31._24_4_;
        auVar50._28_4_ = auVar28._28_4_;
        auVar51._4_4_ = auVar30._4_4_ * auVar152._4_4_;
        auVar51._0_4_ = auVar30._0_4_ * auVar152._0_4_;
        auVar51._8_4_ = auVar30._8_4_ * auVar152._8_4_;
        auVar51._12_4_ = auVar30._12_4_ * auVar152._12_4_;
        auVar51._16_4_ = auVar30._16_4_ * auVar152._16_4_;
        auVar51._20_4_ = auVar30._20_4_ * auVar152._20_4_;
        auVar51._24_4_ = auVar30._24_4_ * auVar152._24_4_;
        auVar51._28_4_ = auVar152._28_4_;
        auVar152 = vsubps_avx(auVar51,auVar50);
        auVar150._0_4_ = auVar29._0_4_ * 0.0 + auVar152._0_4_ + auVar147._0_4_ * 0.0;
        auVar150._4_4_ = auVar29._4_4_ * 0.0 + auVar152._4_4_ + auVar147._4_4_ * 0.0;
        auVar150._8_4_ = auVar29._8_4_ * 0.0 + auVar152._8_4_ + auVar147._8_4_ * 0.0;
        auVar150._12_4_ = auVar29._12_4_ * 0.0 + auVar152._12_4_ + auVar147._12_4_ * 0.0;
        auVar150._16_4_ = auVar29._16_4_ * 0.0 + auVar152._16_4_ + auVar147._16_4_ * 0.0;
        auVar150._20_4_ = auVar29._20_4_ * 0.0 + auVar152._20_4_ + auVar147._20_4_ * 0.0;
        auVar150._24_4_ = auVar29._24_4_ * 0.0 + auVar152._24_4_ + auVar147._24_4_ * 0.0;
        auVar150._28_4_ = auVar152._28_4_ + auVar152._28_4_ + auVar147._28_4_;
        auVar146 = vcmpps_avx(auVar150,ZEXT432(0) << 0x20,2);
        auVar158 = vblendvps_avx(auVar158,_local_720,auVar146);
        auVar26 = vblendvps_avx(auVar26,_local_660,auVar146);
        auVar313 = vblendvps_avx(auVar313,auVar280,auVar146);
        auVar152 = vblendvps_avx(auVar30,auVar330,auVar146);
        auVar28 = vblendvps_avx(auVar31,auVar337,auVar146);
        auVar29 = vblendvps_avx(auVar25,auVar366,auVar146);
        auVar30 = vblendvps_avx(auVar330,auVar30,auVar146);
        auVar31 = vblendvps_avx(auVar337,auVar31,auVar146);
        auVar222 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
        auVar25 = vblendvps_avx(auVar366,auVar25,auVar146);
        auVar30 = vsubps_avx(auVar30,auVar158);
        auVar147 = vsubps_avx(auVar31,auVar26);
        auVar25 = vsubps_avx(auVar25,auVar313);
        auVar183 = vsubps_avx(auVar26,auVar28);
        fVar233 = auVar147._0_4_;
        fVar172 = auVar313._0_4_;
        fVar251 = auVar147._4_4_;
        fVar197 = auVar313._4_4_;
        auVar52._4_4_ = fVar197 * fVar251;
        auVar52._0_4_ = fVar172 * fVar233;
        fVar258 = auVar147._8_4_;
        fVar273 = auVar313._8_4_;
        auVar52._8_4_ = fVar273 * fVar258;
        fVar270 = auVar147._12_4_;
        fVar288 = auVar313._12_4_;
        auVar52._12_4_ = fVar288 * fVar270;
        fVar334 = auVar147._16_4_;
        fVar237 = auVar313._16_4_;
        auVar52._16_4_ = fVar237 * fVar334;
        fVar169 = auVar147._20_4_;
        fVar175 = auVar313._20_4_;
        auVar52._20_4_ = fVar175 * fVar169;
        fVar216 = auVar147._24_4_;
        fVar198 = auVar313._24_4_;
        auVar52._24_4_ = fVar198 * fVar216;
        auVar52._28_4_ = auVar31._28_4_;
        fVar235 = auVar26._0_4_;
        fVar290 = auVar25._0_4_;
        fVar253 = auVar26._4_4_;
        fVar324 = auVar25._4_4_;
        auVar53._4_4_ = fVar324 * fVar253;
        auVar53._0_4_ = fVar290 * fVar235;
        fVar259 = auVar26._8_4_;
        fVar325 = auVar25._8_4_;
        auVar53._8_4_ = fVar325 * fVar259;
        fVar271 = auVar26._12_4_;
        fVar326 = auVar25._12_4_;
        auVar53._12_4_ = fVar326 * fVar271;
        fVar318 = auVar26._16_4_;
        fVar327 = auVar25._16_4_;
        auVar53._16_4_ = fVar327 * fVar318;
        fVar171 = auVar26._20_4_;
        fVar141 = auVar25._20_4_;
        auVar53._20_4_ = fVar141 * fVar171;
        fVar289 = auVar26._24_4_;
        fVar161 = auVar25._24_4_;
        auVar53._24_4_ = fVar161 * fVar289;
        auVar53._28_4_ = auVar337._28_4_;
        auVar31 = vsubps_avx(auVar53,auVar52);
        fVar240 = auVar158._0_4_;
        fVar255 = auVar158._4_4_;
        auVar54._4_4_ = fVar324 * fVar255;
        auVar54._0_4_ = fVar290 * fVar240;
        fVar267 = auVar158._8_4_;
        auVar54._8_4_ = fVar325 * fVar267;
        fVar272 = auVar158._12_4_;
        auVar54._12_4_ = fVar326 * fVar272;
        fVar162 = auVar158._16_4_;
        auVar54._16_4_ = fVar327 * fVar162;
        fVar173 = auVar158._20_4_;
        auVar54._20_4_ = fVar141 * fVar173;
        fVar166 = auVar158._24_4_;
        auVar54._24_4_ = fVar161 * fVar166;
        auVar54._28_4_ = auVar337._28_4_;
        fVar241 = auVar30._0_4_;
        auVar360._0_4_ = fVar172 * fVar241;
        fVar256 = auVar30._4_4_;
        auVar360._4_4_ = fVar197 * fVar256;
        fVar268 = auVar30._8_4_;
        auVar360._8_4_ = fVar273 * fVar268;
        fVar317 = auVar30._12_4_;
        auVar360._12_4_ = fVar288 * fVar317;
        fVar164 = auVar30._16_4_;
        auVar360._16_4_ = fVar237 * fVar164;
        fVar142 = auVar30._20_4_;
        auVar360._20_4_ = fVar175 * fVar142;
        fVar168 = auVar30._24_4_;
        auVar360._24_4_ = fVar198 * fVar168;
        auVar360._28_4_ = 0;
        auVar184 = vsubps_avx(auVar360,auVar54);
        auVar55._4_4_ = fVar253 * fVar256;
        auVar55._0_4_ = fVar235 * fVar241;
        auVar55._8_4_ = fVar259 * fVar268;
        auVar55._12_4_ = fVar271 * fVar317;
        auVar55._16_4_ = fVar318 * fVar164;
        auVar55._20_4_ = fVar171 * fVar142;
        auVar55._24_4_ = fVar289 * fVar168;
        auVar55._28_4_ = auVar337._28_4_;
        auVar56._4_4_ = fVar255 * fVar251;
        auVar56._0_4_ = fVar240 * fVar233;
        auVar56._8_4_ = fVar267 * fVar258;
        auVar56._12_4_ = fVar272 * fVar270;
        auVar56._16_4_ = fVar162 * fVar334;
        auVar56._20_4_ = fVar173 * fVar169;
        auVar56._24_4_ = fVar166 * fVar216;
        auVar56._28_4_ = auVar366._28_4_;
        auVar185 = vsubps_avx(auVar56,auVar55);
        auVar186 = vsubps_avx(auVar313,auVar29);
        fVar242 = auVar185._28_4_ + auVar184._28_4_;
        auVar188._0_4_ = auVar185._0_4_ + auVar184._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
        auVar188._4_4_ = auVar185._4_4_ + auVar184._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
        auVar188._8_4_ = auVar185._8_4_ + auVar184._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
        auVar188._12_4_ = auVar185._12_4_ + auVar184._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
        auVar188._16_4_ = auVar185._16_4_ + auVar184._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
        auVar188._20_4_ = auVar185._20_4_ + auVar184._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
        auVar188._24_4_ = auVar185._24_4_ + auVar184._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
        auVar188._28_4_ = fVar242 + auVar31._28_4_;
        fVar274 = auVar183._0_4_;
        fVar283 = auVar183._4_4_;
        auVar57._4_4_ = fVar283 * auVar29._4_4_;
        auVar57._0_4_ = fVar274 * auVar29._0_4_;
        fVar284 = auVar183._8_4_;
        auVar57._8_4_ = fVar284 * auVar29._8_4_;
        fVar285 = auVar183._12_4_;
        auVar57._12_4_ = fVar285 * auVar29._12_4_;
        fVar286 = auVar183._16_4_;
        auVar57._16_4_ = fVar286 * auVar29._16_4_;
        fVar215 = auVar183._20_4_;
        auVar57._20_4_ = fVar215 * auVar29._20_4_;
        fVar287 = auVar183._24_4_;
        auVar57._24_4_ = fVar287 * auVar29._24_4_;
        auVar57._28_4_ = fVar242;
        fVar242 = auVar186._0_4_;
        fVar257 = auVar186._4_4_;
        auVar58._4_4_ = auVar28._4_4_ * fVar257;
        auVar58._0_4_ = auVar28._0_4_ * fVar242;
        fVar269 = auVar186._8_4_;
        auVar58._8_4_ = auVar28._8_4_ * fVar269;
        fVar239 = auVar186._12_4_;
        auVar58._12_4_ = auVar28._12_4_ * fVar239;
        fVar167 = auVar186._16_4_;
        auVar58._16_4_ = auVar28._16_4_ * fVar167;
        fVar174 = auVar186._20_4_;
        auVar58._20_4_ = auVar28._20_4_ * fVar174;
        fVar170 = auVar186._24_4_;
        auVar58._24_4_ = auVar28._24_4_ * fVar170;
        auVar58._28_4_ = auVar185._28_4_;
        auVar183 = vsubps_avx(auVar58,auVar57);
        auVar184 = vsubps_avx(auVar158,auVar152);
        fVar163 = auVar184._0_4_;
        fVar165 = auVar184._4_4_;
        auVar59._4_4_ = fVar165 * auVar29._4_4_;
        auVar59._0_4_ = fVar163 * auVar29._0_4_;
        fVar176 = auVar184._8_4_;
        auVar59._8_4_ = fVar176 * auVar29._8_4_;
        fVar194 = auVar184._12_4_;
        auVar59._12_4_ = fVar194 * auVar29._12_4_;
        fVar195 = auVar184._16_4_;
        auVar59._16_4_ = fVar195 * auVar29._16_4_;
        fVar196 = auVar184._20_4_;
        auVar59._20_4_ = fVar196 * auVar29._20_4_;
        fVar218 = auVar184._24_4_;
        auVar59._24_4_ = fVar218 * auVar29._24_4_;
        auVar59._28_4_ = auVar29._28_4_;
        auVar60._4_4_ = auVar152._4_4_ * fVar257;
        auVar60._0_4_ = auVar152._0_4_ * fVar242;
        auVar60._8_4_ = auVar152._8_4_ * fVar269;
        auVar60._12_4_ = auVar152._12_4_ * fVar239;
        auVar60._16_4_ = auVar152._16_4_ * fVar167;
        auVar60._20_4_ = auVar152._20_4_ * fVar174;
        auVar60._24_4_ = auVar152._24_4_ * fVar170;
        auVar60._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar59,auVar60);
        auVar61._4_4_ = auVar28._4_4_ * fVar165;
        auVar61._0_4_ = auVar28._0_4_ * fVar163;
        auVar61._8_4_ = auVar28._8_4_ * fVar176;
        auVar61._12_4_ = auVar28._12_4_ * fVar194;
        auVar61._16_4_ = auVar28._16_4_ * fVar195;
        auVar61._20_4_ = auVar28._20_4_ * fVar196;
        auVar61._24_4_ = auVar28._24_4_ * fVar218;
        auVar61._28_4_ = auVar29._28_4_;
        auVar62._4_4_ = auVar152._4_4_ * fVar283;
        auVar62._0_4_ = auVar152._0_4_ * fVar274;
        auVar62._8_4_ = auVar152._8_4_ * fVar284;
        auVar62._12_4_ = auVar152._12_4_ * fVar285;
        auVar62._16_4_ = auVar152._16_4_ * fVar286;
        auVar62._20_4_ = auVar152._20_4_ * fVar215;
        auVar62._24_4_ = auVar152._24_4_ * fVar287;
        auVar62._28_4_ = auVar152._28_4_;
        auVar152 = vsubps_avx(auVar62,auVar61);
        auVar160 = ZEXT864(0) << 0x20;
        auVar247._0_4_ = auVar183._0_4_ * 0.0 + auVar152._0_4_ + auVar31._0_4_ * 0.0;
        auVar247._4_4_ = auVar183._4_4_ * 0.0 + auVar152._4_4_ + auVar31._4_4_ * 0.0;
        auVar247._8_4_ = auVar183._8_4_ * 0.0 + auVar152._8_4_ + auVar31._8_4_ * 0.0;
        auVar247._12_4_ = auVar183._12_4_ * 0.0 + auVar152._12_4_ + auVar31._12_4_ * 0.0;
        auVar247._16_4_ = auVar183._16_4_ * 0.0 + auVar152._16_4_ + auVar31._16_4_ * 0.0;
        auVar247._20_4_ = auVar183._20_4_ * 0.0 + auVar152._20_4_ + auVar31._20_4_ * 0.0;
        auVar247._24_4_ = auVar183._24_4_ * 0.0 + auVar152._24_4_ + auVar31._24_4_ * 0.0;
        auVar247._28_4_ = auVar152._28_4_ + auVar152._28_4_ + auVar31._28_4_;
        auVar152 = vmaxps_avx(auVar188,auVar247);
        auVar152 = vcmpps_avx(auVar152,ZEXT832(0) << 0x20,2);
        auVar204 = vpackssdw_avx(auVar152._0_16_,auVar152._16_16_);
        auVar222 = vpand_avx(auVar204,auVar222);
        auVar204 = vpmovsxwd_avx(auVar222);
        auVar221 = vpunpckhwd_avx(auVar222,auVar222);
        auVar227._16_16_ = auVar221;
        auVar227._0_16_ = auVar204;
        if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar227 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar227 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar227 >> 0x7f,0) == '\0') &&
              (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar221 >> 0x3f,0) == '\0') &&
            (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar221[0xf]) {
LAB_01057df3:
          auVar303 = ZEXT3264(local_580);
          auVar230 = ZEXT3264(auVar227);
          auVar250 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                        CONCAT816(local_5c0[1]._16_8_,
                                                  CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_))))
          ;
        }
        else {
          auVar63._4_4_ = fVar257 * fVar251;
          auVar63._0_4_ = fVar242 * fVar233;
          auVar63._8_4_ = fVar269 * fVar258;
          auVar63._12_4_ = fVar239 * fVar270;
          auVar63._16_4_ = fVar167 * fVar334;
          auVar63._20_4_ = fVar174 * fVar169;
          auVar63._24_4_ = fVar170 * fVar216;
          auVar63._28_4_ = auVar221._12_4_;
          auVar340._0_4_ = fVar274 * fVar290;
          auVar340._4_4_ = fVar283 * fVar324;
          auVar340._8_4_ = fVar284 * fVar325;
          auVar340._12_4_ = fVar285 * fVar326;
          auVar340._16_4_ = fVar286 * fVar327;
          auVar340._20_4_ = fVar215 * fVar141;
          auVar340._24_4_ = fVar287 * fVar161;
          auVar340._28_4_ = 0;
          auVar152 = vsubps_avx(auVar340,auVar63);
          auVar64._4_4_ = fVar165 * fVar324;
          auVar64._0_4_ = fVar163 * fVar290;
          auVar64._8_4_ = fVar176 * fVar325;
          auVar64._12_4_ = fVar194 * fVar326;
          auVar64._16_4_ = fVar195 * fVar327;
          auVar64._20_4_ = fVar196 * fVar141;
          auVar64._24_4_ = fVar218 * fVar161;
          auVar64._28_4_ = auVar25._28_4_;
          auVar65._4_4_ = fVar257 * fVar256;
          auVar65._0_4_ = fVar242 * fVar241;
          auVar65._8_4_ = fVar269 * fVar268;
          auVar65._12_4_ = fVar239 * fVar317;
          auVar65._16_4_ = fVar167 * fVar164;
          auVar65._20_4_ = fVar174 * fVar142;
          auVar65._24_4_ = fVar170 * fVar168;
          auVar65._28_4_ = auVar186._28_4_;
          auVar29 = vsubps_avx(auVar65,auVar64);
          auVar66._4_4_ = fVar283 * fVar256;
          auVar66._0_4_ = fVar274 * fVar241;
          auVar66._8_4_ = fVar284 * fVar268;
          auVar66._12_4_ = fVar285 * fVar317;
          auVar66._16_4_ = fVar286 * fVar164;
          auVar66._20_4_ = fVar215 * fVar142;
          auVar66._24_4_ = fVar287 * fVar168;
          auVar66._28_4_ = auVar188._28_4_;
          auVar67._4_4_ = fVar165 * fVar251;
          auVar67._0_4_ = fVar163 * fVar233;
          auVar67._8_4_ = fVar176 * fVar258;
          auVar67._12_4_ = fVar194 * fVar270;
          auVar67._16_4_ = fVar195 * fVar334;
          auVar67._20_4_ = fVar196 * fVar169;
          auVar67._24_4_ = fVar218 * fVar216;
          auVar67._28_4_ = auVar147._28_4_;
          auVar31 = vsubps_avx(auVar67,auVar66);
          auVar301._0_4_ = auVar152._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
          auVar301._4_4_ = auVar152._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
          auVar301._8_4_ = auVar152._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
          auVar301._12_4_ = auVar152._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
          auVar301._16_4_ = auVar152._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
          auVar301._20_4_ = auVar152._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
          auVar301._24_4_ = auVar152._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
          auVar301._28_4_ = auVar147._28_4_ + auVar31._28_4_ + auVar188._28_4_;
          auVar28 = vrcpps_avx(auVar301);
          fVar233 = auVar28._0_4_;
          fVar241 = auVar28._4_4_;
          auVar68._4_4_ = auVar301._4_4_ * fVar241;
          auVar68._0_4_ = auVar301._0_4_ * fVar233;
          fVar242 = auVar28._8_4_;
          auVar68._8_4_ = auVar301._8_4_ * fVar242;
          fVar251 = auVar28._12_4_;
          auVar68._12_4_ = auVar301._12_4_ * fVar251;
          fVar256 = auVar28._16_4_;
          auVar68._16_4_ = auVar301._16_4_ * fVar256;
          fVar257 = auVar28._20_4_;
          auVar68._20_4_ = auVar301._20_4_ * fVar257;
          fVar258 = auVar28._24_4_;
          auVar68._24_4_ = auVar301._24_4_ * fVar258;
          auVar68._28_4_ = auVar186._28_4_;
          auVar341._8_4_ = 0x3f800000;
          auVar341._0_8_ = 0x3f8000003f800000;
          auVar341._12_4_ = 0x3f800000;
          auVar341._16_4_ = 0x3f800000;
          auVar341._20_4_ = 0x3f800000;
          auVar341._24_4_ = 0x3f800000;
          auVar341._28_4_ = 0x3f800000;
          auVar25 = vsubps_avx(auVar341,auVar68);
          fVar233 = auVar25._0_4_ * fVar233 + fVar233;
          fVar241 = auVar25._4_4_ * fVar241 + fVar241;
          fVar242 = auVar25._8_4_ * fVar242 + fVar242;
          fVar251 = auVar25._12_4_ * fVar251 + fVar251;
          fVar256 = auVar25._16_4_ * fVar256 + fVar256;
          fVar257 = auVar25._20_4_ * fVar257 + fVar257;
          fVar258 = auVar25._24_4_ * fVar258 + fVar258;
          auVar69._4_4_ =
               (auVar152._4_4_ * fVar255 + auVar29._4_4_ * fVar253 + auVar31._4_4_ * fVar197) *
               fVar241;
          auVar69._0_4_ =
               (auVar152._0_4_ * fVar240 + auVar29._0_4_ * fVar235 + auVar31._0_4_ * fVar172) *
               fVar233;
          auVar69._8_4_ =
               (auVar152._8_4_ * fVar267 + auVar29._8_4_ * fVar259 + auVar31._8_4_ * fVar273) *
               fVar242;
          auVar69._12_4_ =
               (auVar152._12_4_ * fVar272 + auVar29._12_4_ * fVar271 + auVar31._12_4_ * fVar288) *
               fVar251;
          auVar69._16_4_ =
               (auVar152._16_4_ * fVar162 + auVar29._16_4_ * fVar318 + auVar31._16_4_ * fVar237) *
               fVar256;
          auVar69._20_4_ =
               (auVar152._20_4_ * fVar173 + auVar29._20_4_ * fVar171 + auVar31._20_4_ * fVar175) *
               fVar257;
          auVar69._24_4_ =
               (auVar152._24_4_ * fVar166 + auVar29._24_4_ * fVar289 + auVar31._24_4_ * fVar198) *
               fVar258;
          auVar69._28_4_ = auVar30._28_4_ + auVar313._28_4_;
          auVar204 = vpermilps_avx(ZEXT416(uVar136),0);
          auVar151._16_16_ = auVar204;
          auVar151._0_16_ = auVar204;
          auVar313 = vcmpps_avx(auVar151,auVar69,2);
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar228._4_4_ = uVar9;
          auVar228._0_4_ = uVar9;
          auVar228._8_4_ = uVar9;
          auVar228._12_4_ = uVar9;
          auVar228._16_4_ = uVar9;
          auVar228._20_4_ = uVar9;
          auVar228._24_4_ = uVar9;
          auVar228._28_4_ = uVar9;
          auVar152 = vcmpps_avx(auVar69,auVar228,2);
          auVar313 = vandps_avx(auVar152,auVar313);
          auVar204 = vpackssdw_avx(auVar313._0_16_,auVar313._16_16_);
          auVar222 = vpand_avx(auVar222,auVar204);
          auVar204 = vpmovsxwd_avx(auVar222);
          auVar221 = vpshufd_avx(auVar222,0xee);
          auVar221 = vpmovsxwd_avx(auVar221);
          auVar227._16_16_ = auVar221;
          auVar227._0_16_ = auVar204;
          auVar303 = ZEXT3264(local_580);
          if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar227 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar227 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar227 >> 0x7f,0) == '\0') &&
                (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar221 >> 0x3f,0) == '\0') &&
              (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar221[0xf]) goto LAB_01057df3;
          auVar313 = vcmpps_avx(ZEXT832(0) << 0x20,auVar301,4);
          auVar204 = vpackssdw_avx(auVar313._0_16_,auVar313._16_16_);
          auVar222 = vpand_avx(auVar222,auVar204);
          auVar204 = vpmovsxwd_avx(auVar222);
          auVar230 = ZEXT1664(auVar204);
          auVar222 = vpunpckhwd_avx(auVar222,auVar222);
          auVar281._16_16_ = auVar222;
          auVar281._0_16_ = auVar204;
          auVar250 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                        CONCAT816(local_5c0[1]._16_8_,
                                                  CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_))))
          ;
          if ((((((((auVar281 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar281 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar281 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar281 >> 0x7f,0) != '\0') ||
                (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar222 >> 0x3f,0) != '\0') ||
              (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar222[0xf] < '\0') {
            auVar70._4_4_ = auVar188._4_4_ * fVar241;
            auVar70._0_4_ = auVar188._0_4_ * fVar233;
            auVar70._8_4_ = auVar188._8_4_ * fVar242;
            auVar70._12_4_ = auVar188._12_4_ * fVar251;
            auVar70._16_4_ = auVar188._16_4_ * fVar256;
            auVar70._20_4_ = auVar188._20_4_ * fVar257;
            auVar70._24_4_ = auVar188._24_4_ * fVar258;
            auVar70._28_4_ = SUB84(local_5c0[1]._24_8_,4);
            auVar71._4_4_ = auVar247._4_4_ * fVar241;
            auVar71._0_4_ = auVar247._0_4_ * fVar233;
            auVar71._8_4_ = auVar247._8_4_ * fVar242;
            auVar71._12_4_ = auVar247._12_4_ * fVar251;
            auVar71._16_4_ = auVar247._16_4_ * fVar256;
            auVar71._20_4_ = auVar247._20_4_ * fVar257;
            auVar71._24_4_ = auVar247._24_4_ * fVar258;
            auVar71._28_4_ = auVar25._28_4_ + auVar28._28_4_;
            auVar248._8_4_ = 0x3f800000;
            auVar248._0_8_ = 0x3f8000003f800000;
            auVar248._12_4_ = 0x3f800000;
            auVar248._16_4_ = 0x3f800000;
            auVar248._20_4_ = 0x3f800000;
            auVar248._24_4_ = 0x3f800000;
            auVar248._28_4_ = 0x3f800000;
            auVar313 = vsubps_avx(auVar248,auVar70);
            auVar230 = ZEXT3264(auVar313);
            auVar313 = vblendvps_avx(auVar313,auVar70,auVar146);
            auVar303 = ZEXT3264(auVar313);
            auVar313 = vsubps_avx(auVar248,auVar71);
            _local_3c0 = vblendvps_avx(auVar313,auVar71,auVar146);
            auVar250 = ZEXT3264(auVar281);
            local_500 = auVar69;
          }
        }
        auVar333 = ZEXT3264(_local_760);
        auVar313 = auVar303._0_32_;
        auVar152 = auVar250._0_32_;
        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar152 >> 0x7f,0) != '\0') ||
              (auVar250 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar152 >> 0xbf,0) != '\0') ||
            (auVar250 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar250[0x1f] < '\0') {
          auVar28 = vsubps_avx(auVar312,_local_880);
          local_880._0_4_ = (float)local_880._0_4_ + auVar303._0_4_ * auVar28._0_4_;
          local_880._4_4_ = (float)local_880._4_4_ + auVar303._4_4_ * auVar28._4_4_;
          fStack_878 = fStack_878 + auVar303._8_4_ * auVar28._8_4_;
          fStack_874 = fStack_874 + auVar303._12_4_ * auVar28._12_4_;
          fStack_870 = fStack_870 + auVar303._16_4_ * auVar28._16_4_;
          fStack_86c = fStack_86c + auVar303._20_4_ * auVar28._20_4_;
          fStack_868 = fStack_868 + auVar303._24_4_ * auVar28._24_4_;
          fStack_864 = fStack_864 + auVar28._28_4_;
          fVar233 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar72._4_4_ = ((float)local_880._4_4_ + (float)local_880._4_4_) * fVar233;
          auVar72._0_4_ = ((float)local_880._0_4_ + (float)local_880._0_4_) * fVar233;
          auVar72._8_4_ = (fStack_878 + fStack_878) * fVar233;
          auVar72._12_4_ = (fStack_874 + fStack_874) * fVar233;
          auVar72._16_4_ = (fStack_870 + fStack_870) * fVar233;
          auVar72._20_4_ = (fStack_86c + fStack_86c) * fVar233;
          auVar72._24_4_ = (fStack_868 + fStack_868) * fVar233;
          auVar72._28_4_ = fStack_864 + fStack_864;
          auVar28 = vcmpps_avx(local_500,auVar72,6);
          auVar29 = auVar152 & auVar28;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            auVar230 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_3c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            local_3c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            uStack_3b8._0_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            uStack_3b8._4_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            uStack_3b0._0_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            uStack_3b0._4_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            uStack_3a8._0_4_ = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            uStack_3a8._4_4_ = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            local_300 = auVar313;
            auVar130 = _local_3c0;
            auVar29 = _local_3c0;
            local_2e0 = (float)local_3c0._0_4_;
            fStack_2dc = (float)local_3c0._4_4_;
            fStack_2d8 = (float)uStack_3b8;
            fStack_2d4 = uStack_3b8._4_4_;
            fStack_2d0 = (float)uStack_3b0;
            fStack_2cc = uStack_3b0._4_4_;
            fStack_2c8 = (float)uStack_3a8;
            fStack_2c4 = uStack_3a8._4_4_;
            local_2c0 = local_500;
            local_2a0 = 0;
            local_29c = uVar21;
            local_290 = local_7e0;
            uStack_288 = uStack_7d8;
            uStack_7f8 = auVar358._8_8_;
            local_280 = auVar358._0_8_;
            uStack_278 = uStack_7f8;
            local_270 = local_810;
            uStack_268 = uStack_808;
            local_260 = local_7f0;
            uStack_258 = uStack_7e8;
            auVar250 = ZEXT3264(_local_780);
            _local_3c0 = auVar29;
            if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5c0[0] = vandps_avx(auVar28,auVar152);
              auVar201._0_4_ = 1.0 / (float)(int)uVar21;
              auVar201._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar222 = vshufps_avx(auVar201,auVar201,0);
              local_220[0] = auVar222._0_4_ * (auVar303._0_4_ + 0.0);
              local_220[1] = auVar222._4_4_ * (auVar303._4_4_ + 1.0);
              local_220[2] = auVar222._8_4_ * (auVar303._8_4_ + 2.0);
              local_220[3] = auVar222._12_4_ * (auVar303._12_4_ + 3.0);
              fStack_210 = auVar222._0_4_ * (auVar303._16_4_ + 4.0);
              fStack_20c = auVar222._4_4_ * (auVar303._20_4_ + 5.0);
              fStack_208 = auVar222._8_4_ * (auVar303._24_4_ + 6.0);
              fStack_204 = auVar303._28_4_ + 7.0;
              uStack_3b0 = auVar130._16_8_;
              uStack_3a8 = auVar29._24_8_;
              local_200 = local_3c0;
              uStack_1f8 = uStack_3b8;
              uStack_1f0 = uStack_3b0;
              uStack_1e8 = uStack_3a8;
              local_1e0 = local_500;
              auVar189._8_4_ = 0x7f800000;
              auVar189._0_8_ = 0x7f8000007f800000;
              auVar189._12_4_ = 0x7f800000;
              auVar189._16_4_ = 0x7f800000;
              auVar189._20_4_ = 0x7f800000;
              auVar189._24_4_ = 0x7f800000;
              auVar189._28_4_ = 0x7f800000;
              auVar152 = vblendvps_avx(auVar189,local_500,local_5c0[0]);
              auVar28 = vshufps_avx(auVar152,auVar152,0xb1);
              auVar28 = vminps_avx(auVar152,auVar28);
              auVar29 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar29 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar28 = vcmpps_avx(auVar152,auVar28,0);
              auVar29 = local_5c0[0] & auVar28;
              auVar152 = local_5c0[0];
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar152 = vandps_avx(auVar28,local_5c0[0]);
              }
              uVar132 = vmovmskps_avx(auVar152);
              uVar133 = 0;
              if (uVar132 != 0) {
                for (; (uVar132 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
                }
              }
              uVar134 = (ulong)uVar133;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar233 = local_220[uVar134];
                uVar9 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                fVar240 = 1.0 - fVar233;
                fVar235 = fVar233 * fVar240 + fVar233 * fVar240;
                auVar222 = ZEXT416((uint)(fVar233 * fVar233 * 3.0));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar204 = ZEXT416((uint)((fVar235 - fVar233 * fVar233) * 3.0));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar221 = ZEXT416((uint)((fVar240 * fVar240 - fVar235) * 3.0));
                auVar221 = vshufps_avx(auVar221,auVar221,0);
                auVar250 = ZEXT3264(_local_780);
                auVar207 = ZEXT416((uint)(fVar240 * fVar240 * -3.0));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                auVar202._0_4_ =
                     auVar207._0_4_ * local_7e0._0_4_ +
                     auVar221._0_4_ * fVar356 +
                     auVar222._0_4_ * (float)local_7f0._0_4_ +
                     auVar204._0_4_ * (float)local_810._0_4_;
                auVar202._4_4_ =
                     auVar207._4_4_ * local_7e0._4_4_ +
                     auVar221._4_4_ * fVar361 +
                     auVar222._4_4_ * (float)local_7f0._4_4_ +
                     auVar204._4_4_ * (float)local_810._4_4_;
                auVar202._8_4_ =
                     auVar207._8_4_ * local_7e0._8_4_ +
                     auVar221._8_4_ * auVar358._8_4_ +
                     auVar222._8_4_ * (float)uStack_7e8 + auVar204._8_4_ * (float)uStack_808;
                auVar202._12_4_ =
                     auVar207._12_4_ * local_7e0._12_4_ +
                     auVar221._12_4_ * auVar358._12_4_ +
                     auVar222._12_4_ * uStack_7e8._4_4_ + auVar204._12_4_ * uStack_808._4_4_;
                auVar230 = ZEXT464(*(uint *)(local_1e0 + uVar134 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1e0 + uVar134 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar202._0_4_;
                uVar22 = vextractps_avx(auVar202,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar22;
                uVar22 = vextractps_avx(auVar202,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar22;
                *(float *)(ray + k * 4 + 0xf0) = fVar233;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
                *(uint *)(ray + k * 4 + 0x110) = uVar20;
                *(uint *)(ray + k * 4 + 0x120) = uVar19;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_640._0_16_ = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
                local_640._16_16_ = auVar312._16_16_;
                _local_6e0 = vshufps_avx(ZEXT416(uVar20),ZEXT416(uVar20),0);
                _auStack_6d0 = auVar158._16_16_;
                _auStack_6f0 = auVar26._16_16_;
                _local_700 = *local_728;
                auStack_790 = auVar145._16_16_;
                local_7a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_580 = auVar313;
                _local_380 = auVar27;
                while( true ) {
                  local_460 = local_220[uVar134];
                  local_450 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar134 * 4);
                  fVar235 = 1.0 - local_460;
                  fVar233 = local_460 * fVar235 + local_460 * fVar235;
                  auVar222 = ZEXT416((uint)(local_460 * local_460 * 3.0));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar204 = ZEXT416((uint)((fVar233 - local_460 * local_460) * 3.0));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar221 = ZEXT416((uint)((fVar235 * fVar235 - fVar233) * 3.0));
                  auVar221 = vshufps_avx(auVar221,auVar221,0);
                  local_7d0.context = context->user;
                  auVar207 = ZEXT416((uint)(fVar235 * fVar235 * -3.0));
                  auVar207 = vshufps_avx(auVar207,auVar207,0);
                  auVar208._0_4_ =
                       auVar207._0_4_ * (float)local_7e0._0_4_ +
                       auVar221._0_4_ * (float)local_800._0_4_ +
                       auVar222._0_4_ * (float)local_7f0._0_4_ +
                       auVar204._0_4_ * (float)local_810._0_4_;
                  auVar208._4_4_ =
                       auVar207._4_4_ * (float)local_7e0._4_4_ +
                       auVar221._4_4_ * (float)local_800._4_4_ +
                       auVar222._4_4_ * (float)local_7f0._4_4_ +
                       auVar204._4_4_ * (float)local_810._4_4_;
                  auVar208._8_4_ =
                       auVar207._8_4_ * (float)uStack_7d8 +
                       auVar221._8_4_ * (float)uStack_7f8 +
                       auVar222._8_4_ * (float)uStack_7e8 + auVar204._8_4_ * (float)uStack_808;
                  auVar208._12_4_ =
                       auVar207._12_4_ * uStack_7d8._4_4_ +
                       auVar221._12_4_ * uStack_7f8._4_4_ +
                       auVar222._12_4_ * uStack_7e8._4_4_ + auVar204._12_4_ * uStack_808._4_4_;
                  auVar222 = vshufps_avx(auVar208,auVar208,0);
                  local_490[0] = (RTCHitN)auVar222[0];
                  local_490[1] = (RTCHitN)auVar222[1];
                  local_490[2] = (RTCHitN)auVar222[2];
                  local_490[3] = (RTCHitN)auVar222[3];
                  local_490[4] = (RTCHitN)auVar222[4];
                  local_490[5] = (RTCHitN)auVar222[5];
                  local_490[6] = (RTCHitN)auVar222[6];
                  local_490[7] = (RTCHitN)auVar222[7];
                  local_490[8] = (RTCHitN)auVar222[8];
                  local_490[9] = (RTCHitN)auVar222[9];
                  local_490[10] = (RTCHitN)auVar222[10];
                  local_490[0xb] = (RTCHitN)auVar222[0xb];
                  local_490[0xc] = (RTCHitN)auVar222[0xc];
                  local_490[0xd] = (RTCHitN)auVar222[0xd];
                  local_490[0xe] = (RTCHitN)auVar222[0xe];
                  local_490[0xf] = (RTCHitN)auVar222[0xf];
                  auVar222 = vshufps_avx(auVar208,auVar208,0x55);
                  local_480 = auVar222;
                  local_470 = vshufps_avx(auVar208,auVar208,0xaa);
                  fStack_45c = local_460;
                  fStack_458 = local_460;
                  fStack_454 = local_460;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  local_440 = local_6e0;
                  uStack_438 = uStack_6d8;
                  local_430 = local_640._0_8_;
                  uStack_428 = local_640._8_8_;
                  vcmpps_avx(auVar160._0_32_,auVar160._0_32_,0xf);
                  uStack_41c = (local_7d0.context)->instID[0];
                  local_420 = uStack_41c;
                  uStack_418 = uStack_41c;
                  uStack_414 = uStack_41c;
                  uStack_410 = (local_7d0.context)->instPrimID[0];
                  uStack_40c = uStack_410;
                  uStack_408 = uStack_410;
                  uStack_404 = uStack_410;
                  local_840 = _local_700;
                  local_7d0.valid = (int *)local_840;
                  local_7d0.geometryUserPtr = pGVar23->userPtr;
                  local_7d0.hit = local_490;
                  local_7d0.N = 4;
                  local_7d0.ray = (RTCRayN *)ray;
                  if (pGVar23->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar23->intersectionFilterN)(&local_7d0);
                    auVar333 = ZEXT3264(_local_760);
                    auVar303 = ZEXT3264(local_580);
                    auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
                    prim = local_818;
                    pLVar140 = local_828;
                    pre = local_820;
                    fVar292 = (float)local_6a0._0_4_;
                    fVar305 = (float)local_6a0._4_4_;
                    fVar307 = fStack_698;
                    fVar309 = fStack_694;
                    fVar217 = fStack_690;
                    fVar231 = fStack_68c;
                    fVar238 = fStack_688;
                  }
                  if (local_840 == (undefined1  [16])0x0) {
                    auVar222 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar222 = auVar222 ^ _DAT_01f7ae20;
                    auVar250 = ZEXT3264(_local_780);
                  }
                  else {
                    p_Var24 = context->args->filter;
                    auVar250 = ZEXT3264(_local_780);
                    if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var24)(&local_7d0);
                      auVar250 = ZEXT3264(_local_780);
                      auVar333 = ZEXT3264(_local_760);
                      auVar303 = ZEXT3264(local_580);
                      auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
                      prim = local_818;
                      pLVar140 = local_828;
                      pre = local_820;
                      fVar292 = (float)local_6a0._0_4_;
                      fVar305 = (float)local_6a0._4_4_;
                      fVar307 = fStack_698;
                      fVar309 = fStack_694;
                      fVar217 = fStack_690;
                      fVar231 = fStack_68c;
                      fVar238 = fStack_688;
                    }
                    auVar204 = vpcmpeqd_avx(local_840,_DAT_01f7aa10);
                    auVar221 = vpcmpeqd_avx(auVar222,auVar222);
                    auVar222 = auVar204 ^ auVar221;
                    if (local_840 != (undefined1  [16])0x0) {
                      auVar204 = auVar204 ^ auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])local_7d0.hit);
                      *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar221;
                      auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar221;
                      auVar204 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                          (local_7d0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar204;
                    }
                  }
                  auVar145 = local_500;
                  auVar313 = auVar303._0_32_;
                  auVar182._8_8_ = 0x100000001;
                  auVar182._0_8_ = 0x100000001;
                  if ((auVar182 & auVar222) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_7a0._0_4_;
                    auVar222 = local_7a0;
                  }
                  else {
                    auVar222 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar230 = ZEXT3264(local_500);
                  *(undefined4 *)(local_5c0[0] + uVar134 * 4) = 0;
                  local_7a0 = auVar222;
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar159._16_16_ = auVar222;
                  auVar159._0_16_ = auVar222;
                  auVar26 = vcmpps_avx(auVar145,auVar159,2);
                  auVar158 = vandps_avx(auVar26,local_5c0[0]);
                  local_5c0[0] = local_5c0[0] & auVar26;
                  if ((((((((local_5c0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                           && (local_5c0[0] >> 0x3f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) &&
                          (local_5c0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                         && SUB321(local_5c0[0] >> 0x7f,0) == '\0') &&
                        (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5c0[0] >> 0xbf,0) == '\0') &&
                      (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5c0[0][0x1f]) break;
                  auVar193._8_4_ = 0x7f800000;
                  auVar193._0_8_ = 0x7f8000007f800000;
                  auVar193._12_4_ = 0x7f800000;
                  auVar193._16_4_ = 0x7f800000;
                  auVar193._20_4_ = 0x7f800000;
                  auVar193._24_4_ = 0x7f800000;
                  auVar193._28_4_ = 0x7f800000;
                  auVar145 = vblendvps_avx(auVar193,auVar145,auVar158);
                  auVar26 = vshufps_avx(auVar145,auVar145,0xb1);
                  auVar26 = vminps_avx(auVar145,auVar26);
                  auVar313 = vshufpd_avx(auVar26,auVar26,5);
                  auVar26 = vminps_avx(auVar26,auVar313);
                  auVar313 = vperm2f128_avx(auVar26,auVar26,1);
                  auVar26 = vminps_avx(auVar26,auVar313);
                  auVar26 = vcmpps_avx(auVar145,auVar26,0);
                  auVar313 = auVar158 & auVar26;
                  auVar145 = auVar158;
                  if ((((((((auVar313 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar313 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar313 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar313 >> 0x7f,0) != '\0') ||
                        (auVar313 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar313 >> 0xbf,0) != '\0') ||
                      (auVar313 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar313[0x1f] < '\0') {
                    auVar145 = vandps_avx(auVar26,auVar158);
                  }
                  uVar132 = vmovmskps_avx(auVar145);
                  uVar133 = 0;
                  if (uVar132 != 0) {
                    for (; (uVar132 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
                    }
                  }
                  uVar134 = (ulong)uVar133;
                  local_5c0[0] = auVar158;
                }
              }
            }
            goto LAB_01056a94;
          }
        }
        auVar250 = ZEXT3264(_local_780);
      }
LAB_01056a94:
      local_580 = auVar313;
      if (8 < (int)uVar21) {
        _local_780 = auVar250._0_32_;
        auVar222 = vpshufd_avx(ZEXT416(uVar21),0);
        local_540 = auVar222._0_4_;
        fStack_53c = auVar222._4_4_;
        fStack_538 = auVar222._8_4_;
        fStack_534 = auVar222._12_4_;
        auVar222 = vshufps_avx(local_6c0._0_16_,local_6c0._0_16_,0);
        register0x00001210 = auVar222;
        _local_3a0 = auVar222;
        auVar222 = vpermilps_avx(ZEXT416(uVar136),0);
        local_c0._16_16_ = auVar222;
        local_c0._0_16_ = auVar222;
        auVar144._0_4_ = 1.0 / (float)local_670._0_4_;
        auVar144._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar222 = vshufps_avx(auVar144,auVar144,0);
        register0x00001210 = auVar222;
        _local_e0 = auVar222;
        local_670 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
        local_310 = vshufps_avx(ZEXT416(uVar20),ZEXT416(uVar20),0);
        auVar160 = ZEXT1664(local_310);
        lVar135 = 8;
        do {
          pauVar4 = (undefined1 (*) [28])(bezier_basis0 + lVar135 * 4 + lVar139);
          fVar233 = *(float *)*pauVar4;
          fVar235 = *(float *)(*pauVar4 + 4);
          fVar240 = *(float *)(*pauVar4 + 8);
          fVar241 = *(float *)(*pauVar4 + 0xc);
          fVar242 = *(float *)(*pauVar4 + 0x10);
          fVar251 = *(float *)(*pauVar4 + 0x14);
          fVar253 = *(float *)(*pauVar4 + 0x18);
          auVar126 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar139 + 0x21aa768 + lVar135 * 4);
          fVar255 = *(float *)*pauVar4;
          fVar256 = *(float *)(*pauVar4 + 4);
          fVar257 = *(float *)(*pauVar4 + 8);
          fVar258 = *(float *)(*pauVar4 + 0xc);
          fVar259 = *(float *)(*pauVar4 + 0x10);
          fVar267 = *(float *)(*pauVar4 + 0x14);
          fVar268 = *(float *)(*pauVar4 + 0x18);
          auVar125 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar139 + 0x21aabec + lVar135 * 4);
          fVar269 = *(float *)*pauVar4;
          fVar270 = *(float *)(*pauVar4 + 4);
          fVar271 = *(float *)(*pauVar4 + 8);
          fVar272 = *(float *)(*pauVar4 + 0xc);
          fVar317 = *(float *)(*pauVar4 + 0x10);
          fVar239 = *(float *)(*pauVar4 + 0x14);
          fVar334 = *(float *)(*pauVar4 + 0x18);
          auVar124 = *pauVar4;
          pauVar4 = (undefined1 (*) [28])(lVar139 + 0x21ab070 + lVar135 * 4);
          fVar318 = *(float *)*pauVar4;
          fVar162 = *(float *)(*pauVar4 + 4);
          fVar164 = *(float *)(*pauVar4 + 8);
          fVar167 = *(float *)(*pauVar4 + 0xc);
          fVar169 = *(float *)(*pauVar4 + 0x10);
          fVar171 = *(float *)(*pauVar4 + 0x14);
          fVar173 = *(float *)(*pauVar4 + 0x18);
          auVar123 = *pauVar4;
          fVar166 = auVar333._0_4_;
          fVar168 = auVar333._4_4_;
          fVar170 = auVar333._8_4_;
          fVar172 = auVar333._12_4_;
          fVar197 = auVar333._16_4_;
          fVar273 = auVar333._20_4_;
          fVar288 = auVar333._24_4_;
          fVar289 = auVar230._28_4_;
          fVar216 = fVar289 + *(float *)pauVar4[1];
          fVar174 = fVar289 + fVar289 + auVar160._28_4_;
          auVar213._0_4_ =
               (float)local_4c0._0_4_ * fVar233 +
               (float)local_340._0_4_ * fVar255 +
               fVar166 * fVar269 + (float)local_4e0._0_4_ * fVar318;
          auVar213._4_4_ =
               (float)local_4c0._4_4_ * fVar235 +
               (float)local_340._4_4_ * fVar256 +
               fVar168 * fVar270 + (float)local_4e0._4_4_ * fVar162;
          auVar213._8_4_ =
               fStack_4b8 * fVar240 +
               fStack_338 * fVar257 + fVar170 * fVar271 + fStack_4d8 * fVar164;
          auVar213._12_4_ =
               fStack_4b4 * fVar241 +
               fStack_334 * fVar258 + fVar172 * fVar272 + fStack_4d4 * fVar167;
          auVar213._16_4_ =
               fStack_4b0 * fVar242 +
               fStack_330 * fVar259 + fVar197 * fVar317 + fStack_4d0 * fVar169;
          auVar213._20_4_ =
               fStack_4ac * fVar251 +
               fStack_32c * fVar267 + fVar273 * fVar239 + fStack_4cc * fVar171;
          auVar213._24_4_ =
               fStack_4a8 * fVar253 +
               fStack_328 * fVar268 + fVar288 * fVar334 + fStack_4c8 * fVar173;
          auVar213._28_4_ = fVar216 + fVar174;
          local_6c0._0_4_ =
               (float)local_140._0_4_ * fVar255 +
               fVar269 * fVar292 + (float)local_5e0._0_4_ * fVar318 +
               (float)local_160._0_4_ * fVar233;
          local_6c0._4_4_ =
               (float)local_140._4_4_ * fVar256 +
               fVar270 * fVar305 + (float)local_5e0._4_4_ * fVar162 +
               (float)local_160._4_4_ * fVar235;
          local_6c0._8_4_ =
               fStack_138 * fVar257 + fVar271 * fVar307 + fStack_5d8 * fVar164 +
               fStack_158 * fVar240;
          local_6c0._12_4_ =
               fStack_134 * fVar258 + fVar272 * fVar309 + fStack_5d4 * fVar167 +
               fStack_154 * fVar241;
          local_6c0._16_4_ =
               fStack_130 * fVar259 + fVar317 * fVar217 + fStack_5d0 * fVar169 +
               fStack_150 * fVar242;
          local_6c0._20_4_ =
               fStack_12c * fVar267 + fVar239 * fVar231 + fStack_5cc * fVar171 +
               fStack_14c * fVar251;
          local_6c0._24_4_ =
               fStack_128 * fVar268 + fVar334 * fVar238 + fStack_5c8 * fVar173 +
               fStack_148 * fVar253;
          local_6c0._28_4_ = fVar289 + fVar289 + auVar250._28_4_ + fVar174;
          auVar230 = ZEXT3264(local_6c0);
          fVar142 = (float)local_100._0_4_ * fVar233 +
                    fVar255 * (float)local_1a0._0_4_ +
                    fVar269 * (float)local_180._0_4_ + (float)local_120._0_4_ * fVar318;
          fVar162 = (float)local_100._4_4_ * fVar235 +
                    fVar256 * (float)local_1a0._4_4_ +
                    fVar270 * (float)local_180._4_4_ + (float)local_120._4_4_ * fVar162;
          fVar164 = fStack_f8 * fVar240 +
                    fVar257 * fStack_198 + fVar271 * fStack_178 + fStack_118 * fVar164;
          fVar167 = fStack_f4 * fVar241 +
                    fVar258 * fStack_194 + fVar272 * fStack_174 + fStack_114 * fVar167;
          fVar169 = fStack_f0 * fVar242 +
                    fVar259 * fStack_190 + fVar317 * fStack_170 + fStack_110 * fVar169;
          fVar171 = fStack_ec * fVar251 +
                    fVar267 * fStack_18c + fVar239 * fStack_16c + fStack_10c * fVar171;
          fVar173 = fStack_e8 * fVar253 +
                    fVar268 * fStack_188 + fVar334 * fStack_168 + fStack_108 * fVar173;
          fVar174 = fVar174 + fVar289 + fVar216;
          pauVar4 = (undefined1 (*) [28])(bezier_basis1 + lVar135 * 4 + lVar139);
          fVar233 = *(float *)*pauVar4;
          fVar235 = *(float *)(*pauVar4 + 4);
          fVar240 = *(float *)(*pauVar4 + 8);
          fVar241 = *(float *)(*pauVar4 + 0xc);
          fVar242 = *(float *)(*pauVar4 + 0x10);
          fVar251 = *(float *)(*pauVar4 + 0x14);
          fVar253 = *(float *)(*pauVar4 + 0x18);
          auVar129 = *pauVar4;
          pauVar5 = (undefined1 (*) [28])(lVar139 + 0x21acb88 + lVar135 * 4);
          auVar127 = *pauVar5;
          pfVar1 = (float *)(lVar139 + 0x21ad00c + lVar135 * 4);
          fVar255 = *pfVar1;
          fVar256 = pfVar1[1];
          fVar257 = pfVar1[2];
          fVar258 = pfVar1[3];
          fVar259 = pfVar1[4];
          fVar267 = pfVar1[5];
          fVar268 = pfVar1[6];
          pauVar6 = (undefined1 (*) [28])(lVar139 + 0x21ad490 + lVar135 * 4);
          fVar269 = *(float *)*pauVar6;
          fVar270 = *(float *)(*pauVar6 + 4);
          fVar271 = *(float *)(*pauVar6 + 8);
          fVar272 = *(float *)(*pauVar6 + 0xc);
          fVar317 = *(float *)(*pauVar6 + 0x10);
          fVar239 = *(float *)(*pauVar6 + 0x14);
          fVar334 = *(float *)(*pauVar6 + 0x18);
          auVar128 = *pauVar6;
          fVar318 = *(float *)pauVar6[1];
          local_880._0_4_ = auVar127._0_4_;
          local_880._4_4_ = auVar127._4_4_;
          fStack_878 = auVar127._8_4_;
          fStack_874 = auVar127._12_4_;
          fStack_870 = auVar127._16_4_;
          fStack_86c = auVar127._20_4_;
          fStack_868 = auVar127._24_4_;
          fVar289 = fVar318 + fStack_104;
          fVar216 = fVar318 + fVar318 + *(float *)pauVar5[1];
          auVar160 = ZEXT3264(auVar333._0_32_);
          local_380._0_4_ =
               (float)local_4c0._0_4_ * fVar233 +
               (float)local_880._0_4_ * (float)local_340._0_4_ +
               fVar166 * fVar255 + (float)local_4e0._0_4_ * fVar269;
          local_380._4_4_ =
               (float)local_4c0._4_4_ * fVar235 +
               (float)local_880._4_4_ * (float)local_340._4_4_ +
               fVar168 * fVar256 + (float)local_4e0._4_4_ * fVar270;
          fStack_378 = fStack_4b8 * fVar240 +
                       fStack_878 * fStack_338 + fVar170 * fVar257 + fStack_4d8 * fVar271;
          fStack_374 = fStack_4b4 * fVar241 +
                       fStack_874 * fStack_334 + fVar172 * fVar258 + fStack_4d4 * fVar272;
          fStack_370 = fStack_4b0 * fVar242 +
                       fStack_870 * fStack_330 + fVar197 * fVar259 + fStack_4d0 * fVar317;
          fStack_36c = fStack_4ac * fVar251 +
                       fStack_86c * fStack_32c + fVar273 * fVar267 + fStack_4cc * fVar239;
          fStack_368 = fStack_4a8 * fVar253 +
                       fStack_868 * fStack_328 + fVar288 * fVar268 + fStack_4c8 * fVar334;
          register0x0000141c = fVar289 + fVar216;
          local_640._0_4_ =
               (float)local_160._0_4_ * fVar233 +
               (float)local_140._0_4_ * (float)local_880._0_4_ +
               fVar292 * fVar255 + (float)local_5e0._0_4_ * fVar269;
          local_640._4_4_ =
               (float)local_160._4_4_ * fVar235 +
               (float)local_140._4_4_ * (float)local_880._4_4_ +
               fVar305 * fVar256 + (float)local_5e0._4_4_ * fVar270;
          local_640._8_4_ =
               fStack_158 * fVar240 +
               fStack_138 * fStack_878 + fVar307 * fVar257 + fStack_5d8 * fVar271;
          local_640._12_4_ =
               fStack_154 * fVar241 +
               fStack_134 * fStack_874 + fVar309 * fVar258 + fStack_5d4 * fVar272;
          local_640._16_4_ =
               fStack_150 * fVar242 +
               fStack_130 * fStack_870 + fVar217 * fVar259 + fStack_5d0 * fVar317;
          local_640._20_4_ =
               fStack_14c * fVar251 +
               fStack_12c * fStack_86c + fVar231 * fVar267 + fStack_5cc * fVar239;
          local_640._24_4_ =
               fStack_148 * fVar253 +
               fStack_128 * fStack_868 + fVar238 * fVar268 + fStack_5c8 * fVar334;
          local_640._28_4_ = fVar216 + fVar318 + fVar318 + fStack_5c4;
          auVar302._0_4_ =
               (float)local_880._0_4_ * (float)local_1a0._0_4_ +
               fVar255 * (float)local_180._0_4_ + (float)local_120._0_4_ * fVar269 +
               (float)local_100._0_4_ * fVar233;
          auVar302._4_4_ =
               (float)local_880._4_4_ * (float)local_1a0._4_4_ +
               fVar256 * (float)local_180._4_4_ + (float)local_120._4_4_ * fVar270 +
               (float)local_100._4_4_ * fVar235;
          auVar302._8_4_ =
               fStack_878 * fStack_198 + fVar257 * fStack_178 + fStack_118 * fVar271 +
               fStack_f8 * fVar240;
          auVar302._12_4_ =
               fStack_874 * fStack_194 + fVar258 * fStack_174 + fStack_114 * fVar272 +
               fStack_f4 * fVar241;
          auVar302._16_4_ =
               fStack_870 * fStack_190 + fVar259 * fStack_170 + fStack_110 * fVar317 +
               fStack_f0 * fVar242;
          auVar302._20_4_ =
               fStack_86c * fStack_18c + fVar267 * fStack_16c + fStack_10c * fVar239 +
               fStack_ec * fVar251;
          auVar302._24_4_ =
               fStack_868 * fStack_188 + fVar268 * fStack_168 + fStack_108 * fVar334 +
               fStack_e8 * fVar253;
          auVar302._28_4_ = fVar318 + fVar289 + fVar216;
          auVar158 = vsubps_avx(_local_380,auVar213);
          auVar26 = vsubps_avx(local_640,local_6c0);
          fVar242 = auVar158._0_4_;
          fVar251 = auVar158._4_4_;
          auVar73._4_4_ = fVar251 * local_6c0._4_4_;
          auVar73._0_4_ = fVar242 * local_6c0._0_4_;
          fVar253 = auVar158._8_4_;
          auVar73._8_4_ = fVar253 * local_6c0._8_4_;
          fVar269 = auVar158._12_4_;
          auVar73._12_4_ = fVar269 * local_6c0._12_4_;
          fVar270 = auVar158._16_4_;
          auVar73._16_4_ = fVar270 * local_6c0._16_4_;
          fVar271 = auVar158._20_4_;
          auVar73._20_4_ = fVar271 * local_6c0._20_4_;
          fVar272 = auVar158._24_4_;
          auVar73._24_4_ = fVar272 * local_6c0._24_4_;
          auVar73._28_4_ = fVar216;
          fVar217 = auVar26._0_4_;
          fVar231 = auVar26._4_4_;
          auVar74._4_4_ = fVar231 * auVar213._4_4_;
          auVar74._0_4_ = fVar217 * auVar213._0_4_;
          fVar233 = auVar26._8_4_;
          auVar74._8_4_ = fVar233 * auVar213._8_4_;
          fVar235 = auVar26._12_4_;
          auVar74._12_4_ = fVar235 * auVar213._12_4_;
          fVar238 = auVar26._16_4_;
          auVar74._16_4_ = fVar238 * auVar213._16_4_;
          fVar240 = auVar26._20_4_;
          auVar74._20_4_ = fVar240 * auVar213._20_4_;
          fVar241 = auVar26._24_4_;
          auVar74._24_4_ = fVar241 * auVar213._24_4_;
          auVar74._28_4_ = local_640._28_4_;
          auVar313 = vsubps_avx(auVar73,auVar74);
          auVar118._4_4_ = fVar162;
          auVar118._0_4_ = fVar142;
          auVar118._8_4_ = fVar164;
          auVar118._12_4_ = fVar167;
          auVar118._16_4_ = fVar169;
          auVar118._20_4_ = fVar171;
          auVar118._24_4_ = fVar173;
          auVar118._28_4_ = fVar174;
          auVar145 = vmaxps_avx(auVar118,auVar302);
          auVar75._4_4_ = auVar145._4_4_ * auVar145._4_4_ * (fVar251 * fVar251 + fVar231 * fVar231);
          auVar75._0_4_ = auVar145._0_4_ * auVar145._0_4_ * (fVar242 * fVar242 + fVar217 * fVar217);
          auVar75._8_4_ = auVar145._8_4_ * auVar145._8_4_ * (fVar253 * fVar253 + fVar233 * fVar233);
          auVar75._12_4_ =
               auVar145._12_4_ * auVar145._12_4_ * (fVar269 * fVar269 + fVar235 * fVar235);
          auVar75._16_4_ =
               auVar145._16_4_ * auVar145._16_4_ * (fVar270 * fVar270 + fVar238 * fVar238);
          auVar75._20_4_ =
               auVar145._20_4_ * auVar145._20_4_ * (fVar271 * fVar271 + fVar240 * fVar240);
          auVar75._24_4_ =
               auVar145._24_4_ * auVar145._24_4_ * (fVar272 * fVar272 + fVar241 * fVar241);
          auVar75._28_4_ = fVar289 + local_640._28_4_;
          auVar76._4_4_ = auVar313._4_4_ * auVar313._4_4_;
          auVar76._0_4_ = auVar313._0_4_ * auVar313._0_4_;
          auVar76._8_4_ = auVar313._8_4_ * auVar313._8_4_;
          auVar76._12_4_ = auVar313._12_4_ * auVar313._12_4_;
          auVar76._16_4_ = auVar313._16_4_ * auVar313._16_4_;
          auVar76._20_4_ = auVar313._20_4_ * auVar313._20_4_;
          auVar76._24_4_ = auVar313._24_4_ * auVar313._24_4_;
          auVar76._28_4_ = auVar313._28_4_;
          auVar145 = vcmpps_avx(auVar76,auVar75,2);
          local_2a0 = (uint)lVar135;
          auVar204 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar222 = vpor_avx(auVar204,_DAT_01f7fcf0);
          auVar204 = vpor_avx(auVar204,_DAT_01fafea0);
          auVar121._4_4_ = fStack_53c;
          auVar121._0_4_ = local_540;
          auVar121._8_4_ = fStack_538;
          auVar121._12_4_ = fStack_534;
          auVar250 = ZEXT1664(auVar121);
          auVar222 = vpcmpgtd_avx(auVar121,auVar222);
          auVar204 = vpcmpgtd_avx(auVar121,auVar204);
          auVar214._16_16_ = auVar204;
          auVar214._0_16_ = auVar222;
          auVar313 = auVar214 & auVar145;
          if ((((((((auVar313 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar313 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar313 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar313 >> 0x7f,0) == '\0') &&
                (auVar313 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar313 >> 0xbf,0) == '\0') &&
              (auVar313 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar313[0x1f]) {
            auVar333 = ZEXT3264(auVar333._0_32_);
          }
          else {
            local_660._0_4_ = auVar129._0_4_;
            local_660._4_4_ = auVar129._4_4_;
            fStack_658 = auVar129._8_4_;
            fStack_654 = auVar129._12_4_;
            fStack_650 = auVar129._16_4_;
            fStack_64c = auVar129._20_4_;
            fStack_648 = auVar129._24_4_;
            local_720._0_4_ = auVar128._0_4_;
            local_720._4_4_ = auVar128._4_4_;
            fStack_718 = auVar128._8_4_;
            fStack_714 = auVar128._12_4_;
            fStack_710 = auVar128._16_4_;
            fStack_70c = auVar128._20_4_;
            fStack_708 = auVar128._24_4_;
            local_620 = (float)local_1c0._0_4_ * (float)local_660._0_4_ +
                        (float)local_880._0_4_ * (float)local_360._0_4_ +
                        (float)local_a0._0_4_ * fVar255 +
                        (float)local_780._0_4_ * (float)local_720._0_4_;
            fStack_61c = (float)local_1c0._4_4_ * (float)local_660._4_4_ +
                         (float)local_880._4_4_ * (float)local_360._4_4_ +
                         (float)local_a0._4_4_ * fVar256 +
                         (float)local_780._4_4_ * (float)local_720._4_4_;
            fStack_618 = fStack_1b8 * fStack_658 +
                         fStack_878 * fStack_358 + fStack_98 * fVar257 + fStack_778 * fStack_718;
            fStack_614 = fStack_1b4 * fStack_654 +
                         fStack_874 * fStack_354 + fStack_94 * fVar258 + fStack_774 * fStack_714;
            fStack_610 = fStack_1b0 * fStack_650 +
                         fStack_870 * fStack_350 + fStack_90 * fVar259 + fStack_770 * fStack_710;
            fStack_60c = fStack_1ac * fStack_64c +
                         fStack_86c * fStack_34c + fStack_8c * fVar267 + fStack_76c * fStack_70c;
            fStack_608 = fStack_1a8 * fStack_648 +
                         fStack_868 * fStack_348 + fStack_88 * fVar268 + fStack_768 * fStack_708;
            fStack_604 = fStack_4a4 + fStack_1a4 + auVar145._28_4_ + 0.0;
            local_700._0_4_ = auVar125._0_4_;
            local_700._4_4_ = auVar125._4_4_;
            fStack_6f8 = auVar125._8_4_;
            fStack_6f4 = auVar125._12_4_;
            auStack_6f0._0_4_ = auVar125._16_4_;
            auStack_6f0._4_4_ = auVar125._20_4_;
            fStack_6e8 = auVar125._24_4_;
            local_600._0_4_ = auVar124._0_4_;
            local_600._4_4_ = auVar124._4_4_;
            fStack_5f8 = auVar124._8_4_;
            fStack_5f4 = auVar124._12_4_;
            fStack_5f0 = auVar124._16_4_;
            fStack_5ec = auVar124._20_4_;
            fStack_5e8 = auVar124._24_4_;
            local_520._0_4_ = auVar123._0_4_;
            local_520._4_4_ = auVar123._4_4_;
            fStack_518 = auVar123._8_4_;
            fStack_514 = auVar123._12_4_;
            fStack_510 = auVar123._16_4_;
            fStack_50c = auVar123._20_4_;
            fStack_508 = auVar123._24_4_;
            fVar274 = (float)local_780._0_4_ * (float)local_520._0_4_;
            fVar283 = (float)local_780._4_4_ * (float)local_520._4_4_;
            fVar284 = fStack_778 * fStack_518;
            fVar285 = fStack_774 * fStack_514;
            fVar286 = fStack_770 * fStack_510;
            fVar215 = fStack_76c * fStack_50c;
            fVar287 = fStack_768 * fStack_508;
            pfVar1 = (float *)(lVar139 + 0x21abdfc + lVar135 * 4);
            fVar217 = *pfVar1;
            fVar231 = pfVar1[1];
            fVar233 = pfVar1[2];
            fVar235 = pfVar1[3];
            fVar238 = pfVar1[4];
            fVar240 = pfVar1[5];
            fVar241 = pfVar1[6];
            pfVar2 = (float *)(lVar139 + 0x21ac280 + lVar135 * 4);
            fVar242 = *pfVar2;
            fVar251 = pfVar2[1];
            fVar253 = pfVar2[2];
            fVar255 = pfVar2[3];
            fVar256 = pfVar2[4];
            fVar257 = pfVar2[5];
            fVar258 = pfVar2[6];
            fVar290 = *(float *)pauVar4[1] + 0.0;
            pfVar7 = (float *)(lVar139 + 0x21ab978 + lVar135 * 4);
            fVar259 = *pfVar7;
            fVar267 = pfVar7[1];
            fVar268 = pfVar7[2];
            fVar269 = pfVar7[3];
            fVar270 = pfVar7[4];
            fVar271 = pfVar7[5];
            fVar272 = pfVar7[6];
            fVar175 = pfVar1[7] + pfVar2[7];
            fVar198 = pfVar2[7] + fVar290;
            fVar290 = *(float *)pauVar4[1] + fStack_124 + fVar290;
            pfVar1 = (float *)(lVar139 + 0x21ab4f4 + lVar135 * 4);
            fVar317 = *pfVar1;
            fVar239 = pfVar1[1];
            fVar334 = pfVar1[2];
            fVar318 = pfVar1[3];
            fVar216 = pfVar1[4];
            fVar289 = pfVar1[5];
            fVar237 = pfVar1[6];
            local_520._4_4_ =
                 fVar239 * (float)local_4c0._4_4_ +
                 fVar267 * (float)local_340._4_4_ +
                 fVar168 * fVar231 + (float)local_4e0._4_4_ * fVar251;
            local_520._0_4_ =
                 fVar317 * (float)local_4c0._0_4_ +
                 fVar259 * (float)local_340._0_4_ +
                 fVar166 * fVar217 + (float)local_4e0._0_4_ * fVar242;
            fStack_518 = fVar334 * fStack_4b8 +
                         fVar268 * fStack_338 + fVar170 * fVar233 + fStack_4d8 * fVar253;
            fStack_514 = fVar318 * fStack_4b4 +
                         fVar269 * fStack_334 + fVar172 * fVar235 + fStack_4d4 * fVar255;
            fStack_510 = fVar216 * fStack_4b0 +
                         fVar270 * fStack_330 + fVar197 * fVar238 + fStack_4d0 * fVar256;
            fStack_50c = fVar289 * fStack_4ac +
                         fVar271 * fStack_32c + fVar273 * fVar240 + fStack_4cc * fVar257;
            fStack_508 = fVar237 * fStack_4a8 +
                         fVar272 * fStack_328 + fVar288 * fVar241 + fStack_4c8 * fVar258;
            fStack_504 = fVar175 + fVar198;
            local_720._4_4_ =
                 (float)local_160._4_4_ * fVar239 +
                 (float)local_6a0._4_4_ * fVar231 + (float)local_5e0._4_4_ * fVar251 +
                 (float)local_140._4_4_ * fVar267;
            local_720._0_4_ =
                 (float)local_160._0_4_ * fVar317 +
                 (float)local_6a0._0_4_ * fVar217 + (float)local_5e0._0_4_ * fVar242 +
                 (float)local_140._0_4_ * fVar259;
            fStack_718 = fStack_158 * fVar334 +
                         fStack_698 * fVar233 + fStack_5d8 * fVar253 + fStack_138 * fVar268;
            fStack_714 = fStack_154 * fVar318 +
                         fStack_694 * fVar235 + fStack_5d4 * fVar255 + fStack_134 * fVar269;
            fStack_710 = fStack_150 * fVar216 +
                         fStack_690 * fVar238 + fStack_5d0 * fVar256 + fStack_130 * fVar270;
            fStack_70c = fStack_14c * fVar289 +
                         fStack_68c * fVar240 + fStack_5cc * fVar257 + fStack_12c * fVar271;
            fStack_708 = fStack_148 * fVar237 +
                         fStack_688 * fVar241 + fStack_5c8 * fVar258 + fStack_128 * fVar272;
            fStack_704 = fVar198 + fVar290;
            auVar348._0_4_ =
                 fVar259 * (float)local_360._0_4_ +
                 (float)local_a0._0_4_ * fVar217 + (float)local_780._0_4_ * fVar242 +
                 fVar317 * (float)local_1c0._0_4_;
            auVar348._4_4_ =
                 fVar267 * (float)local_360._4_4_ +
                 (float)local_a0._4_4_ * fVar231 + (float)local_780._4_4_ * fVar251 +
                 fVar239 * (float)local_1c0._4_4_;
            auVar348._8_4_ =
                 fVar268 * fStack_358 + fStack_98 * fVar233 + fStack_778 * fVar253 +
                 fVar334 * fStack_1b8;
            auVar348._12_4_ =
                 fVar269 * fStack_354 + fStack_94 * fVar235 + fStack_774 * fVar255 +
                 fVar318 * fStack_1b4;
            auVar348._16_4_ =
                 fVar270 * fStack_350 + fStack_90 * fVar238 + fStack_770 * fVar256 +
                 fVar216 * fStack_1b0;
            auVar348._20_4_ =
                 fVar271 * fStack_34c + fStack_8c * fVar240 + fStack_76c * fVar257 +
                 fVar289 * fStack_1ac;
            auVar348._24_4_ =
                 fVar272 * fStack_348 + fStack_88 * fVar241 + fStack_768 * fVar258 +
                 fVar237 * fStack_1a8;
            auVar348._28_4_ = pfVar7[7] + fVar175 + fVar290;
            pfVar1 = (float *)(lVar139 + 0x21ae21c + lVar135 * 4);
            fVar217 = *pfVar1;
            fVar231 = pfVar1[1];
            fVar233 = pfVar1[2];
            fVar235 = pfVar1[3];
            fVar238 = pfVar1[4];
            fVar240 = pfVar1[5];
            fVar241 = pfVar1[6];
            pfVar2 = (float *)(lVar139 + 0x21ae6a0 + lVar135 * 4);
            fVar242 = *pfVar2;
            fVar251 = pfVar2[1];
            fVar253 = pfVar2[2];
            fVar255 = pfVar2[3];
            fVar256 = pfVar2[4];
            fVar257 = pfVar2[5];
            fVar258 = pfVar2[6];
            pfVar7 = (float *)(lVar139 + 0x21add98 + lVar135 * 4);
            fVar259 = *pfVar7;
            fVar267 = pfVar7[1];
            fVar268 = pfVar7[2];
            fVar269 = pfVar7[3];
            fVar270 = pfVar7[4];
            fVar271 = pfVar7[5];
            fVar272 = pfVar7[6];
            pfVar8 = (float *)(lVar139 + 0x21ad914 + lVar135 * 4);
            fVar317 = *pfVar8;
            fVar239 = pfVar8[1];
            fVar334 = pfVar8[2];
            fVar318 = pfVar8[3];
            fVar216 = pfVar8[4];
            fVar289 = pfVar8[5];
            fVar166 = pfVar8[6];
            auVar322._0_4_ =
                 fVar317 * (float)local_4c0._0_4_ +
                 fVar259 * (float)local_340._0_4_ +
                 fVar217 * (float)local_760._0_4_ + (float)local_4e0._0_4_ * fVar242;
            auVar322._4_4_ =
                 fVar239 * (float)local_4c0._4_4_ +
                 fVar267 * (float)local_340._4_4_ +
                 fVar231 * (float)local_760._4_4_ + (float)local_4e0._4_4_ * fVar251;
            auVar322._8_4_ =
                 fVar334 * fStack_4b8 +
                 fVar268 * fStack_338 + fVar233 * fStack_758 + fStack_4d8 * fVar253;
            auVar322._12_4_ =
                 fVar318 * fStack_4b4 +
                 fVar269 * fStack_334 + fVar235 * fStack_754 + fStack_4d4 * fVar255;
            auVar322._16_4_ =
                 fVar216 * fStack_4b0 +
                 fVar270 * fStack_330 + fVar238 * fStack_750 + fStack_4d0 * fVar256;
            auVar322._20_4_ =
                 fVar289 * fStack_4ac +
                 fVar271 * fStack_32c + fVar240 * fStack_74c + fStack_4cc * fVar257;
            auVar322._24_4_ =
                 fVar166 * fStack_4a8 +
                 fVar272 * fStack_328 + fVar241 * fStack_748 + fStack_4c8 * fVar258;
            auVar322._28_4_ = fStack_144 + fStack_144 + fStack_4c4 + fStack_144;
            auVar342._0_4_ =
                 fVar317 * (float)local_160._0_4_ +
                 (float)local_140._0_4_ * fVar259 +
                 (float)local_6a0._0_4_ * fVar217 + (float)local_5e0._0_4_ * fVar242;
            auVar342._4_4_ =
                 fVar239 * (float)local_160._4_4_ +
                 (float)local_140._4_4_ * fVar267 +
                 (float)local_6a0._4_4_ * fVar231 + (float)local_5e0._4_4_ * fVar251;
            auVar342._8_4_ =
                 fVar334 * fStack_158 +
                 fStack_138 * fVar268 + fStack_698 * fVar233 + fStack_5d8 * fVar253;
            auVar342._12_4_ =
                 fVar318 * fStack_154 +
                 fStack_134 * fVar269 + fStack_694 * fVar235 + fStack_5d4 * fVar255;
            auVar342._16_4_ =
                 fVar216 * fStack_150 +
                 fStack_130 * fVar270 + fStack_690 * fVar238 + fStack_5d0 * fVar256;
            auVar342._20_4_ =
                 fVar289 * fStack_14c +
                 fStack_12c * fVar271 + fStack_68c * fVar240 + fStack_5cc * fVar257;
            auVar342._24_4_ =
                 fVar166 * fStack_148 +
                 fStack_128 * fVar272 + fStack_688 * fVar241 + fStack_5c8 * fVar258;
            auVar342._28_4_ = fStack_144 + fStack_144 + fStack_5c4 + fStack_144;
            auVar266._8_4_ = 0x7fffffff;
            auVar266._0_8_ = 0x7fffffff7fffffff;
            auVar266._12_4_ = 0x7fffffff;
            auVar266._16_4_ = 0x7fffffff;
            auVar266._20_4_ = 0x7fffffff;
            auVar266._24_4_ = 0x7fffffff;
            auVar266._28_4_ = 0x7fffffff;
            auVar313 = vandps_avx(_local_520,auVar266);
            auVar152 = vandps_avx(_local_720,auVar266);
            auVar152 = vmaxps_avx(auVar313,auVar152);
            auVar313 = vandps_avx(auVar348,auVar266);
            auVar152 = vmaxps_avx(auVar152,auVar313);
            auVar152 = vcmpps_avx(auVar152,_local_3a0,1);
            auVar27 = vblendvps_avx(_local_520,auVar158,auVar152);
            auVar154._0_4_ =
                 fVar317 * (float)local_1c0._0_4_ +
                 fVar259 * (float)local_360._0_4_ +
                 fVar242 * (float)local_780._0_4_ + (float)local_a0._0_4_ * fVar217;
            auVar154._4_4_ =
                 fVar239 * (float)local_1c0._4_4_ +
                 fVar267 * (float)local_360._4_4_ +
                 fVar251 * (float)local_780._4_4_ + (float)local_a0._4_4_ * fVar231;
            auVar154._8_4_ =
                 fVar334 * fStack_1b8 +
                 fVar268 * fStack_358 + fVar253 * fStack_778 + fStack_98 * fVar233;
            auVar154._12_4_ =
                 fVar318 * fStack_1b4 +
                 fVar269 * fStack_354 + fVar255 * fStack_774 + fStack_94 * fVar235;
            auVar154._16_4_ =
                 fVar216 * fStack_1b0 +
                 fVar270 * fStack_350 + fVar256 * fStack_770 + fStack_90 * fVar238;
            auVar154._20_4_ =
                 fVar289 * fStack_1ac +
                 fVar271 * fStack_34c + fVar257 * fStack_76c + fStack_8c * fVar240;
            auVar154._24_4_ =
                 fVar166 * fStack_1a8 +
                 fVar272 * fStack_348 + fVar258 * fStack_768 + fStack_88 * fVar241;
            auVar154._28_4_ = auVar313._28_4_ + pfVar7[7] + pfVar2[7] + pfVar1[7];
            auVar28 = vblendvps_avx(_local_720,auVar26,auVar152);
            auVar313 = vandps_avx(auVar322,auVar266);
            auVar152 = vandps_avx(auVar342,auVar266);
            auVar29 = vmaxps_avx(auVar313,auVar152);
            auVar313 = vandps_avx(auVar154,auVar266);
            auVar313 = vmaxps_avx(auVar29,auVar313);
            local_6e0._0_4_ = auVar126._0_4_;
            local_6e0._4_4_ = auVar126._4_4_;
            uStack_6d8._0_4_ = auVar126._8_4_;
            uStack_6d8._4_4_ = auVar126._12_4_;
            auStack_6d0._0_4_ = auVar126._16_4_;
            auStack_6d0._4_4_ = auVar126._20_4_;
            fStack_6c8 = auVar126._24_4_;
            auVar152 = vcmpps_avx(auVar313,_local_3a0,1);
            auVar313 = vblendvps_avx(auVar322,auVar158,auVar152);
            auVar155._0_4_ =
                 (float)local_1c0._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_360._0_4_ * (float)local_700._0_4_ +
                 (float)local_a0._0_4_ * (float)local_600._0_4_ + fVar274;
            auVar155._4_4_ =
                 (float)local_1c0._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_360._4_4_ * (float)local_700._4_4_ +
                 (float)local_a0._4_4_ * (float)local_600._4_4_ + fVar283;
            auVar155._8_4_ =
                 fStack_1b8 * (float)uStack_6d8 +
                 fStack_358 * fStack_6f8 + fStack_98 * fStack_5f8 + fVar284;
            auVar155._12_4_ =
                 fStack_1b4 * uStack_6d8._4_4_ +
                 fStack_354 * fStack_6f4 + fStack_94 * fStack_5f4 + fVar285;
            auVar155._16_4_ =
                 fStack_1b0 * (float)auStack_6d0._0_4_ +
                 fStack_350 * (float)auStack_6f0._0_4_ + fStack_90 * fStack_5f0 + fVar286;
            auVar155._20_4_ =
                 fStack_1ac * (float)auStack_6d0._4_4_ +
                 fStack_34c * (float)auStack_6f0._4_4_ + fStack_8c * fStack_5ec + fVar215;
            auVar155._24_4_ =
                 fStack_1a8 * fStack_6c8 +
                 fStack_348 * fStack_6e8 + fStack_88 * fStack_5e8 + fVar287;
            auVar155._28_4_ = auVar29._28_4_ + fStack_604 + auVar145._28_4_ + 0.0;
            auVar152 = vblendvps_avx(auVar342,auVar26,auVar152);
            fVar175 = auVar27._0_4_;
            fVar198 = auVar27._4_4_;
            fVar274 = auVar27._8_4_;
            fVar283 = auVar27._12_4_;
            fVar284 = auVar27._16_4_;
            fVar285 = auVar27._20_4_;
            fVar286 = auVar27._24_4_;
            fVar215 = auVar27._28_4_;
            fVar259 = auVar313._0_4_;
            fVar268 = auVar313._4_4_;
            fVar270 = auVar313._8_4_;
            fVar272 = auVar313._12_4_;
            fVar239 = auVar313._16_4_;
            fVar318 = auVar313._20_4_;
            fVar289 = auVar313._24_4_;
            fVar217 = auVar28._0_4_;
            fVar233 = auVar28._4_4_;
            fVar238 = auVar28._8_4_;
            fVar241 = auVar28._12_4_;
            fVar251 = auVar28._16_4_;
            fVar255 = auVar28._20_4_;
            fVar257 = auVar28._24_4_;
            auVar331._0_4_ = fVar217 * fVar217 + fVar175 * fVar175;
            auVar331._4_4_ = fVar233 * fVar233 + fVar198 * fVar198;
            auVar331._8_4_ = fVar238 * fVar238 + fVar274 * fVar274;
            auVar331._12_4_ = fVar241 * fVar241 + fVar283 * fVar283;
            auVar331._16_4_ = fVar251 * fVar251 + fVar284 * fVar284;
            auVar331._20_4_ = fVar255 * fVar255 + fVar285 * fVar285;
            auVar331._24_4_ = fVar257 * fVar257 + fVar286 * fVar286;
            auVar331._28_4_ = auVar158._28_4_ + auVar26._28_4_;
            auVar158 = vrsqrtps_avx(auVar331);
            fVar231 = auVar158._0_4_;
            fVar235 = auVar158._4_4_;
            auVar77._4_4_ = fVar235 * 1.5;
            auVar77._0_4_ = fVar231 * 1.5;
            fVar240 = auVar158._8_4_;
            auVar77._8_4_ = fVar240 * 1.5;
            fVar242 = auVar158._12_4_;
            auVar77._12_4_ = fVar242 * 1.5;
            fVar253 = auVar158._16_4_;
            auVar77._16_4_ = fVar253 * 1.5;
            fVar256 = auVar158._20_4_;
            auVar77._20_4_ = fVar256 * 1.5;
            fVar258 = auVar158._24_4_;
            auVar77._24_4_ = fVar258 * 1.5;
            auVar77._28_4_ = auVar342._28_4_;
            auVar78._4_4_ = fVar235 * fVar235 * fVar235 * auVar331._4_4_ * 0.5;
            auVar78._0_4_ = fVar231 * fVar231 * fVar231 * auVar331._0_4_ * 0.5;
            auVar78._8_4_ = fVar240 * fVar240 * fVar240 * auVar331._8_4_ * 0.5;
            auVar78._12_4_ = fVar242 * fVar242 * fVar242 * auVar331._12_4_ * 0.5;
            auVar78._16_4_ = fVar253 * fVar253 * fVar253 * auVar331._16_4_ * 0.5;
            auVar78._20_4_ = fVar256 * fVar256 * fVar256 * auVar331._20_4_ * 0.5;
            auVar78._24_4_ = fVar258 * fVar258 * fVar258 * auVar331._24_4_ * 0.5;
            auVar78._28_4_ = auVar331._28_4_;
            auVar26 = vsubps_avx(auVar77,auVar78);
            fVar168 = auVar26._0_4_;
            fVar170 = auVar26._4_4_;
            fVar172 = auVar26._8_4_;
            fVar197 = auVar26._12_4_;
            fVar273 = auVar26._16_4_;
            fVar288 = auVar26._20_4_;
            fVar237 = auVar26._24_4_;
            fVar231 = auVar152._0_4_;
            fVar235 = auVar152._4_4_;
            fVar240 = auVar152._8_4_;
            fVar242 = auVar152._12_4_;
            fVar253 = auVar152._16_4_;
            fVar256 = auVar152._20_4_;
            fVar258 = auVar152._24_4_;
            auVar314._0_4_ = fVar231 * fVar231 + fVar259 * fVar259;
            auVar314._4_4_ = fVar235 * fVar235 + fVar268 * fVar268;
            auVar314._8_4_ = fVar240 * fVar240 + fVar270 * fVar270;
            auVar314._12_4_ = fVar242 * fVar242 + fVar272 * fVar272;
            auVar314._16_4_ = fVar253 * fVar253 + fVar239 * fVar239;
            auVar314._20_4_ = fVar256 * fVar256 + fVar318 * fVar318;
            auVar314._24_4_ = fVar258 * fVar258 + fVar289 * fVar289;
            auVar314._28_4_ = auVar158._28_4_ + auVar313._28_4_;
            auVar158 = vrsqrtps_avx(auVar314);
            fVar267 = auVar158._0_4_;
            fVar269 = auVar158._4_4_;
            auVar79._4_4_ = fVar269 * 1.5;
            auVar79._0_4_ = fVar267 * 1.5;
            fVar271 = auVar158._8_4_;
            auVar79._8_4_ = fVar271 * 1.5;
            fVar317 = auVar158._12_4_;
            auVar79._12_4_ = fVar317 * 1.5;
            fVar334 = auVar158._16_4_;
            auVar79._16_4_ = fVar334 * 1.5;
            fVar216 = auVar158._20_4_;
            auVar79._20_4_ = fVar216 * 1.5;
            fVar166 = auVar158._24_4_;
            auVar79._24_4_ = fVar166 * 1.5;
            auVar79._28_4_ = auVar342._28_4_;
            auVar80._4_4_ = fVar269 * fVar269 * fVar269 * auVar314._4_4_ * 0.5;
            auVar80._0_4_ = fVar267 * fVar267 * fVar267 * auVar314._0_4_ * 0.5;
            auVar80._8_4_ = fVar271 * fVar271 * fVar271 * auVar314._8_4_ * 0.5;
            auVar80._12_4_ = fVar317 * fVar317 * fVar317 * auVar314._12_4_ * 0.5;
            auVar80._16_4_ = fVar334 * fVar334 * fVar334 * auVar314._16_4_ * 0.5;
            auVar80._20_4_ = fVar216 * fVar216 * fVar216 * auVar314._20_4_ * 0.5;
            auVar80._24_4_ = fVar166 * fVar166 * fVar166 * auVar314._24_4_ * 0.5;
            auVar80._28_4_ = auVar314._28_4_;
            auVar26 = vsubps_avx(auVar79,auVar80);
            fVar267 = auVar26._0_4_;
            fVar269 = auVar26._4_4_;
            fVar271 = auVar26._8_4_;
            fVar317 = auVar26._12_4_;
            fVar334 = auVar26._16_4_;
            fVar216 = auVar26._20_4_;
            fVar166 = auVar26._24_4_;
            fVar217 = fVar142 * fVar168 * fVar217;
            fVar233 = fVar162 * fVar170 * fVar233;
            auVar81._4_4_ = fVar233;
            auVar81._0_4_ = fVar217;
            fVar238 = fVar164 * fVar172 * fVar238;
            auVar81._8_4_ = fVar238;
            fVar241 = fVar167 * fVar197 * fVar241;
            auVar81._12_4_ = fVar241;
            fVar251 = fVar169 * fVar273 * fVar251;
            auVar81._16_4_ = fVar251;
            fVar255 = fVar171 * fVar288 * fVar255;
            auVar81._20_4_ = fVar255;
            fVar257 = fVar173 * fVar237 * fVar257;
            auVar81._24_4_ = fVar257;
            auVar81._28_4_ = auVar158._28_4_;
            local_6e0._4_4_ = fVar233 + auVar213._4_4_;
            local_6e0._0_4_ = fVar217 + auVar213._0_4_;
            uStack_6d8._0_4_ = fVar238 + auVar213._8_4_;
            uStack_6d8._4_4_ = fVar241 + auVar213._12_4_;
            auStack_6d0._0_4_ = fVar251 + auVar213._16_4_;
            auStack_6d0._4_4_ = fVar255 + auVar213._20_4_;
            fStack_6c8 = fVar257 + auVar213._24_4_;
            fStack_6c4 = auVar158._28_4_ + auVar213._28_4_;
            fVar217 = fVar142 * fVar168 * -fVar175;
            fVar233 = fVar162 * fVar170 * -fVar198;
            auVar82._4_4_ = fVar233;
            auVar82._0_4_ = fVar217;
            fVar238 = fVar164 * fVar172 * -fVar274;
            auVar82._8_4_ = fVar238;
            fVar241 = fVar167 * fVar197 * -fVar283;
            auVar82._12_4_ = fVar241;
            fVar251 = fVar169 * fVar273 * -fVar284;
            auVar82._16_4_ = fVar251;
            fVar255 = fVar171 * fVar288 * -fVar285;
            auVar82._20_4_ = fVar255;
            fVar257 = fVar173 * fVar237 * -fVar286;
            auVar82._24_4_ = fVar257;
            auVar82._28_4_ = -fVar215;
            local_600._4_4_ = local_6c0._4_4_ + fVar233;
            local_600._0_4_ = local_6c0._0_4_ + fVar217;
            fStack_5f8 = local_6c0._8_4_ + fVar238;
            fStack_5f4 = local_6c0._12_4_ + fVar241;
            fStack_5f0 = local_6c0._16_4_ + fVar251;
            fStack_5ec = local_6c0._20_4_ + fVar255;
            fStack_5e8 = local_6c0._24_4_ + fVar257;
            fStack_5e4 = local_6c0._28_4_ + -fVar215;
            fVar217 = fVar168 * 0.0 * fVar142;
            fVar233 = fVar170 * 0.0 * fVar162;
            auVar83._4_4_ = fVar233;
            auVar83._0_4_ = fVar217;
            fVar238 = fVar172 * 0.0 * fVar164;
            auVar83._8_4_ = fVar238;
            fVar241 = fVar197 * 0.0 * fVar167;
            auVar83._12_4_ = fVar241;
            fVar251 = fVar273 * 0.0 * fVar169;
            auVar83._16_4_ = fVar251;
            fVar255 = fVar288 * 0.0 * fVar171;
            auVar83._20_4_ = fVar255;
            fVar257 = fVar237 * 0.0 * fVar173;
            auVar83._24_4_ = fVar257;
            auVar83._28_4_ = fVar215;
            auVar29 = vsubps_avx(auVar213,auVar81);
            auVar367._0_4_ = fVar217 + auVar155._0_4_;
            auVar367._4_4_ = fVar233 + auVar155._4_4_;
            auVar367._8_4_ = fVar238 + auVar155._8_4_;
            auVar367._12_4_ = fVar241 + auVar155._12_4_;
            auVar367._16_4_ = fVar251 + auVar155._16_4_;
            auVar367._20_4_ = fVar255 + auVar155._20_4_;
            auVar367._24_4_ = fVar257 + auVar155._24_4_;
            auVar367._28_4_ = fVar215 + auVar155._28_4_;
            fVar217 = auVar302._0_4_ * fVar267 * fVar231;
            fVar231 = auVar302._4_4_ * fVar269 * fVar235;
            auVar84._4_4_ = fVar231;
            auVar84._0_4_ = fVar217;
            fVar233 = auVar302._8_4_ * fVar271 * fVar240;
            auVar84._8_4_ = fVar233;
            fVar235 = auVar302._12_4_ * fVar317 * fVar242;
            auVar84._12_4_ = fVar235;
            fVar238 = auVar302._16_4_ * fVar334 * fVar253;
            auVar84._16_4_ = fVar238;
            fVar240 = auVar302._20_4_ * fVar216 * fVar256;
            auVar84._20_4_ = fVar240;
            fVar241 = auVar302._24_4_ * fVar166 * fVar258;
            auVar84._24_4_ = fVar241;
            auVar84._28_4_ = fVar174;
            auVar146 = vsubps_avx(local_6c0,auVar82);
            auVar349._0_4_ = (float)local_380._0_4_ + fVar217;
            auVar349._4_4_ = (float)local_380._4_4_ + fVar231;
            auVar349._8_4_ = fStack_378 + fVar233;
            auVar349._12_4_ = fStack_374 + fVar235;
            auVar349._16_4_ = fStack_370 + fVar238;
            auVar349._20_4_ = fStack_36c + fVar240;
            auVar349._24_4_ = fStack_368 + fVar241;
            auVar349._28_4_ = register0x0000141c + fVar174;
            fVar217 = fVar267 * -fVar259 * auVar302._0_4_;
            fVar231 = fVar269 * -fVar268 * auVar302._4_4_;
            auVar85._4_4_ = fVar231;
            auVar85._0_4_ = fVar217;
            fVar233 = fVar271 * -fVar270 * auVar302._8_4_;
            auVar85._8_4_ = fVar233;
            fVar235 = fVar317 * -fVar272 * auVar302._12_4_;
            auVar85._12_4_ = fVar235;
            fVar238 = fVar334 * -fVar239 * auVar302._16_4_;
            auVar85._16_4_ = fVar238;
            fVar240 = fVar216 * -fVar318 * auVar302._20_4_;
            auVar85._20_4_ = fVar240;
            fVar241 = fVar166 * -fVar289 * auVar302._24_4_;
            auVar85._24_4_ = fVar241;
            auVar85._28_4_ = auVar213._28_4_;
            auVar147 = vsubps_avx(auVar155,auVar83);
            auVar249._0_4_ = local_640._0_4_ + fVar217;
            auVar249._4_4_ = local_640._4_4_ + fVar231;
            auVar249._8_4_ = local_640._8_4_ + fVar233;
            auVar249._12_4_ = local_640._12_4_ + fVar235;
            auVar249._16_4_ = local_640._16_4_ + fVar238;
            auVar249._20_4_ = local_640._20_4_ + fVar240;
            auVar249._24_4_ = local_640._24_4_ + fVar241;
            auVar249._28_4_ = local_640._28_4_ + auVar213._28_4_;
            fVar217 = fVar267 * 0.0 * auVar302._0_4_;
            fVar231 = fVar269 * 0.0 * auVar302._4_4_;
            auVar86._4_4_ = fVar231;
            auVar86._0_4_ = fVar217;
            fVar233 = fVar271 * 0.0 * auVar302._8_4_;
            auVar86._8_4_ = fVar233;
            fVar235 = fVar317 * 0.0 * auVar302._12_4_;
            auVar86._12_4_ = fVar235;
            fVar238 = fVar334 * 0.0 * auVar302._16_4_;
            auVar86._16_4_ = fVar238;
            fVar240 = fVar216 * 0.0 * auVar302._20_4_;
            auVar86._20_4_ = fVar240;
            fVar241 = fVar166 * 0.0 * auVar302._24_4_;
            auVar86._24_4_ = fVar241;
            auVar86._28_4_ = auVar155._28_4_;
            auVar158 = vsubps_avx(_local_380,auVar84);
            auVar120._4_4_ = fStack_61c;
            auVar120._0_4_ = local_620;
            auVar120._8_4_ = fStack_618;
            auVar120._12_4_ = fStack_614;
            auVar120._16_4_ = fStack_610;
            auVar120._20_4_ = fStack_60c;
            auVar120._24_4_ = fStack_608;
            auVar120._28_4_ = fStack_604;
            auVar323._0_4_ = local_620 + fVar217;
            auVar323._4_4_ = fStack_61c + fVar231;
            auVar323._8_4_ = fStack_618 + fVar233;
            auVar323._12_4_ = fStack_614 + fVar235;
            auVar323._16_4_ = fStack_610 + fVar238;
            auVar323._20_4_ = fStack_60c + fVar240;
            auVar323._24_4_ = fStack_608 + fVar241;
            auVar323._28_4_ = fStack_604 + auVar155._28_4_;
            auVar313 = vsubps_avx(local_640,auVar85);
            auVar152 = vsubps_avx(auVar120,auVar86);
            auVar27 = vsubps_avx(auVar249,auVar146);
            auVar28 = vsubps_avx(auVar323,auVar147);
            auVar87._4_4_ = auVar147._4_4_ * auVar27._4_4_;
            auVar87._0_4_ = auVar147._0_4_ * auVar27._0_4_;
            auVar87._8_4_ = auVar147._8_4_ * auVar27._8_4_;
            auVar87._12_4_ = auVar147._12_4_ * auVar27._12_4_;
            auVar87._16_4_ = auVar147._16_4_ * auVar27._16_4_;
            auVar87._20_4_ = auVar147._20_4_ * auVar27._20_4_;
            auVar87._24_4_ = auVar147._24_4_ * auVar27._24_4_;
            auVar87._28_4_ = auVar342._28_4_;
            auVar88._4_4_ = auVar146._4_4_ * auVar28._4_4_;
            auVar88._0_4_ = auVar146._0_4_ * auVar28._0_4_;
            auVar88._8_4_ = auVar146._8_4_ * auVar28._8_4_;
            auVar88._12_4_ = auVar146._12_4_ * auVar28._12_4_;
            auVar88._16_4_ = auVar146._16_4_ * auVar28._16_4_;
            auVar88._20_4_ = auVar146._20_4_ * auVar28._20_4_;
            auVar88._24_4_ = auVar146._24_4_ * auVar28._24_4_;
            auVar88._28_4_ = local_640._28_4_;
            auVar30 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar29._4_4_ * auVar28._4_4_;
            auVar89._0_4_ = auVar29._0_4_ * auVar28._0_4_;
            auVar89._8_4_ = auVar29._8_4_ * auVar28._8_4_;
            auVar89._12_4_ = auVar29._12_4_ * auVar28._12_4_;
            auVar89._16_4_ = auVar29._16_4_ * auVar28._16_4_;
            auVar89._20_4_ = auVar29._20_4_ * auVar28._20_4_;
            auVar89._24_4_ = auVar29._24_4_ * auVar28._24_4_;
            auVar89._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar349,auVar29);
            auVar90._4_4_ = auVar147._4_4_ * auVar28._4_4_;
            auVar90._0_4_ = auVar147._0_4_ * auVar28._0_4_;
            auVar90._8_4_ = auVar147._8_4_ * auVar28._8_4_;
            auVar90._12_4_ = auVar147._12_4_ * auVar28._12_4_;
            auVar90._16_4_ = auVar147._16_4_ * auVar28._16_4_;
            auVar90._20_4_ = auVar147._20_4_ * auVar28._20_4_;
            auVar90._24_4_ = auVar147._24_4_ * auVar28._24_4_;
            auVar90._28_4_ = auVar26._28_4_;
            auVar31 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = auVar146._4_4_ * auVar28._4_4_;
            auVar91._0_4_ = auVar146._0_4_ * auVar28._0_4_;
            auVar91._8_4_ = auVar146._8_4_ * auVar28._8_4_;
            auVar91._12_4_ = auVar146._12_4_ * auVar28._12_4_;
            auVar91._16_4_ = auVar146._16_4_ * auVar28._16_4_;
            auVar91._20_4_ = auVar146._20_4_ * auVar28._20_4_;
            auVar91._24_4_ = auVar146._24_4_ * auVar28._24_4_;
            auVar91._28_4_ = auVar26._28_4_;
            auVar92._4_4_ = auVar29._4_4_ * auVar27._4_4_;
            auVar92._0_4_ = auVar29._0_4_ * auVar27._0_4_;
            auVar92._8_4_ = auVar29._8_4_ * auVar27._8_4_;
            auVar92._12_4_ = auVar29._12_4_ * auVar27._12_4_;
            auVar92._16_4_ = auVar29._16_4_ * auVar27._16_4_;
            auVar92._20_4_ = auVar29._20_4_ * auVar27._20_4_;
            auVar92._24_4_ = auVar29._24_4_ * auVar27._24_4_;
            auVar92._28_4_ = auVar27._28_4_;
            auVar26 = vsubps_avx(auVar92,auVar91);
            auVar190._0_4_ = auVar30._0_4_ * 0.0 + auVar26._0_4_ + auVar31._0_4_ * 0.0;
            auVar190._4_4_ = auVar30._4_4_ * 0.0 + auVar26._4_4_ + auVar31._4_4_ * 0.0;
            auVar190._8_4_ = auVar30._8_4_ * 0.0 + auVar26._8_4_ + auVar31._8_4_ * 0.0;
            auVar190._12_4_ = auVar30._12_4_ * 0.0 + auVar26._12_4_ + auVar31._12_4_ * 0.0;
            auVar190._16_4_ = auVar30._16_4_ * 0.0 + auVar26._16_4_ + auVar31._16_4_ * 0.0;
            auVar190._20_4_ = auVar30._20_4_ * 0.0 + auVar26._20_4_ + auVar31._20_4_ * 0.0;
            auVar190._24_4_ = auVar30._24_4_ * 0.0 + auVar26._24_4_ + auVar31._24_4_ * 0.0;
            auVar190._28_4_ = auVar30._28_4_ + auVar26._28_4_ + auVar31._28_4_;
            auVar25 = vcmpps_avx(auVar190,ZEXT832(0) << 0x20,2);
            auVar158 = vblendvps_avx(auVar158,_local_6e0,auVar25);
            auVar26 = vblendvps_avx(auVar313,_local_600,auVar25);
            auVar313 = vblendvps_avx(auVar152,auVar367,auVar25);
            auVar152 = vblendvps_avx(auVar29,auVar349,auVar25);
            auVar27 = vblendvps_avx(auVar146,auVar249,auVar25);
            auVar28 = vblendvps_avx(auVar147,auVar323,auVar25);
            auVar29 = vblendvps_avx(auVar349,auVar29,auVar25);
            auVar30 = vblendvps_avx(auVar249,auVar146,auVar25);
            auVar31 = vblendvps_avx(auVar323,auVar147,auVar25);
            auVar145 = vandps_avx(auVar214,auVar145);
            auVar29 = vsubps_avx(auVar29,auVar158);
            auVar183 = vsubps_avx(auVar30,auVar26);
            auVar31 = vsubps_avx(auVar31,auVar313);
            auVar184 = vsubps_avx(auVar26,auVar27);
            fVar217 = auVar183._0_4_;
            fVar292 = auVar313._0_4_;
            fVar242 = auVar183._4_4_;
            fVar305 = auVar313._4_4_;
            auVar93._4_4_ = fVar305 * fVar242;
            auVar93._0_4_ = fVar292 * fVar217;
            fVar259 = auVar183._8_4_;
            fVar307 = auVar313._8_4_;
            auVar93._8_4_ = fVar307 * fVar259;
            fVar317 = auVar183._12_4_;
            fVar309 = auVar313._12_4_;
            auVar93._12_4_ = fVar309 * fVar317;
            fVar168 = auVar183._16_4_;
            fVar141 = auVar313._16_4_;
            auVar93._16_4_ = fVar141 * fVar168;
            fVar175 = auVar183._20_4_;
            fVar161 = auVar313._20_4_;
            auVar93._20_4_ = fVar161 * fVar175;
            fVar215 = auVar183._24_4_;
            fVar163 = auVar313._24_4_;
            auVar93._24_4_ = fVar163 * fVar215;
            auVar93._28_4_ = auVar30._28_4_;
            fVar231 = auVar26._0_4_;
            fVar165 = auVar31._0_4_;
            fVar251 = auVar26._4_4_;
            fVar176 = auVar31._4_4_;
            auVar94._4_4_ = fVar176 * fVar251;
            auVar94._0_4_ = fVar165 * fVar231;
            fVar267 = auVar26._8_4_;
            fVar194 = auVar31._8_4_;
            auVar94._8_4_ = fVar194 * fVar267;
            fVar239 = auVar26._12_4_;
            fVar195 = auVar31._12_4_;
            auVar94._12_4_ = fVar195 * fVar239;
            fVar170 = auVar26._16_4_;
            fVar196 = auVar31._16_4_;
            auVar94._16_4_ = fVar196 * fVar170;
            fVar198 = auVar26._20_4_;
            fVar218 = auVar31._20_4_;
            auVar94._20_4_ = fVar218 * fVar198;
            fVar287 = auVar26._24_4_;
            fVar232 = auVar31._24_4_;
            uVar9 = auVar146._28_4_;
            auVar94._24_4_ = fVar232 * fVar287;
            auVar94._28_4_ = uVar9;
            auVar30 = vsubps_avx(auVar94,auVar93);
            fVar233 = auVar158._0_4_;
            fVar253 = auVar158._4_4_;
            auVar95._4_4_ = fVar176 * fVar253;
            auVar95._0_4_ = fVar165 * fVar233;
            fVar268 = auVar158._8_4_;
            auVar95._8_4_ = fVar194 * fVar268;
            fVar334 = auVar158._12_4_;
            auVar95._12_4_ = fVar195 * fVar334;
            fVar172 = auVar158._16_4_;
            auVar95._16_4_ = fVar196 * fVar172;
            fVar274 = auVar158._20_4_;
            auVar95._20_4_ = fVar218 * fVar274;
            fVar290 = auVar158._24_4_;
            auVar95._24_4_ = fVar232 * fVar290;
            auVar95._28_4_ = uVar9;
            fVar235 = auVar29._0_4_;
            fVar255 = auVar29._4_4_;
            auVar96._4_4_ = fVar305 * fVar255;
            auVar96._0_4_ = fVar292 * fVar235;
            fVar269 = auVar29._8_4_;
            auVar96._8_4_ = fVar307 * fVar269;
            fVar318 = auVar29._12_4_;
            auVar96._12_4_ = fVar309 * fVar318;
            fVar197 = auVar29._16_4_;
            auVar96._16_4_ = fVar141 * fVar197;
            fVar283 = auVar29._20_4_;
            auVar96._20_4_ = fVar161 * fVar283;
            fVar324 = auVar29._24_4_;
            auVar96._24_4_ = fVar163 * fVar324;
            auVar96._28_4_ = auVar349._28_4_;
            auVar146 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar251 * fVar255;
            auVar97._0_4_ = fVar231 * fVar235;
            auVar97._8_4_ = fVar267 * fVar269;
            auVar97._12_4_ = fVar239 * fVar318;
            auVar97._16_4_ = fVar170 * fVar197;
            auVar97._20_4_ = fVar198 * fVar283;
            auVar97._24_4_ = fVar287 * fVar324;
            auVar97._28_4_ = uVar9;
            auVar98._4_4_ = fVar253 * fVar242;
            auVar98._0_4_ = fVar233 * fVar217;
            auVar98._8_4_ = fVar268 * fVar259;
            auVar98._12_4_ = fVar334 * fVar317;
            auVar98._16_4_ = fVar172 * fVar168;
            auVar98._20_4_ = fVar274 * fVar175;
            auVar98._24_4_ = fVar290 * fVar215;
            auVar98._28_4_ = auVar147._28_4_;
            auVar147 = vsubps_avx(auVar98,auVar97);
            auVar313 = vsubps_avx(auVar313,auVar28);
            fVar240 = auVar147._28_4_ + auVar146._28_4_;
            auVar332._0_4_ = auVar147._0_4_ + auVar146._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
            auVar332._4_4_ = auVar147._4_4_ + auVar146._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
            auVar332._8_4_ = auVar147._8_4_ + auVar146._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
            auVar332._12_4_ = auVar147._12_4_ + auVar146._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
            auVar332._16_4_ = auVar147._16_4_ + auVar146._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
            auVar332._20_4_ = auVar147._20_4_ + auVar146._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
            auVar332._24_4_ = auVar147._24_4_ + auVar146._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
            auVar332._28_4_ = fVar240 + auVar30._28_4_;
            fVar238 = auVar184._0_4_;
            fVar256 = auVar184._4_4_;
            auVar99._4_4_ = auVar28._4_4_ * fVar256;
            auVar99._0_4_ = auVar28._0_4_ * fVar238;
            fVar270 = auVar184._8_4_;
            auVar99._8_4_ = auVar28._8_4_ * fVar270;
            fVar216 = auVar184._12_4_;
            auVar99._12_4_ = auVar28._12_4_ * fVar216;
            fVar273 = auVar184._16_4_;
            auVar99._16_4_ = auVar28._16_4_ * fVar273;
            fVar284 = auVar184._20_4_;
            auVar99._20_4_ = auVar28._20_4_ * fVar284;
            fVar325 = auVar184._24_4_;
            auVar99._24_4_ = auVar28._24_4_ * fVar325;
            auVar99._28_4_ = fVar240;
            fVar240 = auVar313._0_4_;
            fVar257 = auVar313._4_4_;
            auVar100._4_4_ = auVar27._4_4_ * fVar257;
            auVar100._0_4_ = auVar27._0_4_ * fVar240;
            fVar271 = auVar313._8_4_;
            auVar100._8_4_ = auVar27._8_4_ * fVar271;
            fVar289 = auVar313._12_4_;
            auVar100._12_4_ = auVar27._12_4_ * fVar289;
            fVar288 = auVar313._16_4_;
            auVar100._16_4_ = auVar27._16_4_ * fVar288;
            fVar285 = auVar313._20_4_;
            auVar100._20_4_ = auVar27._20_4_ * fVar285;
            fVar326 = auVar313._24_4_;
            auVar100._24_4_ = auVar27._24_4_ * fVar326;
            auVar100._28_4_ = auVar147._28_4_;
            auVar146 = vsubps_avx(auVar100,auVar99);
            auVar158 = vsubps_avx(auVar158,auVar152);
            fVar241 = auVar158._0_4_;
            fVar258 = auVar158._4_4_;
            auVar101._4_4_ = auVar28._4_4_ * fVar258;
            auVar101._0_4_ = auVar28._0_4_ * fVar241;
            fVar272 = auVar158._8_4_;
            auVar101._8_4_ = auVar28._8_4_ * fVar272;
            fVar166 = auVar158._12_4_;
            auVar101._12_4_ = auVar28._12_4_ * fVar166;
            fVar237 = auVar158._16_4_;
            auVar101._16_4_ = auVar28._16_4_ * fVar237;
            fVar286 = auVar158._20_4_;
            auVar101._20_4_ = auVar28._20_4_ * fVar286;
            fVar327 = auVar158._24_4_;
            auVar101._24_4_ = auVar28._24_4_ * fVar327;
            auVar101._28_4_ = auVar28._28_4_;
            auVar102._4_4_ = fVar257 * auVar152._4_4_;
            auVar102._0_4_ = fVar240 * auVar152._0_4_;
            auVar102._8_4_ = fVar271 * auVar152._8_4_;
            auVar102._12_4_ = fVar289 * auVar152._12_4_;
            auVar102._16_4_ = fVar288 * auVar152._16_4_;
            auVar102._20_4_ = fVar285 * auVar152._20_4_;
            auVar102._24_4_ = fVar326 * auVar152._24_4_;
            auVar102._28_4_ = auVar30._28_4_;
            auVar158 = vsubps_avx(auVar101,auVar102);
            auVar103._4_4_ = auVar27._4_4_ * fVar258;
            auVar103._0_4_ = auVar27._0_4_ * fVar241;
            auVar103._8_4_ = auVar27._8_4_ * fVar272;
            auVar103._12_4_ = auVar27._12_4_ * fVar166;
            auVar103._16_4_ = auVar27._16_4_ * fVar237;
            auVar103._20_4_ = auVar27._20_4_ * fVar286;
            auVar103._24_4_ = auVar27._24_4_ * fVar327;
            auVar103._28_4_ = auVar27._28_4_;
            auVar104._4_4_ = fVar256 * auVar152._4_4_;
            auVar104._0_4_ = fVar238 * auVar152._0_4_;
            auVar104._8_4_ = fVar270 * auVar152._8_4_;
            auVar104._12_4_ = fVar216 * auVar152._12_4_;
            auVar104._16_4_ = fVar273 * auVar152._16_4_;
            auVar104._20_4_ = fVar284 * auVar152._20_4_;
            auVar104._24_4_ = fVar325 * auVar152._24_4_;
            auVar104._28_4_ = auVar152._28_4_;
            auVar152 = vsubps_avx(auVar104,auVar103);
            auVar156._0_4_ = auVar146._0_4_ * 0.0 + auVar152._0_4_ + auVar158._0_4_ * 0.0;
            auVar156._4_4_ = auVar146._4_4_ * 0.0 + auVar152._4_4_ + auVar158._4_4_ * 0.0;
            auVar156._8_4_ = auVar146._8_4_ * 0.0 + auVar152._8_4_ + auVar158._8_4_ * 0.0;
            auVar156._12_4_ = auVar146._12_4_ * 0.0 + auVar152._12_4_ + auVar158._12_4_ * 0.0;
            auVar156._16_4_ = auVar146._16_4_ * 0.0 + auVar152._16_4_ + auVar158._16_4_ * 0.0;
            auVar156._20_4_ = auVar146._20_4_ * 0.0 + auVar152._20_4_ + auVar158._20_4_ * 0.0;
            auVar156._24_4_ = auVar146._24_4_ * 0.0 + auVar152._24_4_ + auVar158._24_4_ * 0.0;
            auVar156._28_4_ = auVar158._28_4_ + auVar152._28_4_ + auVar158._28_4_;
            auVar160 = ZEXT3264(auVar156);
            auVar158 = vmaxps_avx(auVar332,auVar156);
            auVar158 = vcmpps_avx(auVar158,ZEXT832(0) << 0x20,2);
            auVar250 = ZEXT3264(auVar145);
            auVar152 = auVar145 & auVar158;
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar152 >> 0x7f,0) == '\0') &&
                  (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar152 >> 0xbf,0) == '\0') &&
                (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar152[0x1f]) {
LAB_01057999:
              auVar230 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                            CONCAT816(local_5c0[1]._16_8_,
                                                      CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_
                                                              ))));
              auVar338._4_4_ = fVar162;
              auVar338._0_4_ = fVar142;
              auVar338._8_4_ = fVar164;
              auVar338._12_4_ = fVar167;
              auVar338._16_4_ = fVar169;
              auVar338._20_4_ = fVar171;
              auVar338._24_4_ = fVar173;
              auVar338._28_4_ = fVar174;
            }
            else {
              auVar152 = vandps_avx(auVar158,auVar145);
              auVar105._4_4_ = fVar257 * fVar242;
              auVar105._0_4_ = fVar240 * fVar217;
              auVar105._8_4_ = fVar271 * fVar259;
              auVar105._12_4_ = fVar289 * fVar317;
              auVar105._16_4_ = fVar288 * fVar168;
              auVar105._20_4_ = fVar285 * fVar175;
              auVar105._24_4_ = fVar326 * fVar215;
              auVar105._28_4_ = auVar145._28_4_;
              auVar106._4_4_ = fVar256 * fVar176;
              auVar106._0_4_ = fVar238 * fVar165;
              auVar106._8_4_ = fVar270 * fVar194;
              auVar106._12_4_ = fVar216 * fVar195;
              auVar106._16_4_ = fVar273 * fVar196;
              auVar106._20_4_ = fVar284 * fVar218;
              auVar106._24_4_ = fVar325 * fVar232;
              auVar106._28_4_ = auVar158._28_4_;
              auVar158 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar258 * fVar176;
              auVar107._0_4_ = fVar241 * fVar165;
              auVar107._8_4_ = fVar272 * fVar194;
              auVar107._12_4_ = fVar166 * fVar195;
              auVar107._16_4_ = fVar237 * fVar196;
              auVar107._20_4_ = fVar286 * fVar218;
              auVar107._24_4_ = fVar327 * fVar232;
              auVar107._28_4_ = auVar31._28_4_;
              auVar108._4_4_ = fVar257 * fVar255;
              auVar108._0_4_ = fVar240 * fVar235;
              auVar108._8_4_ = fVar271 * fVar269;
              auVar108._12_4_ = fVar289 * fVar318;
              auVar108._16_4_ = fVar288 * fVar197;
              auVar108._20_4_ = fVar285 * fVar283;
              auVar108._24_4_ = fVar326 * fVar324;
              auVar108._28_4_ = auVar313._28_4_;
              auVar27 = vsubps_avx(auVar108,auVar107);
              auVar109._4_4_ = fVar256 * fVar255;
              auVar109._0_4_ = fVar238 * fVar235;
              auVar109._8_4_ = fVar270 * fVar269;
              auVar109._12_4_ = fVar216 * fVar318;
              auVar109._16_4_ = fVar273 * fVar197;
              auVar109._20_4_ = fVar284 * fVar283;
              auVar109._24_4_ = fVar325 * fVar324;
              auVar109._28_4_ = auVar29._28_4_;
              auVar110._4_4_ = fVar258 * fVar242;
              auVar110._0_4_ = fVar241 * fVar217;
              auVar110._8_4_ = fVar272 * fVar259;
              auVar110._12_4_ = fVar166 * fVar317;
              auVar110._16_4_ = fVar237 * fVar168;
              auVar110._20_4_ = fVar286 * fVar175;
              auVar110._24_4_ = fVar327 * fVar215;
              auVar110._28_4_ = auVar183._28_4_;
              auVar28 = vsubps_avx(auVar110,auVar109);
              auVar315._0_4_ = auVar158._0_4_ * 0.0 + auVar28._0_4_ + auVar27._0_4_ * 0.0;
              auVar315._4_4_ = auVar158._4_4_ * 0.0 + auVar28._4_4_ + auVar27._4_4_ * 0.0;
              auVar315._8_4_ = auVar158._8_4_ * 0.0 + auVar28._8_4_ + auVar27._8_4_ * 0.0;
              auVar315._12_4_ = auVar158._12_4_ * 0.0 + auVar28._12_4_ + auVar27._12_4_ * 0.0;
              auVar315._16_4_ = auVar158._16_4_ * 0.0 + auVar28._16_4_ + auVar27._16_4_ * 0.0;
              auVar315._20_4_ = auVar158._20_4_ * 0.0 + auVar28._20_4_ + auVar27._20_4_ * 0.0;
              auVar315._24_4_ = auVar158._24_4_ * 0.0 + auVar28._24_4_ + auVar27._24_4_ * 0.0;
              auVar315._28_4_ = auVar184._28_4_ + auVar28._28_4_ + auVar29._28_4_;
              auVar145 = vrcpps_avx(auVar315);
              fVar217 = auVar145._0_4_;
              fVar235 = auVar145._4_4_;
              auVar111._4_4_ = auVar315._4_4_ * fVar235;
              auVar111._0_4_ = auVar315._0_4_ * fVar217;
              fVar238 = auVar145._8_4_;
              auVar111._8_4_ = auVar315._8_4_ * fVar238;
              fVar240 = auVar145._12_4_;
              auVar111._12_4_ = auVar315._12_4_ * fVar240;
              fVar241 = auVar145._16_4_;
              auVar111._16_4_ = auVar315._16_4_ * fVar241;
              fVar242 = auVar145._20_4_;
              auVar111._20_4_ = auVar315._20_4_ * fVar242;
              fVar255 = auVar145._24_4_;
              auVar111._24_4_ = auVar315._24_4_ * fVar255;
              auVar111._28_4_ = auVar313._28_4_;
              auVar343._8_4_ = 0x3f800000;
              auVar343._0_8_ = 0x3f8000003f800000;
              auVar343._12_4_ = 0x3f800000;
              auVar343._16_4_ = 0x3f800000;
              auVar343._20_4_ = 0x3f800000;
              auVar343._24_4_ = 0x3f800000;
              auVar343._28_4_ = 0x3f800000;
              auVar145 = vsubps_avx(auVar343,auVar111);
              fVar217 = auVar145._0_4_ * fVar217 + fVar217;
              fVar235 = auVar145._4_4_ * fVar235 + fVar235;
              fVar238 = auVar145._8_4_ * fVar238 + fVar238;
              fVar240 = auVar145._12_4_ * fVar240 + fVar240;
              fVar241 = auVar145._16_4_ * fVar241 + fVar241;
              fVar242 = auVar145._20_4_ * fVar242 + fVar242;
              fVar255 = auVar145._24_4_ * fVar255 + fVar255;
              auVar112._4_4_ =
                   (fVar253 * auVar158._4_4_ + auVar27._4_4_ * fVar251 + fVar305 * auVar28._4_4_) *
                   fVar235;
              auVar112._0_4_ =
                   (fVar233 * auVar158._0_4_ + auVar27._0_4_ * fVar231 + fVar292 * auVar28._0_4_) *
                   fVar217;
              auVar112._8_4_ =
                   (fVar268 * auVar158._8_4_ + auVar27._8_4_ * fVar267 + fVar307 * auVar28._8_4_) *
                   fVar238;
              auVar112._12_4_ =
                   (fVar334 * auVar158._12_4_ + auVar27._12_4_ * fVar239 + fVar309 * auVar28._12_4_)
                   * fVar240;
              auVar112._16_4_ =
                   (fVar172 * auVar158._16_4_ + auVar27._16_4_ * fVar170 + fVar141 * auVar28._16_4_)
                   * fVar241;
              auVar112._20_4_ =
                   (fVar274 * auVar158._20_4_ + auVar27._20_4_ * fVar198 + fVar161 * auVar28._20_4_)
                   * fVar242;
              auVar112._24_4_ =
                   (fVar290 * auVar158._24_4_ + auVar27._24_4_ * fVar287 + fVar163 * auVar28._24_4_)
                   * fVar255;
              auVar112._28_4_ = auVar26._28_4_ + auVar28._28_4_;
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar229._4_4_ = uVar9;
              auVar229._0_4_ = uVar9;
              auVar229._8_4_ = uVar9;
              auVar229._12_4_ = uVar9;
              auVar229._16_4_ = uVar9;
              auVar229._20_4_ = uVar9;
              auVar229._24_4_ = uVar9;
              auVar229._28_4_ = uVar9;
              auVar158 = vcmpps_avx(local_c0,auVar112,2);
              auVar250 = ZEXT3264(auVar158);
              auVar145 = vcmpps_avx(auVar112,auVar229,2);
              auVar145 = vandps_avx(auVar158,auVar145);
              auVar26 = auVar152 & auVar145;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0x7f,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0xbf,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar26[0x1f]) goto LAB_01057999;
              auVar145 = vandps_avx(auVar152,auVar145);
              auVar26 = vcmpps_avx(auVar315,ZEXT832(0) << 0x20,4);
              auVar313 = auVar145 & auVar26;
              auVar230 = ZEXT3264(CONCAT824(local_5c0[1]._24_8_,
                                            CONCAT816(local_5c0[1]._16_8_,
                                                      CONCAT88(local_5c0[1]._8_8_,local_5c0[1]._0_8_
                                                              ))));
              auVar338._4_4_ = fVar162;
              auVar338._0_4_ = fVar142;
              auVar338._8_4_ = fVar164;
              auVar338._12_4_ = fVar167;
              auVar338._16_4_ = fVar169;
              auVar338._20_4_ = fVar171;
              auVar338._24_4_ = fVar173;
              auVar338._28_4_ = fVar174;
              if ((((((((auVar313 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar313 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar313 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar313 >> 0x7f,0) != '\0') ||
                    (auVar313 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar313 >> 0xbf,0) != '\0') ||
                  (auVar313 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar313[0x1f] < '\0') {
                auVar145 = vandps_avx(auVar26,auVar145);
                auVar230 = ZEXT3264(auVar145);
                auVar113._4_4_ = auVar332._4_4_ * fVar235;
                auVar113._0_4_ = auVar332._0_4_ * fVar217;
                auVar113._8_4_ = auVar332._8_4_ * fVar238;
                auVar113._12_4_ = auVar332._12_4_ * fVar240;
                auVar113._16_4_ = auVar332._16_4_ * fVar241;
                auVar113._20_4_ = auVar332._20_4_ * fVar242;
                auVar113._24_4_ = auVar332._24_4_ * fVar255;
                auVar113._28_4_ = auVar158._28_4_;
                auVar250 = ZEXT3264(auVar113);
                auVar114._4_4_ = auVar156._4_4_ * fVar235;
                auVar114._0_4_ = auVar156._0_4_ * fVar217;
                auVar114._8_4_ = auVar156._8_4_ * fVar238;
                auVar114._12_4_ = auVar156._12_4_ * fVar240;
                auVar114._16_4_ = auVar156._16_4_ * fVar241;
                auVar114._20_4_ = auVar156._20_4_ * fVar242;
                auVar114._24_4_ = auVar156._24_4_ * fVar255;
                auVar114._28_4_ = auVar156._28_4_;
                auVar282._8_4_ = 0x3f800000;
                auVar282._0_8_ = 0x3f8000003f800000;
                auVar282._12_4_ = 0x3f800000;
                auVar282._16_4_ = 0x3f800000;
                auVar282._20_4_ = 0x3f800000;
                auVar282._24_4_ = 0x3f800000;
                auVar282._28_4_ = 0x3f800000;
                auVar145 = vsubps_avx(auVar282,auVar113);
                local_3e0 = vblendvps_avx(auVar145,auVar113,auVar25);
                auVar145 = vsubps_avx(auVar282,auVar114);
                _local_400 = vblendvps_avx(auVar145,auVar114,auVar25);
                auVar160 = ZEXT3264(_local_400);
                local_560 = auVar112;
              }
            }
            auVar145 = auVar230._0_32_;
            auVar333 = ZEXT3264(_local_760);
            if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0x7f,0) != '\0') ||
                  (auVar230 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar145 >> 0xbf,0) != '\0') ||
                (auVar230 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar230[0x1f] < '\0') {
              auVar158 = vsubps_avx(auVar302,auVar338);
              fVar231 = auVar338._0_4_ + local_3e0._0_4_ * auVar158._0_4_;
              fVar233 = auVar338._4_4_ + local_3e0._4_4_ * auVar158._4_4_;
              fVar235 = auVar338._8_4_ + local_3e0._8_4_ * auVar158._8_4_;
              fVar238 = auVar338._12_4_ + local_3e0._12_4_ * auVar158._12_4_;
              fVar240 = auVar338._16_4_ + local_3e0._16_4_ * auVar158._16_4_;
              fVar241 = auVar338._20_4_ + local_3e0._20_4_ * auVar158._20_4_;
              fVar242 = auVar338._24_4_ + local_3e0._24_4_ * auVar158._24_4_;
              fVar251 = auVar338._28_4_ + auVar158._28_4_;
              fVar217 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar115._4_4_ = (fVar233 + fVar233) * fVar217;
              auVar115._0_4_ = (fVar231 + fVar231) * fVar217;
              auVar115._8_4_ = (fVar235 + fVar235) * fVar217;
              auVar115._12_4_ = (fVar238 + fVar238) * fVar217;
              auVar115._16_4_ = (fVar240 + fVar240) * fVar217;
              auVar115._20_4_ = (fVar241 + fVar241) * fVar217;
              auVar115._24_4_ = (fVar242 + fVar242) * fVar217;
              auVar115._28_4_ = fVar251 + fVar251;
              auVar250 = ZEXT3264(local_560);
              auVar158 = vcmpps_avx(local_560,auVar115,6);
              auVar160 = ZEXT3264(auVar158);
              auVar26 = auVar145 & auVar158;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                local_400._0_4_ = (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0;
                local_400._4_4_ = (float)local_400._4_4_ + (float)local_400._4_4_ + -1.0;
                uStack_3f8._0_4_ = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
                uStack_3f8._4_4_ = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
                uStack_3f0._0_4_ = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
                uStack_3f0._4_4_ = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
                uStack_3e8._0_4_ = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
                uStack_3e8._4_4_ = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
                local_300 = local_3e0;
                auVar130 = _local_400;
                auVar26 = _local_400;
                local_2e0 = (float)local_400._0_4_;
                fStack_2dc = (float)local_400._4_4_;
                fStack_2d8 = (float)uStack_3f8;
                fStack_2d4 = uStack_3f8._4_4_;
                fStack_2d0 = (float)uStack_3f0;
                fStack_2cc = uStack_3f0._4_4_;
                fStack_2c8 = (float)uStack_3e8;
                fStack_2c4 = uStack_3e8._4_4_;
                local_2c0 = local_560;
                local_29c = uVar21;
                local_290 = local_7e0;
                uStack_288 = uStack_7d8;
                local_280 = local_800;
                uStack_278 = uStack_7f8;
                local_270 = local_810;
                uStack_268 = uStack_808;
                local_260 = local_7f0;
                uStack_258 = uStack_7e8;
                pGVar23 = (context->scene->geometries).items[uVar19].ptr;
                _local_400 = auVar26;
                if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5c0[0] = vandps_avx(auVar158,auVar145);
                  auVar203._0_4_ = (float)(int)local_2a0;
                  auVar203._4_8_ = SUB128(ZEXT812(0),4);
                  auVar203._12_4_ = 0;
                  auVar222 = vshufps_avx(auVar203,auVar203,0);
                  local_220[0] = (auVar222._0_4_ + local_3e0._0_4_ + 0.0) * (float)local_e0._0_4_;
                  local_220[1] = (auVar222._4_4_ + local_3e0._4_4_ + 1.0) * (float)local_e0._4_4_;
                  local_220[2] = (auVar222._8_4_ + local_3e0._8_4_ + 2.0) * fStack_d8;
                  local_220[3] = (auVar222._12_4_ + local_3e0._12_4_ + 3.0) * fStack_d4;
                  fStack_210 = (auVar222._0_4_ + local_3e0._16_4_ + 4.0) * fStack_d0;
                  fStack_20c = (auVar222._4_4_ + local_3e0._20_4_ + 5.0) * fStack_cc;
                  fStack_208 = (auVar222._8_4_ + local_3e0._24_4_ + 6.0) * fStack_c8;
                  fStack_204 = auVar222._12_4_ + local_3e0._28_4_ + 7.0;
                  uStack_3f0 = auVar130._16_8_;
                  uStack_3e8 = auVar26._24_8_;
                  local_200 = local_400;
                  uStack_1f8 = uStack_3f8;
                  uStack_1f0 = uStack_3f0;
                  uStack_1e8 = uStack_3e8;
                  local_1e0 = local_560;
                  auVar191._8_4_ = 0x7f800000;
                  auVar191._0_8_ = 0x7f8000007f800000;
                  auVar191._12_4_ = 0x7f800000;
                  auVar191._16_4_ = 0x7f800000;
                  auVar191._20_4_ = 0x7f800000;
                  auVar191._24_4_ = 0x7f800000;
                  auVar191._28_4_ = 0x7f800000;
                  auVar145 = vblendvps_avx(auVar191,local_560,local_5c0[0]);
                  auVar158 = vshufps_avx(auVar145,auVar145,0xb1);
                  auVar158 = vminps_avx(auVar145,auVar158);
                  auVar26 = vshufpd_avx(auVar158,auVar158,5);
                  auVar158 = vminps_avx(auVar158,auVar26);
                  auVar26 = vperm2f128_avx(auVar158,auVar158,1);
                  auVar158 = vminps_avx(auVar158,auVar26);
                  auVar158 = vcmpps_avx(auVar145,auVar158,0);
                  auVar26 = local_5c0[0] & auVar158;
                  auVar145 = local_5c0[0];
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar145 = vandps_avx(auVar158,local_5c0[0]);
                  }
                  uVar133 = vmovmskps_avx(auVar145);
                  uVar136 = 0;
                  if (uVar133 != 0) {
                    for (; (uVar133 >> uVar136 & 1) == 0; uVar136 = uVar136 + 1) {
                    }
                  }
                  uVar134 = (ulong)uVar136;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar217 = local_220[uVar134];
                    auVar160 = ZEXT464((uint)fVar217);
                    uVar9 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                    fVar233 = 1.0 - fVar217;
                    fVar231 = fVar217 * fVar233 + fVar217 * fVar233;
                    auVar222 = ZEXT416((uint)(fVar217 * fVar217 * 3.0));
                    auVar222 = vshufps_avx(auVar222,auVar222,0);
                    auVar204 = ZEXT416((uint)((fVar231 - fVar217 * fVar217) * 3.0));
                    auVar204 = vshufps_avx(auVar204,auVar204,0);
                    auVar221 = ZEXT416((uint)((fVar233 * fVar233 - fVar231) * 3.0));
                    auVar221 = vshufps_avx(auVar221,auVar221,0);
                    fVar231 = auVar221._0_4_ * (float)local_800._0_4_;
                    fVar235 = auVar221._4_4_ * (float)local_800._4_4_;
                    fVar238 = auVar221._8_4_ * (float)uStack_7f8;
                    fVar240 = auVar221._12_4_ * uStack_7f8._4_4_;
                    auVar250 = ZEXT1664(CONCAT412(fVar240,CONCAT48(fVar238,CONCAT44(fVar235,fVar231)
                                                                  )));
                    auVar221 = ZEXT416((uint)(fVar233 * fVar233 * -3.0));
                    auVar221 = vshufps_avx(auVar221,auVar221,0);
                    auVar205._0_4_ =
                         auVar221._0_4_ * (float)local_7e0._0_4_ +
                         fVar231 + auVar222._0_4_ * (float)local_7f0._0_4_ +
                                   auVar204._0_4_ * (float)local_810._0_4_;
                    auVar205._4_4_ =
                         auVar221._4_4_ * (float)local_7e0._4_4_ +
                         fVar235 + auVar222._4_4_ * (float)local_7f0._4_4_ +
                                   auVar204._4_4_ * (float)local_810._4_4_;
                    auVar205._8_4_ =
                         auVar221._8_4_ * (float)uStack_7d8 +
                         fVar238 + auVar222._8_4_ * (float)uStack_7e8 +
                                   auVar204._8_4_ * (float)uStack_808;
                    auVar205._12_4_ =
                         auVar221._12_4_ * uStack_7d8._4_4_ +
                         fVar240 + auVar222._12_4_ * uStack_7e8._4_4_ +
                                   auVar204._12_4_ * uStack_808._4_4_;
                    auVar230 = ZEXT464(*(uint *)(local_1e0 + uVar134 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1e0 + uVar134 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar205._0_4_;
                    uVar22 = vextractps_avx(auVar205,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar22;
                    uVar22 = vextractps_avx(auVar205,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar22;
                    *(float *)(ray + k * 4 + 0xf0) = fVar217;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar9;
                    *(uint *)(ray + k * 4 + 0x110) = uVar20;
                    *(uint *)(ray + k * 4 + 0x120) = uVar19;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_790 = auVar213._16_16_;
                    local_7a0 = *local_728;
                    local_6c0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    auVar303 = ZEXT3264(local_560);
                    auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_700 = auVar214;
                    _local_660 = auVar302;
                    while( true ) {
                      local_460 = local_220[uVar134];
                      local_450 = *(undefined4 *)((long)&local_200 + uVar134 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar134 * 4)
                      ;
                      fVar231 = 1.0 - local_460;
                      fVar217 = local_460 * fVar231 + local_460 * fVar231;
                      auVar222 = ZEXT416((uint)(local_460 * local_460 * 3.0));
                      auVar222 = vshufps_avx(auVar222,auVar222,0);
                      auVar204 = ZEXT416((uint)((fVar217 - local_460 * local_460) * 3.0));
                      auVar204 = vshufps_avx(auVar204,auVar204,0);
                      auVar245._0_4_ =
                           auVar222._0_4_ * (float)local_7f0._0_4_ +
                           auVar204._0_4_ * (float)local_810._0_4_;
                      auVar245._4_4_ =
                           auVar222._4_4_ * (float)local_7f0._4_4_ +
                           auVar204._4_4_ * (float)local_810._4_4_;
                      auVar245._8_4_ =
                           auVar222._8_4_ * (float)uStack_7e8 + auVar204._8_4_ * (float)uStack_808;
                      auVar245._12_4_ =
                           auVar222._12_4_ * uStack_7e8._4_4_ + auVar204._12_4_ * uStack_808._4_4_;
                      auVar250 = ZEXT1664(auVar245);
                      auVar222 = ZEXT416((uint)((fVar231 * fVar231 - fVar217) * 3.0));
                      auVar222 = vshufps_avx(auVar222,auVar222,0);
                      local_7d0.context = context->user;
                      auVar204 = ZEXT416((uint)(fVar231 * fVar231 * -3.0));
                      auVar204 = vshufps_avx(auVar204,auVar204,0);
                      auVar206._0_4_ =
                           auVar204._0_4_ * (float)local_7e0._0_4_ +
                           auVar222._0_4_ * (float)local_800._0_4_ + auVar245._0_4_;
                      auVar206._4_4_ =
                           auVar204._4_4_ * (float)local_7e0._4_4_ +
                           auVar222._4_4_ * (float)local_800._4_4_ + auVar245._4_4_;
                      auVar206._8_4_ =
                           auVar204._8_4_ * (float)uStack_7d8 +
                           auVar222._8_4_ * (float)uStack_7f8 + auVar245._8_4_;
                      auVar206._12_4_ =
                           auVar204._12_4_ * uStack_7d8._4_4_ +
                           auVar222._12_4_ * uStack_7f8._4_4_ + auVar245._12_4_;
                      auVar222 = vshufps_avx(auVar206,auVar206,0);
                      local_490[0] = (RTCHitN)auVar222[0];
                      local_490[1] = (RTCHitN)auVar222[1];
                      local_490[2] = (RTCHitN)auVar222[2];
                      local_490[3] = (RTCHitN)auVar222[3];
                      local_490[4] = (RTCHitN)auVar222[4];
                      local_490[5] = (RTCHitN)auVar222[5];
                      local_490[6] = (RTCHitN)auVar222[6];
                      local_490[7] = (RTCHitN)auVar222[7];
                      local_490[8] = (RTCHitN)auVar222[8];
                      local_490[9] = (RTCHitN)auVar222[9];
                      local_490[10] = (RTCHitN)auVar222[10];
                      local_490[0xb] = (RTCHitN)auVar222[0xb];
                      local_490[0xc] = (RTCHitN)auVar222[0xc];
                      local_490[0xd] = (RTCHitN)auVar222[0xd];
                      local_490[0xe] = (RTCHitN)auVar222[0xe];
                      local_490[0xf] = (RTCHitN)auVar222[0xf];
                      local_480 = vshufps_avx(auVar206,auVar206,0x55);
                      auVar230 = ZEXT1664(local_480);
                      local_470 = vshufps_avx(auVar206,auVar206,0xaa);
                      fStack_45c = local_460;
                      fStack_458 = local_460;
                      fStack_454 = local_460;
                      uStack_44c = local_450;
                      uStack_448 = local_450;
                      uStack_444 = local_450;
                      local_440 = local_310._0_8_;
                      uStack_438 = local_310._8_8_;
                      local_430 = local_670._0_8_;
                      uStack_428 = local_670._8_8_;
                      vcmpps_avx(auVar333._0_32_,auVar333._0_32_,0xf);
                      uStack_41c = (local_7d0.context)->instID[0];
                      local_420 = uStack_41c;
                      uStack_418 = uStack_41c;
                      uStack_414 = uStack_41c;
                      uStack_410 = (local_7d0.context)->instPrimID[0];
                      uStack_40c = uStack_410;
                      uStack_408 = uStack_410;
                      uStack_404 = uStack_410;
                      local_840 = local_7a0;
                      local_7d0.valid = (int *)local_840;
                      local_7d0.geometryUserPtr = pGVar23->userPtr;
                      local_7d0.hit = local_490;
                      local_7d0.N = 4;
                      local_7d0.ray = (RTCRayN *)ray;
                      if (pGVar23->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar230 = ZEXT1664(local_480);
                        auVar250 = ZEXT1664(auVar245);
                        (*pGVar23->intersectionFilterN)(&local_7d0);
                        auVar303 = ZEXT3264(local_560);
                        auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar222 = auVar230._0_16_;
                      if (local_840 == (undefined1  [16])0x0) {
                        auVar222 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar222 = auVar222 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var24 = context->args->filter;
                        if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar250 = ZEXT1664(auVar250._0_16_);
                          (*p_Var24)(&local_7d0);
                          auVar303 = ZEXT3264(local_560);
                          auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        auVar204 = vpcmpeqd_avx(local_840,_DAT_01f7aa10);
                        auVar221 = vpcmpeqd_avx(auVar222,auVar222);
                        auVar230 = ZEXT1664(auVar221);
                        auVar222 = auVar204 ^ auVar221;
                        if (local_840 != (undefined1  [16])0x0) {
                          auVar204 = auVar204 ^ auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])local_7d0.hit);
                          *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar221;
                          auVar221 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar221;
                          auVar204 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])
                                                              (local_7d0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar204;
                        }
                      }
                      auVar181._8_8_ = 0x100000001;
                      auVar181._0_8_ = 0x100000001;
                      if ((auVar181 & auVar222) == (undefined1  [16])0x0) {
                        *(int *)(ray + k * 4 + 0x80) = local_6c0._0_4_;
                        auVar222 = local_6c0._0_16_;
                      }
                      else {
                        auVar222 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      }
                      *(undefined4 *)(local_5c0[0] + uVar134 * 4) = 0;
                      local_6c0._0_16_ = auVar222;
                      auVar222 = vshufps_avx(auVar222,auVar222,0);
                      auVar157._16_16_ = auVar222;
                      auVar157._0_16_ = auVar222;
                      auVar158 = vcmpps_avx(auVar303._0_32_,auVar157,2);
                      auVar145 = vandps_avx(auVar158,local_5c0[0]);
                      auVar160 = ZEXT3264(auVar145);
                      local_5c0[0] = local_5c0[0] & auVar158;
                      if ((((((((local_5c0[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_5c0[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_5c0[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_5c0[0] >> 0x7f,0) == '\0') &&
                            (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_5c0[0] >> 0xbf,0) == '\0') &&
                          (local_5c0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_5c0[0][0x1f]) break;
                      auVar192._8_4_ = 0x7f800000;
                      auVar192._0_8_ = 0x7f8000007f800000;
                      auVar192._12_4_ = 0x7f800000;
                      auVar192._16_4_ = 0x7f800000;
                      auVar192._20_4_ = 0x7f800000;
                      auVar192._24_4_ = 0x7f800000;
                      auVar192._28_4_ = 0x7f800000;
                      auVar158 = vblendvps_avx(auVar192,auVar303._0_32_,auVar145);
                      auVar26 = vshufps_avx(auVar158,auVar158,0xb1);
                      auVar26 = vminps_avx(auVar158,auVar26);
                      auVar313 = vshufpd_avx(auVar26,auVar26,5);
                      auVar26 = vminps_avx(auVar26,auVar313);
                      auVar313 = vperm2f128_avx(auVar26,auVar26,1);
                      auVar26 = vminps_avx(auVar26,auVar313);
                      auVar26 = vcmpps_avx(auVar158,auVar26,0);
                      auVar313 = auVar145 & auVar26;
                      auVar158 = auVar145;
                      if ((((((((auVar313 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar313 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar313 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar313 >> 0x7f,0) != '\0') ||
                            (auVar313 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar313 >> 0xbf,0) != '\0') ||
                          (auVar313 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar313[0x1f] < '\0') {
                        auVar158 = vandps_avx(auVar26,auVar145);
                      }
                      uVar133 = vmovmskps_avx(auVar158);
                      uVar136 = 0;
                      if (uVar133 != 0) {
                        for (; (uVar133 >> uVar136 & 1) == 0; uVar136 = uVar136 + 1) {
                        }
                      }
                      uVar134 = (ulong)uVar136;
                      local_5c0[0] = auVar145;
                    }
                    auVar333 = ZEXT3264(_local_760);
                    prim = local_818;
                    pLVar140 = local_828;
                    pre = local_820;
                  }
                }
              }
            }
          }
          lVar135 = lVar135 + 8;
          fVar292 = (float)local_6a0._0_4_;
          fVar305 = (float)local_6a0._4_4_;
          fVar307 = fStack_698;
          fVar309 = fStack_694;
          fVar217 = fStack_690;
          fVar231 = fStack_68c;
          fVar238 = fStack_688;
        } while ((int)lVar135 < (int)uVar21);
      }
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar153._4_4_ = uVar9;
      auVar153._0_4_ = uVar9;
      auVar153._8_4_ = uVar9;
      auVar153._12_4_ = uVar9;
      auVar153._16_4_ = uVar9;
      auVar153._20_4_ = uVar9;
      auVar153._24_4_ = uVar9;
      auVar153._28_4_ = uVar9;
      auVar145 = vcmpps_avx(local_80,auVar153,2);
      uVar136 = vmovmskps_avx(auVar145);
      uVar131 = uVar131 & uVar131 + 0xff & uVar136;
    } while (uVar131 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }